

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_pack8.h
# Opt level: O0

void ncnn::convolution_pack8_avx
               (Mat *bottom_blob,Mat *top_blob,Mat *weight_data_packed,Mat *bias_data,int kernel_w,
               int kernel_h,int dilation_w,int dilation_h,int stride_w,int stride_h,
               int activation_type,Mat *activation_params,Option *opt)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined8 uVar62;
  undefined8 uVar63;
  undefined8 uVar64;
  undefined8 uVar65;
  undefined8 uVar66;
  undefined8 uVar67;
  undefined8 uVar68;
  undefined8 uVar69;
  undefined1 auVar70 [24];
  undefined8 uVar71;
  undefined8 uVar72;
  undefined8 uVar73;
  undefined8 uVar74;
  undefined8 uVar75;
  undefined8 uVar76;
  undefined8 uVar77;
  undefined8 uVar78;
  undefined8 uVar79;
  undefined8 uVar80;
  undefined8 uVar81;
  undefined8 uVar82;
  undefined8 uVar83;
  undefined8 uVar84;
  undefined8 uVar85;
  undefined8 uVar86;
  undefined8 uVar87;
  undefined8 uVar88;
  undefined8 uVar89;
  undefined8 uVar90;
  undefined8 uVar91;
  undefined8 uVar92;
  undefined8 uVar93;
  undefined8 uVar94;
  undefined8 uVar95;
  undefined8 uVar96;
  undefined8 uVar97;
  undefined8 uVar98;
  undefined8 uVar99;
  undefined8 uVar100;
  undefined8 uVar101;
  undefined8 uVar102;
  undefined8 uVar103;
  undefined8 uVar104;
  undefined8 uVar105;
  undefined8 uVar106;
  undefined8 uVar107;
  undefined8 uVar108;
  undefined8 uVar109;
  undefined8 uVar110;
  undefined8 uVar111;
  undefined8 uVar112;
  undefined8 uVar113;
  undefined8 uVar114;
  undefined8 uVar115;
  undefined8 uVar116;
  undefined8 uVar117;
  undefined8 uVar118;
  undefined8 uVar119;
  undefined8 uVar120;
  undefined8 uVar121;
  undefined8 uVar122;
  undefined8 uVar123;
  undefined8 uVar124;
  undefined8 uVar125;
  undefined8 uVar126;
  undefined8 uVar127;
  undefined8 uVar128;
  undefined8 uVar129;
  undefined8 uVar130;
  undefined8 uVar131;
  long *in_RCX;
  long *in_RDX;
  long *in_RSI;
  long *in_RDI;
  int in_R8D;
  int in_R9D;
  float fVar132;
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar138;
  float fVar139;
  float fVar140;
  float fVar141;
  float fVar142;
  float fVar143;
  float fVar144;
  float fVar145;
  float fVar146;
  float fVar147;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  float fVar148;
  int in_stack_00000008;
  undefined4 in_stack_00000034;
  __m256 _w7;
  __m256 _w6;
  __m256 _w5;
  __m256 _w4;
  __m256 _w3;
  __m256 _w2;
  __m256 _w1;
  __m256 _w0;
  __m256 _val7;
  __m256 _val6;
  __m256 _val5;
  __m256 _val4;
  __m256 _val3;
  __m256 _val2;
  __m256 _val1;
  __m256 _val0;
  float *slptr;
  int k;
  float *sptr;
  Mat m_2;
  int q;
  float *kptr;
  __m256 _sum;
  int j_1;
  int i_1;
  float *outptr;
  int p;
  float *bias_data_ptr;
  int j;
  int i;
  int gap;
  int p2;
  int p1;
  int *space_ofs;
  vector<int,_std::allocator<int>_> _space_ofs;
  int maxk;
  int outch;
  int outh;
  int outw;
  int channels;
  int w;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  __m256 _b;
  __m256 _a;
  __m256 max;
  __m256 min;
  __m256 neg;
  __m256 pos;
  __m256 one;
  __m256 one_7;
  __m256 pow2n_1;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_2;
  __m256i imm0_1;
  __m256 fx_1;
  __m256 tmp_1;
  __m256 pow2n;
  __m256 y;
  __m256 mask;
  __m256 one_1;
  __m256i imm0;
  __m256 fx;
  __m256 tmp;
  imm_xmm_union u_2;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i y2;
  __m128i y1;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  __m256i ret_1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  __m256 two;
  __m256 one_4;
  __m256 one_5;
  __m256 pow2n_2;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_6;
  __m256i imm0_3;
  __m256 fx_2;
  __m256 tmp_3;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  __m256 y_2;
  __m256 z;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e;
  __m256 invalid_mask;
  __m256 one_3;
  __m256i imm0_2;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  allocator_type *in_stack_ffffffffffffa4f8;
  size_type in_stack_ffffffffffffa500;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffa508;
  undefined8 local_5a80;
  undefined8 uStack_5a78;
  undefined8 uStack_5a70;
  undefined8 uStack_5a68;
  int local_546c;
  undefined8 local_5460;
  undefined8 local_5458;
  undefined8 local_5450;
  undefined4 local_5448;
  long local_5440;
  undefined4 local_5438;
  undefined4 local_5434;
  undefined4 local_5430;
  undefined4 local_542c;
  undefined4 local_5428;
  undefined8 local_5420;
  int local_5414;
  undefined8 local_5410;
  undefined8 local_5408;
  undefined8 local_5400;
  undefined4 local_53f8;
  long local_53f0;
  undefined4 local_53e8;
  undefined4 local_53e4;
  undefined4 local_53e0;
  undefined4 local_53dc;
  undefined4 local_53d8;
  undefined8 local_53d0;
  undefined8 *local_53c8;
  undefined8 local_53c0;
  undefined8 uStack_53b8;
  undefined8 uStack_53b0;
  allocator_type *paStack_53a8;
  int local_5388;
  int local_5384;
  undefined8 local_5380;
  undefined8 local_5378;
  undefined8 local_5370;
  undefined4 local_5368;
  long local_5360;
  undefined4 local_5358;
  undefined4 local_5354;
  undefined4 local_5350;
  undefined4 local_534c;
  undefined4 local_5348;
  undefined8 local_5340;
  long local_5338;
  int local_532c;
  long local_5328;
  int local_531c;
  int local_5318;
  int local_5314;
  int local_5310;
  int local_530c;
  reference local_5308;
  vector<int,_std::allocator<int>_> local_52e8;
  int local_52d0;
  int local_52cc;
  int local_52c8;
  int local_52c4;
  int local_52c0;
  int local_52bc;
  int local_52b8;
  int local_52b4;
  long *local_52b0;
  long *local_52a8;
  long *local_52a0;
  long *local_5298;
  undefined8 *local_5290;
  undefined8 *local_5280;
  undefined8 *local_5270;
  undefined8 *local_5248;
  undefined8 *local_5228;
  undefined8 *local_5208;
  undefined1 local_51fd;
  int local_51fc;
  undefined8 *local_51f0;
  undefined8 *local_51d0;
  undefined8 *local_51c8;
  long *local_51c0;
  int local_51b4;
  undefined8 *local_51b0;
  undefined1 local_51a5;
  int local_51a4;
  undefined8 *local_5198;
  undefined1 local_5175;
  int local_5174;
  undefined8 *local_5168;
  undefined8 *local_5100;
  undefined8 *local_50f8;
  undefined8 *local_50f0;
  undefined8 *local_50e8;
  undefined8 *local_50e0;
  undefined8 *local_50d8;
  undefined8 *local_50d0;
  undefined8 *local_50c8;
  undefined8 local_50c0;
  undefined8 uStack_50b8;
  undefined8 uStack_50b0;
  allocator_type *paStack_50a8;
  undefined1 (*local_5090) [32];
  undefined8 *local_5088;
  float local_5080;
  float fStack_507c;
  float fStack_5078;
  float fStack_5074;
  float fStack_5070;
  float fStack_506c;
  float fStack_5068;
  float fStack_5064;
  float local_504c;
  float *local_5048;
  float local_5040;
  float fStack_503c;
  float fStack_5038;
  float fStack_5034;
  float fStack_5030;
  float fStack_502c;
  float fStack_5028;
  float fStack_5024;
  float local_500c;
  float *local_5008;
  float local_5000;
  float fStack_4ffc;
  float fStack_4ff8;
  float fStack_4ff4;
  float fStack_4ff0;
  float fStack_4fec;
  float fStack_4fe8;
  float fStack_4fe4;
  float local_4fcc;
  float *local_4fc8;
  float local_4fc0;
  float fStack_4fbc;
  float fStack_4fb8;
  float fStack_4fb4;
  float fStack_4fb0;
  float fStack_4fac;
  float fStack_4fa8;
  float fStack_4fa4;
  float local_4f8c;
  float *local_4f88;
  float local_4f80;
  float fStack_4f7c;
  float fStack_4f78;
  float fStack_4f74;
  float fStack_4f70;
  float fStack_4f6c;
  float fStack_4f68;
  float fStack_4f64;
  float local_4f4c;
  float *local_4f48;
  float local_4f40;
  float fStack_4f3c;
  float fStack_4f38;
  float fStack_4f34;
  float fStack_4f30;
  float fStack_4f2c;
  float fStack_4f28;
  float fStack_4f24;
  float local_4f0c;
  float *local_4f08;
  float local_4f00;
  float fStack_4efc;
  float fStack_4ef8;
  float fStack_4ef4;
  float fStack_4ef0;
  float fStack_4eec;
  float fStack_4ee8;
  float fStack_4ee4;
  float local_4ecc;
  float *local_4ec8;
  float local_4ec0;
  float fStack_4ebc;
  float fStack_4eb8;
  float fStack_4eb4;
  float fStack_4eb0;
  float fStack_4eac;
  float fStack_4ea8;
  float fStack_4ea4;
  float local_4e8c;
  float *local_4e88;
  undefined8 local_4e80;
  undefined8 uStack_4e78;
  undefined8 uStack_4e70;
  undefined8 uStack_4e68;
  undefined8 local_4e60;
  undefined8 uStack_4e58;
  undefined8 uStack_4e50;
  undefined8 uStack_4e48;
  undefined8 local_4e40;
  undefined8 uStack_4e38;
  undefined8 uStack_4e30;
  undefined8 uStack_4e28;
  undefined8 local_4e20;
  undefined8 uStack_4e18;
  undefined8 uStack_4e10;
  undefined8 uStack_4e08;
  undefined8 local_4e00;
  undefined8 uStack_4df8;
  undefined8 uStack_4df0;
  undefined8 uStack_4de8;
  undefined8 local_4de0;
  undefined8 uStack_4dd8;
  undefined8 uStack_4dd0;
  undefined8 uStack_4dc8;
  undefined8 local_4dc0;
  undefined8 uStack_4db8;
  undefined8 uStack_4db0;
  undefined8 uStack_4da8;
  undefined8 local_4da0;
  undefined8 uStack_4d98;
  undefined8 uStack_4d90;
  undefined8 uStack_4d88;
  undefined8 local_4d80;
  undefined8 uStack_4d78;
  undefined8 uStack_4d70;
  undefined8 uStack_4d68;
  undefined8 local_4d60;
  undefined8 uStack_4d58;
  undefined8 uStack_4d50;
  undefined8 uStack_4d48;
  undefined8 local_4d40;
  undefined8 uStack_4d38;
  undefined8 uStack_4d30;
  undefined8 uStack_4d28;
  undefined8 local_4d20;
  undefined8 uStack_4d18;
  undefined8 uStack_4d10;
  undefined8 uStack_4d08;
  undefined8 local_4d00;
  undefined8 uStack_4cf8;
  undefined8 uStack_4cf0;
  undefined8 uStack_4ce8;
  undefined8 local_4ce0;
  undefined8 uStack_4cd8;
  undefined8 uStack_4cd0;
  undefined8 uStack_4cc8;
  undefined8 local_4cc0;
  undefined8 uStack_4cb8;
  undefined8 uStack_4cb0;
  undefined8 uStack_4ca8;
  undefined8 local_4ca0;
  undefined8 uStack_4c98;
  undefined8 uStack_4c90;
  undefined8 uStack_4c88;
  undefined8 local_4c80;
  undefined8 uStack_4c78;
  undefined8 uStack_4c70;
  undefined8 uStack_4c68;
  undefined8 local_4c60;
  undefined8 uStack_4c58;
  undefined8 uStack_4c50;
  undefined8 uStack_4c48;
  undefined8 local_4c40;
  undefined8 uStack_4c38;
  undefined8 uStack_4c30;
  undefined8 uStack_4c28;
  undefined8 local_4c20;
  undefined8 uStack_4c18;
  undefined8 uStack_4c10;
  undefined8 uStack_4c08;
  undefined8 local_4c00;
  undefined8 uStack_4bf8;
  undefined8 uStack_4bf0;
  undefined8 uStack_4be8;
  undefined8 local_4be0;
  undefined8 uStack_4bd8;
  undefined8 uStack_4bd0;
  undefined8 uStack_4bc8;
  undefined8 local_4bc0;
  undefined8 uStack_4bb8;
  undefined8 uStack_4bb0;
  undefined8 uStack_4ba8;
  undefined8 local_4ba0;
  undefined8 uStack_4b98;
  undefined8 uStack_4b90;
  undefined8 uStack_4b88;
  undefined8 local_4b80;
  undefined8 uStack_4b78;
  undefined8 uStack_4b70;
  undefined8 uStack_4b68;
  float local_4b60;
  float fStack_4b5c;
  float fStack_4b58;
  float fStack_4b54;
  float fStack_4b50;
  float fStack_4b4c;
  float fStack_4b48;
  float fStack_4b44;
  undefined8 local_4b40;
  undefined8 uStack_4b38;
  undefined8 uStack_4b30;
  undefined8 uStack_4b28;
  float local_4b20;
  float fStack_4b1c;
  float fStack_4b18;
  float fStack_4b14;
  float fStack_4b10;
  float fStack_4b0c;
  float fStack_4b08;
  float fStack_4b04;
  undefined8 local_4b00;
  undefined8 uStack_4af8;
  undefined8 uStack_4af0;
  undefined8 uStack_4ae8;
  float local_4ae0;
  float fStack_4adc;
  float fStack_4ad8;
  float fStack_4ad4;
  float fStack_4ad0;
  float fStack_4acc;
  float fStack_4ac8;
  float fStack_4ac4;
  undefined8 local_4ac0;
  undefined8 uStack_4ab8;
  undefined8 uStack_4ab0;
  undefined8 uStack_4aa8;
  float local_4aa0;
  float fStack_4a9c;
  float fStack_4a98;
  float fStack_4a94;
  float fStack_4a90;
  float fStack_4a8c;
  float fStack_4a88;
  float fStack_4a84;
  undefined8 local_4a80;
  undefined8 uStack_4a78;
  undefined8 uStack_4a70;
  undefined8 uStack_4a68;
  float local_4a60;
  float fStack_4a5c;
  float fStack_4a58;
  float fStack_4a54;
  float fStack_4a50;
  float fStack_4a4c;
  float fStack_4a48;
  float fStack_4a44;
  undefined8 local_4a40;
  undefined8 uStack_4a38;
  undefined8 uStack_4a30;
  undefined8 uStack_4a28;
  float local_4a20;
  float fStack_4a1c;
  float fStack_4a18;
  float fStack_4a14;
  float fStack_4a10;
  float fStack_4a0c;
  float fStack_4a08;
  float fStack_4a04;
  undefined8 local_4a00;
  undefined8 uStack_49f8;
  undefined8 uStack_49f0;
  undefined8 uStack_49e8;
  float local_49e0;
  float fStack_49dc;
  float fStack_49d8;
  float fStack_49d4;
  float fStack_49d0;
  float fStack_49cc;
  float fStack_49c8;
  float fStack_49c4;
  undefined8 local_49c0;
  undefined8 uStack_49b8;
  undefined8 uStack_49b0;
  undefined8 uStack_49a8;
  float local_49a0;
  float fStack_499c;
  float fStack_4998;
  float fStack_4994;
  float fStack_4990;
  float fStack_498c;
  float fStack_4988;
  float fStack_4984;
  undefined8 local_4980;
  undefined8 uStack_4978;
  undefined8 uStack_4970;
  undefined8 uStack_4968;
  float local_4960;
  float fStack_495c;
  float fStack_4958;
  float fStack_4954;
  float fStack_4950;
  float fStack_494c;
  float fStack_4948;
  float fStack_4944;
  undefined8 local_4940;
  undefined8 uStack_4938;
  undefined8 uStack_4930;
  undefined8 uStack_4928;
  float local_4920;
  float fStack_491c;
  float fStack_4918;
  float fStack_4914;
  float fStack_4910;
  float fStack_490c;
  float fStack_4908;
  float fStack_4904;
  undefined8 local_4900;
  undefined8 uStack_48f8;
  undefined8 uStack_48f0;
  undefined8 uStack_48e8;
  float local_48e0;
  float fStack_48dc;
  float fStack_48d8;
  float fStack_48d4;
  float fStack_48d0;
  float fStack_48cc;
  float fStack_48c8;
  float fStack_48c4;
  undefined8 local_48c0;
  undefined8 uStack_48b8;
  undefined8 uStack_48b0;
  undefined8 uStack_48a8;
  float local_48a0;
  float fStack_489c;
  float fStack_4898;
  float fStack_4894;
  float fStack_4890;
  float fStack_488c;
  float fStack_4888;
  float fStack_4884;
  undefined8 local_4880;
  undefined8 uStack_4878;
  undefined8 uStack_4870;
  undefined8 uStack_4868;
  float local_4860;
  float fStack_485c;
  float fStack_4858;
  float fStack_4854;
  float fStack_4850;
  float fStack_484c;
  float fStack_4848;
  float fStack_4844;
  undefined8 local_4840;
  undefined8 uStack_4838;
  undefined8 uStack_4830;
  undefined8 uStack_4828;
  float local_4820;
  float fStack_481c;
  float fStack_4818;
  float fStack_4814;
  float fStack_4810;
  float fStack_480c;
  float fStack_4808;
  float fStack_4804;
  undefined8 local_4800;
  undefined8 uStack_47f8;
  undefined8 uStack_47f0;
  undefined8 uStack_47e8;
  float local_47e0;
  float fStack_47dc;
  float fStack_47d8;
  float fStack_47d4;
  float fStack_47d0;
  float fStack_47cc;
  float fStack_47c8;
  float fStack_47c4;
  undefined8 local_47c0;
  undefined8 uStack_47b8;
  undefined8 uStack_47b0;
  undefined8 uStack_47a8;
  float local_47a0;
  float fStack_479c;
  float fStack_4798;
  float fStack_4794;
  float fStack_4790;
  float fStack_478c;
  float fStack_4788;
  float fStack_4784;
  undefined8 local_4780;
  undefined8 uStack_4778;
  undefined8 uStack_4770;
  undefined8 uStack_4768;
  undefined8 local_4760;
  undefined8 uStack_4758;
  undefined8 uStack_4750;
  undefined8 uStack_4748;
  undefined8 local_4740;
  undefined8 uStack_4738;
  undefined8 uStack_4730;
  undefined8 uStack_4728;
  undefined8 local_4720;
  undefined8 uStack_4718;
  undefined8 uStack_4710;
  undefined8 uStack_4708;
  undefined8 local_4700;
  undefined8 uStack_46f8;
  undefined8 uStack_46f0;
  undefined8 uStack_46e8;
  long *local_46d0;
  int local_46c4;
  undefined8 local_46c0;
  undefined8 uStack_46b8;
  undefined8 uStack_46b0;
  undefined8 uStack_46a8;
  undefined1 local_46a0 [32];
  undefined8 local_4680;
  long *local_4678;
  undefined8 local_4670;
  long *local_4668;
  undefined8 local_4660;
  long *local_4658;
  undefined8 local_4650;
  long *local_4648;
  undefined8 local_4640;
  long *local_4638;
  uint local_4630;
  uint local_462c;
  uint local_4628;
  uint local_4624;
  undefined1 local_4620 [16];
  undefined1 auStack_4610 [16];
  uint local_4600;
  uint local_45fc;
  uint local_45f8;
  uint local_45f4;
  uint local_45f0;
  uint local_45ec;
  uint local_45e8;
  uint local_45e4;
  undefined1 local_45e0 [32];
  uint local_45c0;
  uint local_45bc;
  uint local_45b8;
  uint local_45b4;
  uint local_45b0;
  uint local_45ac;
  uint local_45a8;
  uint local_45a4;
  undefined1 local_45a0 [16];
  undefined1 auStack_4590 [16];
  uint local_4580;
  uint local_457c;
  uint local_4578;
  uint local_4574;
  uint local_4570;
  uint local_456c;
  uint local_4568;
  uint local_4564;
  undefined1 local_4560 [16];
  undefined1 auStack_4550 [16];
  uint local_4540;
  uint local_453c;
  uint local_4538;
  uint local_4534;
  uint local_4530;
  uint local_452c;
  uint local_4528;
  uint local_4524;
  undefined1 local_4520 [32];
  undefined8 local_4500;
  ulong uStack_44f8;
  undefined8 uStack_44f0;
  undefined8 uStack_44e8;
  undefined8 local_44e0;
  undefined8 uStack_44d8;
  undefined8 uStack_44d0;
  undefined8 uStack_44c8;
  undefined8 local_44c0;
  undefined8 uStack_44b8;
  undefined8 uStack_44b0;
  undefined8 uStack_44a8;
  undefined8 local_44a0;
  undefined8 uStack_4498;
  undefined8 uStack_4490;
  undefined8 uStack_4488;
  undefined1 local_4480 [32];
  undefined1 local_4460 [32];
  uint local_4424;
  undefined8 local_4420;
  undefined8 uStack_4418;
  undefined8 uStack_4410;
  undefined8 uStack_4408;
  float local_4400;
  float fStack_43fc;
  float fStack_43f8;
  float fStack_43f4;
  float fStack_43f0;
  float fStack_43ec;
  float fStack_43e8;
  float fStack_43e4;
  undefined8 local_43e0;
  undefined8 uStack_43d8;
  undefined8 uStack_43d0;
  undefined8 uStack_43c8;
  undefined8 local_43c0;
  undefined8 uStack_43b8;
  undefined8 uStack_43b0;
  undefined8 uStack_43a8;
  undefined8 local_43a0;
  undefined8 uStack_4398;
  undefined8 uStack_4390;
  undefined8 uStack_4388;
  uint local_4364;
  undefined1 local_4360 [32];
  uint local_4340;
  uint local_433c;
  uint local_4338;
  uint local_4334;
  uint local_4330;
  uint local_432c;
  uint local_4328;
  uint local_4324;
  undefined1 local_4320 [32];
  undefined1 local_4300 [32];
  undefined8 local_42e0;
  undefined8 uStack_42d8;
  undefined8 uStack_42d0;
  undefined8 uStack_42c8;
  undefined8 local_42c0;
  undefined8 uStack_42b8;
  undefined8 uStack_42b0;
  undefined8 uStack_42a8;
  undefined8 local_42a0;
  undefined8 uStack_4298;
  undefined8 uStack_4290;
  undefined8 uStack_4288;
  undefined8 local_4280;
  undefined8 uStack_4278;
  undefined8 uStack_4270;
  undefined8 uStack_4268;
  undefined8 local_4260;
  undefined8 uStack_4258;
  undefined8 uStack_4250;
  undefined8 uStack_4248;
  undefined1 local_4240 [32];
  undefined8 local_4220;
  undefined8 uStack_4218;
  undefined8 uStack_4210;
  undefined8 uStack_4208;
  undefined8 local_4200;
  undefined8 uStack_41f8;
  undefined8 uStack_41f0;
  undefined8 uStack_41e8;
  undefined8 local_41e0;
  undefined8 uStack_41d8;
  undefined8 uStack_41d0;
  undefined8 uStack_41c8;
  undefined8 local_41c0;
  undefined8 uStack_41b8;
  undefined8 uStack_41b0;
  undefined8 uStack_41a8;
  undefined4 local_4184;
  undefined8 local_4180;
  undefined8 uStack_4178;
  undefined8 uStack_4170;
  undefined8 uStack_4168;
  undefined8 local_4160;
  ulong uStack_4158;
  undefined8 uStack_4150;
  undefined8 uStack_4148;
  undefined1 local_4140 [16];
  undefined1 auStack_4130 [16];
  undefined4 local_4120;
  undefined4 local_411c;
  undefined4 local_4118;
  undefined4 local_4114;
  undefined4 local_4110;
  undefined4 local_410c;
  undefined4 local_4108;
  undefined4 local_4104;
  undefined1 local_4100 [32];
  undefined8 local_40e0;
  undefined8 uStack_40d8;
  undefined8 uStack_40d0;
  undefined8 uStack_40c8;
  undefined8 local_40c0;
  undefined8 uStack_40b8;
  undefined8 uStack_40b0;
  undefined8 uStack_40a8;
  undefined8 local_40a0;
  undefined8 uStack_4098;
  undefined8 uStack_4090;
  undefined8 uStack_4088;
  undefined8 local_4080;
  undefined8 uStack_4078;
  undefined8 uStack_4070;
  undefined8 uStack_4068;
  undefined8 local_4060;
  undefined8 uStack_4058;
  undefined8 uStack_4050;
  undefined8 uStack_4048;
  undefined4 local_4024;
  undefined1 local_4020 [16];
  undefined1 auStack_4010 [16];
  undefined4 local_4000;
  undefined4 local_3ffc;
  undefined4 local_3ff8;
  undefined4 local_3ff4;
  undefined4 local_3ff0;
  undefined4 local_3fec;
  undefined4 local_3fe8;
  undefined4 local_3fe4;
  undefined8 local_3fe0;
  undefined8 uStack_3fd8;
  undefined8 uStack_3fd0;
  undefined8 uStack_3fc8;
  undefined1 local_3fc0 [8];
  undefined8 uStack_3fb8;
  undefined8 uStack_3fb0;
  undefined8 uStack_3fa8;
  undefined8 local_3fa0;
  undefined8 uStack_3f98;
  undefined8 uStack_3f90;
  undefined8 uStack_3f88;
  undefined8 local_3f80;
  undefined8 uStack_3f78;
  undefined8 uStack_3f70;
  undefined8 uStack_3f68;
  undefined8 local_3f60;
  undefined8 uStack_3f58;
  undefined8 uStack_3f50;
  undefined8 uStack_3f48;
  undefined8 local_3f40;
  undefined8 uStack_3f38;
  undefined8 uStack_3f30;
  undefined8 uStack_3f28;
  undefined8 local_3f20;
  undefined8 uStack_3f18;
  undefined8 uStack_3f10;
  undefined8 uStack_3f08;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  float local_3ee0;
  float fStack_3edc;
  float fStack_3ed8;
  float fStack_3ed4;
  float fStack_3ed0;
  float fStack_3ecc;
  float fStack_3ec8;
  float fStack_3ec4;
  undefined8 local_3ec0;
  undefined8 uStack_3eb8;
  undefined8 uStack_3eb0;
  undefined8 uStack_3ea8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined8 local_3e80;
  undefined8 uStack_3e78;
  undefined8 uStack_3e70;
  undefined8 uStack_3e68;
  undefined8 local_3e60;
  undefined8 uStack_3e58;
  undefined8 uStack_3e50;
  undefined8 uStack_3e48;
  undefined4 local_3e24;
  undefined1 local_3e20 [16];
  undefined1 auStack_3e10 [16];
  undefined4 local_3e00;
  undefined4 local_3dfc;
  undefined4 local_3df8;
  undefined4 local_3df4;
  undefined4 local_3df0;
  undefined4 local_3dec;
  undefined4 local_3de8;
  undefined4 local_3de4;
  undefined1 local_3de0 [32];
  undefined8 local_3dc0;
  undefined8 uStack_3db8;
  undefined8 uStack_3db0;
  undefined8 uStack_3da8;
  undefined8 local_3da0;
  undefined8 uStack_3d98;
  undefined8 uStack_3d90;
  undefined8 uStack_3d88;
  undefined8 local_3d80;
  undefined8 uStack_3d78;
  undefined8 uStack_3d70;
  undefined8 uStack_3d68;
  undefined8 local_3d60;
  undefined8 uStack_3d58;
  undefined8 uStack_3d50;
  undefined8 uStack_3d48;
  float local_3d40;
  float fStack_3d3c;
  float fStack_3d38;
  float fStack_3d34;
  float fStack_3d30;
  float fStack_3d2c;
  float fStack_3d28;
  float fStack_3d24;
  undefined8 local_3d20;
  undefined8 uStack_3d18;
  undefined8 uStack_3d10;
  undefined8 uStack_3d08;
  undefined8 local_3d00;
  undefined8 uStack_3cf8;
  undefined8 uStack_3cf0;
  undefined8 uStack_3ce8;
  undefined8 local_3ce0;
  undefined8 uStack_3cd8;
  undefined8 uStack_3cd0;
  undefined8 uStack_3cc8;
  undefined1 local_3cc0 [32];
  undefined8 local_3ca0;
  undefined8 uStack_3c98;
  undefined8 uStack_3c90;
  undefined8 uStack_3c88;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined1 local_3c60 [8];
  undefined8 uStack_3c58;
  undefined8 uStack_3c50;
  undefined8 uStack_3c48;
  undefined8 local_3c40;
  undefined8 uStack_3c38;
  undefined8 uStack_3c30;
  undefined8 uStack_3c28;
  undefined1 local_3c20 [32];
  undefined8 local_3c00;
  undefined8 uStack_3bf8;
  undefined8 uStack_3bf0;
  undefined8 uStack_3be8;
  undefined8 local_3be0;
  undefined8 uStack_3bd8;
  undefined8 uStack_3bd0;
  undefined8 uStack_3bc8;
  undefined8 local_3bc0;
  undefined8 uStack_3bb8;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  undefined8 local_3ba0;
  undefined8 uStack_3b98;
  undefined8 uStack_3b90;
  undefined8 uStack_3b88;
  undefined8 local_3b80;
  undefined8 uStack_3b78;
  undefined8 uStack_3b70;
  undefined8 uStack_3b68;
  undefined8 local_3b60;
  undefined8 uStack_3b58;
  undefined8 uStack_3b50;
  undefined8 uStack_3b48;
  undefined8 local_3b40;
  undefined8 uStack_3b38;
  undefined8 uStack_3b30;
  undefined8 uStack_3b28;
  undefined8 local_3b20;
  undefined8 uStack_3b18;
  undefined8 uStack_3b10;
  undefined8 uStack_3b08;
  undefined8 local_3b00;
  undefined8 uStack_3af8;
  undefined8 uStack_3af0;
  undefined8 uStack_3ae8;
  undefined8 local_3ae0;
  undefined8 uStack_3ad8;
  undefined8 uStack_3ad0;
  undefined8 uStack_3ac8;
  undefined8 local_3ac0;
  undefined8 uStack_3ab8;
  undefined8 uStack_3ab0;
  undefined8 uStack_3aa8;
  undefined8 local_3aa0;
  undefined8 uStack_3a98;
  undefined8 uStack_3a90;
  undefined8 uStack_3a88;
  undefined8 local_3a80;
  undefined8 uStack_3a78;
  undefined8 uStack_3a70;
  undefined8 uStack_3a68;
  undefined8 local_3a60;
  undefined8 uStack_3a58;
  undefined8 uStack_3a50;
  undefined8 uStack_3a48;
  undefined8 local_3a40;
  undefined8 uStack_3a38;
  undefined8 uStack_3a30;
  undefined8 uStack_3a28;
  undefined8 local_3a20;
  undefined8 uStack_3a18;
  undefined8 uStack_3a10;
  undefined8 uStack_3a08;
  undefined8 local_3a00;
  undefined8 uStack_39f8;
  undefined8 uStack_39f0;
  undefined8 uStack_39e8;
  undefined8 local_39e0;
  undefined8 uStack_39d8;
  undefined8 uStack_39d0;
  undefined8 uStack_39c8;
  undefined8 local_39c0;
  undefined8 uStack_39b8;
  undefined8 uStack_39b0;
  undefined8 uStack_39a8;
  undefined8 local_39a0;
  undefined8 uStack_3998;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined8 local_3980;
  undefined8 uStack_3978;
  undefined8 uStack_3970;
  undefined8 uStack_3968;
  undefined8 local_3960;
  undefined8 uStack_3958;
  undefined8 uStack_3950;
  undefined8 uStack_3948;
  float local_3940;
  float fStack_393c;
  float fStack_3938;
  float fStack_3934;
  float fStack_3930;
  float fStack_392c;
  float fStack_3928;
  undefined4 uStack_3924;
  undefined8 local_3920;
  undefined8 uStack_3918;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3900;
  float fStack_38fc;
  float fStack_38f8;
  float fStack_38f4;
  float fStack_38f0;
  float fStack_38ec;
  float fStack_38e8;
  float fStack_38e4;
  undefined8 local_38e0;
  undefined8 uStack_38d8;
  undefined8 uStack_38d0;
  undefined8 uStack_38c8;
  float local_38c0;
  float fStack_38bc;
  float fStack_38b8;
  float fStack_38b4;
  float fStack_38b0;
  float fStack_38ac;
  float fStack_38a8;
  float fStack_38a4;
  undefined8 local_38a0;
  undefined8 uStack_3898;
  undefined8 uStack_3890;
  undefined8 uStack_3888;
  float local_3880;
  float fStack_387c;
  float fStack_3878;
  float fStack_3874;
  float fStack_3870;
  float fStack_386c;
  float fStack_3868;
  float fStack_3864;
  undefined8 local_3860;
  undefined8 uStack_3858;
  undefined8 uStack_3850;
  undefined8 uStack_3848;
  float local_3840;
  float fStack_383c;
  float fStack_3838;
  float fStack_3834;
  float fStack_3830;
  float fStack_382c;
  float fStack_3828;
  float fStack_3824;
  undefined8 local_3820;
  undefined8 uStack_3818;
  undefined8 uStack_3810;
  undefined8 uStack_3808;
  float local_3800;
  float fStack_37fc;
  float fStack_37f8;
  float fStack_37f4;
  float fStack_37f0;
  float fStack_37ec;
  float fStack_37e8;
  float fStack_37e4;
  undefined8 local_37e0;
  undefined8 uStack_37d8;
  undefined8 uStack_37d0;
  undefined8 uStack_37c8;
  float local_37c0;
  float fStack_37bc;
  float fStack_37b8;
  float fStack_37b4;
  float fStack_37b0;
  float fStack_37ac;
  float fStack_37a8;
  float fStack_37a4;
  undefined8 local_37a0;
  undefined8 uStack_3798;
  undefined8 uStack_3790;
  undefined8 uStack_3788;
  undefined8 local_3780;
  undefined8 uStack_3778;
  undefined8 uStack_3770;
  undefined8 uStack_3768;
  undefined8 local_3760;
  undefined8 uStack_3758;
  undefined8 uStack_3750;
  undefined8 uStack_3748;
  undefined8 local_3740;
  undefined8 uStack_3738;
  undefined8 uStack_3730;
  undefined8 uStack_3728;
  undefined8 local_3720;
  undefined8 uStack_3718;
  undefined8 uStack_3710;
  undefined8 uStack_3708;
  undefined8 local_3700;
  undefined8 uStack_36f8;
  undefined8 uStack_36f0;
  undefined8 uStack_36e8;
  undefined8 local_36e0;
  undefined8 uStack_36d8;
  undefined8 uStack_36d0;
  undefined8 uStack_36c8;
  undefined8 local_36c0;
  undefined8 uStack_36b8;
  undefined8 uStack_36b0;
  undefined8 uStack_36a8;
  undefined8 local_36a0;
  undefined8 uStack_3698;
  undefined8 uStack_3690;
  undefined8 uStack_3688;
  undefined8 local_3680;
  undefined8 uStack_3678;
  undefined8 uStack_3670;
  undefined8 uStack_3668;
  undefined8 local_3660;
  undefined8 uStack_3658;
  undefined8 uStack_3650;
  undefined8 uStack_3648;
  undefined8 local_3640;
  undefined8 uStack_3638;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined8 local_3620;
  undefined8 uStack_3618;
  undefined8 uStack_3610;
  undefined8 uStack_3608;
  undefined8 local_3600;
  undefined8 uStack_35f8;
  undefined8 uStack_35f0;
  undefined8 uStack_35e8;
  undefined8 local_35e0;
  undefined8 uStack_35d8;
  undefined8 uStack_35d0;
  undefined8 uStack_35c8;
  undefined8 local_35c0;
  undefined8 uStack_35b8;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  undefined8 local_35a0;
  undefined8 uStack_3598;
  undefined8 uStack_3590;
  undefined8 uStack_3588;
  undefined8 local_3580;
  undefined8 uStack_3578;
  undefined8 uStack_3570;
  undefined8 uStack_3568;
  undefined8 local_3560;
  undefined8 uStack_3558;
  undefined8 uStack_3550;
  undefined8 uStack_3548;
  undefined8 local_3540;
  undefined8 uStack_3538;
  undefined8 uStack_3530;
  undefined8 uStack_3528;
  undefined8 local_3520;
  undefined8 uStack_3518;
  undefined8 uStack_3510;
  undefined8 uStack_3508;
  undefined8 local_3500;
  undefined8 uStack_34f8;
  undefined8 uStack_34f0;
  undefined8 uStack_34e8;
  undefined1 local_34e0 [32];
  undefined8 local_34c0;
  undefined8 uStack_34b8;
  undefined8 uStack_34b0;
  undefined8 uStack_34a8;
  undefined8 local_34a0;
  undefined8 uStack_3498;
  undefined8 uStack_3490;
  undefined8 uStack_3488;
  undefined8 local_3480;
  undefined8 uStack_3478;
  undefined8 uStack_3470;
  undefined8 uStack_3468;
  undefined8 local_3460;
  undefined8 uStack_3458;
  undefined8 uStack_3450;
  undefined8 uStack_3448;
  undefined8 local_3440;
  undefined8 uStack_3438;
  undefined8 uStack_3430;
  undefined8 uStack_3428;
  undefined8 local_3420;
  undefined8 uStack_3418;
  undefined8 uStack_3410;
  undefined8 uStack_3408;
  undefined1 local_3400 [32];
  undefined8 local_33e0;
  undefined8 uStack_33d8;
  undefined8 uStack_33d0;
  undefined8 uStack_33c8;
  undefined8 local_33c0;
  undefined8 uStack_33b8;
  undefined8 uStack_33b0;
  undefined8 uStack_33a8;
  undefined1 local_33a0 [8];
  undefined8 uStack_3398;
  undefined8 uStack_3390;
  undefined8 uStack_3388;
  undefined8 local_3380;
  undefined8 uStack_3378;
  undefined8 uStack_3370;
  undefined8 uStack_3368;
  undefined1 local_3360 [32];
  undefined8 local_3340;
  undefined8 uStack_3338;
  undefined8 uStack_3330;
  undefined8 uStack_3328;
  undefined8 local_3320;
  undefined8 uStack_3318;
  undefined8 uStack_3310;
  undefined8 uStack_3308;
  undefined8 local_3300;
  undefined8 uStack_32f8;
  undefined8 uStack_32f0;
  undefined8 uStack_32e8;
  undefined8 local_32e0;
  undefined8 uStack_32d8;
  undefined8 uStack_32d0;
  undefined8 uStack_32c8;
  undefined8 local_32c0;
  undefined8 uStack_32b8;
  undefined8 uStack_32b0;
  undefined8 uStack_32a8;
  undefined8 local_32a0;
  undefined8 uStack_3298;
  undefined8 uStack_3290;
  undefined8 uStack_3288;
  undefined8 local_3280;
  undefined8 uStack_3278;
  undefined8 uStack_3270;
  undefined8 uStack_3268;
  undefined8 local_3260;
  undefined8 uStack_3258;
  undefined8 uStack_3250;
  undefined8 uStack_3248;
  undefined8 local_3240;
  undefined8 uStack_3238;
  undefined8 uStack_3230;
  undefined8 uStack_3228;
  undefined8 local_3220;
  undefined8 uStack_3218;
  undefined8 uStack_3210;
  undefined8 uStack_3208;
  undefined8 local_3200;
  undefined8 uStack_31f8;
  undefined8 uStack_31f0;
  undefined8 uStack_31e8;
  undefined8 local_31e0;
  undefined8 uStack_31d8;
  undefined8 uStack_31d0;
  undefined8 uStack_31c8;
  undefined8 local_31c0;
  undefined8 uStack_31b8;
  undefined8 uStack_31b0;
  undefined8 uStack_31a8;
  undefined8 local_31a0;
  undefined8 uStack_3198;
  undefined8 uStack_3190;
  undefined8 uStack_3188;
  undefined8 local_3180;
  undefined8 uStack_3178;
  undefined8 uStack_3170;
  undefined8 uStack_3168;
  undefined8 local_3160;
  undefined8 uStack_3158;
  undefined8 uStack_3150;
  undefined8 uStack_3148;
  undefined8 local_3140;
  undefined8 uStack_3138;
  undefined8 uStack_3130;
  undefined8 uStack_3128;
  undefined8 local_3120;
  undefined8 uStack_3118;
  undefined8 uStack_3110;
  undefined8 uStack_3108;
  undefined8 local_3100;
  undefined8 uStack_30f8;
  undefined8 uStack_30f0;
  undefined8 uStack_30e8;
  undefined8 local_30e0;
  undefined8 uStack_30d8;
  undefined8 uStack_30d0;
  undefined8 uStack_30c8;
  undefined8 local_30c0;
  undefined8 uStack_30b8;
  undefined8 uStack_30b0;
  undefined8 uStack_30a8;
  undefined8 local_30a0;
  undefined8 uStack_3098;
  undefined8 uStack_3090;
  undefined8 uStack_3088;
  float local_3080;
  float fStack_307c;
  float fStack_3078;
  float fStack_3074;
  float fStack_3070;
  float fStack_306c;
  float fStack_3068;
  undefined4 uStack_3064;
  undefined8 local_3060;
  undefined8 uStack_3058;
  undefined8 uStack_3050;
  undefined8 uStack_3048;
  float local_3040;
  float fStack_303c;
  float fStack_3038;
  float fStack_3034;
  float fStack_3030;
  float fStack_302c;
  float fStack_3028;
  float fStack_3024;
  undefined8 local_3020;
  undefined8 uStack_3018;
  undefined8 uStack_3010;
  undefined8 uStack_3008;
  float local_3000;
  float fStack_2ffc;
  float fStack_2ff8;
  float fStack_2ff4;
  float fStack_2ff0;
  float fStack_2fec;
  float fStack_2fe8;
  float fStack_2fe4;
  undefined8 local_2fe0;
  undefined8 uStack_2fd8;
  undefined8 uStack_2fd0;
  undefined8 uStack_2fc8;
  float local_2fc0;
  float fStack_2fbc;
  float fStack_2fb8;
  float fStack_2fb4;
  float fStack_2fb0;
  float fStack_2fac;
  float fStack_2fa8;
  float fStack_2fa4;
  undefined8 local_2fa0;
  undefined8 uStack_2f98;
  undefined8 uStack_2f90;
  undefined8 uStack_2f88;
  float local_2f80;
  float fStack_2f7c;
  float fStack_2f78;
  float fStack_2f74;
  float fStack_2f70;
  float fStack_2f6c;
  float fStack_2f68;
  float fStack_2f64;
  undefined8 local_2f60;
  undefined8 uStack_2f58;
  undefined8 uStack_2f50;
  undefined8 uStack_2f48;
  float local_2f40;
  float fStack_2f3c;
  float fStack_2f38;
  float fStack_2f34;
  float fStack_2f30;
  float fStack_2f2c;
  float fStack_2f28;
  float fStack_2f24;
  undefined8 local_2f20;
  undefined8 uStack_2f18;
  undefined8 uStack_2f10;
  undefined8 uStack_2f08;
  float local_2f00;
  float fStack_2efc;
  float fStack_2ef8;
  float fStack_2ef4;
  float fStack_2ef0;
  float fStack_2eec;
  float fStack_2ee8;
  float fStack_2ee4;
  undefined8 local_2ee0;
  undefined8 uStack_2ed8;
  undefined8 uStack_2ed0;
  undefined8 uStack_2ec8;
  undefined8 local_2ec0;
  undefined8 uStack_2eb8;
  undefined8 uStack_2eb0;
  undefined8 uStack_2ea8;
  undefined8 local_2ea0;
  undefined8 uStack_2e98;
  undefined8 uStack_2e90;
  undefined8 uStack_2e88;
  undefined8 local_2e80;
  undefined8 uStack_2e78;
  undefined8 uStack_2e70;
  undefined8 uStack_2e68;
  undefined8 local_2e60;
  undefined8 uStack_2e58;
  undefined8 uStack_2e50;
  undefined8 uStack_2e48;
  undefined8 local_2e40;
  undefined8 uStack_2e38;
  undefined8 uStack_2e30;
  undefined8 uStack_2e28;
  undefined8 local_2e20;
  undefined8 uStack_2e18;
  undefined8 uStack_2e10;
  undefined8 uStack_2e08;
  undefined8 local_2e00;
  undefined8 uStack_2df8;
  undefined8 uStack_2df0;
  undefined8 uStack_2de8;
  undefined8 local_2de0;
  undefined8 uStack_2dd8;
  undefined8 uStack_2dd0;
  undefined8 uStack_2dc8;
  undefined8 local_2dc0;
  undefined8 uStack_2db8;
  undefined8 uStack_2db0;
  undefined8 uStack_2da8;
  undefined8 local_2da0;
  undefined8 uStack_2d98;
  undefined8 uStack_2d90;
  undefined8 uStack_2d88;
  undefined8 local_2d80;
  undefined8 uStack_2d78;
  undefined8 uStack_2d70;
  undefined8 uStack_2d68;
  undefined8 local_2d60;
  undefined8 uStack_2d58;
  undefined8 uStack_2d50;
  undefined8 uStack_2d48;
  undefined8 local_2d40;
  undefined8 uStack_2d38;
  undefined8 uStack_2d30;
  undefined8 uStack_2d28;
  undefined8 local_2d20;
  undefined8 uStack_2d18;
  undefined8 uStack_2d10;
  undefined8 uStack_2d08;
  undefined8 local_2d00;
  undefined8 uStack_2cf8;
  undefined8 uStack_2cf0;
  undefined8 uStack_2ce8;
  undefined8 local_2ce0;
  undefined8 uStack_2cd8;
  undefined8 uStack_2cd0;
  undefined8 uStack_2cc8;
  undefined8 local_2cc0;
  undefined8 uStack_2cb8;
  undefined8 uStack_2cb0;
  undefined8 uStack_2ca8;
  undefined8 local_2ca0;
  undefined8 uStack_2c98;
  undefined8 uStack_2c90;
  undefined8 uStack_2c88;
  undefined8 local_2c80;
  undefined8 uStack_2c78;
  undefined8 uStack_2c70;
  undefined8 uStack_2c68;
  undefined8 local_2c60;
  undefined8 uStack_2c58;
  undefined8 uStack_2c50;
  undefined8 uStack_2c48;
  undefined8 local_2c40;
  undefined8 uStack_2c38;
  undefined8 uStack_2c30;
  undefined8 uStack_2c28;
  undefined1 local_2c20 [32];
  undefined8 local_2c00;
  undefined8 uStack_2bf8;
  undefined8 uStack_2bf0;
  undefined8 uStack_2be8;
  undefined8 local_2be0;
  undefined8 uStack_2bd8;
  undefined8 uStack_2bd0;
  undefined8 uStack_2bc8;
  undefined8 local_2bc0;
  undefined8 uStack_2bb8;
  undefined8 uStack_2bb0;
  undefined8 uStack_2ba8;
  undefined8 local_2ba0;
  undefined8 uStack_2b98;
  undefined8 uStack_2b90;
  undefined8 uStack_2b88;
  undefined8 local_2b80;
  undefined8 uStack_2b78;
  undefined8 uStack_2b70;
  undefined8 uStack_2b68;
  undefined8 local_2b60;
  undefined8 uStack_2b58;
  undefined8 uStack_2b50;
  undefined8 uStack_2b48;
  undefined8 local_2b40;
  undefined8 uStack_2b38;
  undefined8 uStack_2b30;
  undefined8 uStack_2b28;
  undefined8 local_2b20;
  undefined8 uStack_2b18;
  undefined8 uStack_2b10;
  undefined8 uStack_2b08;
  undefined8 local_2b00;
  undefined8 uStack_2af8;
  undefined8 uStack_2af0;
  undefined8 uStack_2ae8;
  undefined8 local_2ae0;
  undefined8 uStack_2ad8;
  undefined8 uStack_2ad0;
  undefined8 uStack_2ac8;
  undefined8 local_2ac0;
  undefined8 uStack_2ab8;
  undefined8 uStack_2ab0;
  undefined8 uStack_2aa8;
  undefined8 local_2aa0;
  undefined8 uStack_2a98;
  undefined8 uStack_2a90;
  undefined8 uStack_2a88;
  undefined8 local_2a80;
  undefined8 uStack_2a78;
  undefined8 uStack_2a70;
  undefined8 uStack_2a68;
  float local_2a60;
  float fStack_2a5c;
  float fStack_2a58;
  float fStack_2a54;
  float fStack_2a50;
  float fStack_2a4c;
  float fStack_2a48;
  float fStack_2a44;
  undefined8 local_2a40;
  undefined8 uStack_2a38;
  undefined8 uStack_2a30;
  undefined8 uStack_2a28;
  undefined8 local_2a20;
  undefined8 uStack_2a18;
  undefined8 uStack_2a10;
  undefined8 uStack_2a08;
  undefined8 local_2a00;
  undefined8 uStack_29f8;
  undefined8 uStack_29f0;
  undefined8 uStack_29e8;
  undefined8 local_29e0;
  undefined8 uStack_29d8;
  undefined8 uStack_29d0;
  undefined8 uStack_29c8;
  undefined8 local_29c0;
  undefined8 uStack_29b8;
  undefined8 uStack_29b0;
  undefined8 uStack_29a8;
  undefined8 local_29a0;
  undefined8 uStack_2998;
  undefined8 uStack_2990;
  undefined8 uStack_2988;
  float local_2980;
  float fStack_297c;
  float fStack_2978;
  float fStack_2974;
  float fStack_2970;
  float fStack_296c;
  float fStack_2968;
  float fStack_2964;
  undefined8 local_2960;
  undefined8 uStack_2958;
  undefined8 uStack_2950;
  undefined8 uStack_2948;
  undefined8 local_2940;
  undefined8 uStack_2938;
  undefined8 uStack_2930;
  undefined8 uStack_2928;
  undefined8 local_2920;
  undefined8 uStack_2918;
  undefined8 uStack_2910;
  undefined8 uStack_2908;
  undefined8 local_2900;
  undefined8 uStack_28f8;
  undefined8 uStack_28f0;
  undefined8 uStack_28e8;
  undefined8 local_28e0;
  undefined8 uStack_28d8;
  undefined8 uStack_28d0;
  undefined8 uStack_28c8;
  undefined8 local_28c0;
  undefined8 uStack_28b8;
  undefined8 uStack_28b0;
  undefined8 uStack_28a8;
  float local_28a0;
  float fStack_289c;
  float fStack_2898;
  float fStack_2894;
  float fStack_2890;
  float fStack_288c;
  float fStack_2888;
  float fStack_2884;
  undefined8 local_2880;
  undefined8 uStack_2878;
  undefined8 uStack_2870;
  undefined8 uStack_2868;
  undefined8 local_2860;
  undefined8 uStack_2858;
  undefined8 uStack_2850;
  undefined8 uStack_2848;
  undefined8 local_2840;
  undefined8 uStack_2838;
  undefined8 uStack_2830;
  undefined8 uStack_2828;
  undefined8 local_2820;
  undefined8 uStack_2818;
  undefined8 uStack_2810;
  undefined8 uStack_2808;
  undefined8 local_2800;
  undefined8 uStack_27f8;
  undefined8 uStack_27f0;
  undefined8 uStack_27e8;
  undefined8 local_27e0;
  undefined8 uStack_27d8;
  undefined8 uStack_27d0;
  undefined8 uStack_27c8;
  float local_27c0;
  float fStack_27bc;
  float fStack_27b8;
  float fStack_27b4;
  float fStack_27b0;
  float fStack_27ac;
  float fStack_27a8;
  float fStack_27a4;
  undefined8 local_27a0;
  undefined8 uStack_2798;
  undefined8 uStack_2790;
  undefined8 uStack_2788;
  undefined8 local_2780;
  undefined8 uStack_2778;
  undefined8 uStack_2770;
  undefined8 uStack_2768;
  undefined8 local_2760;
  undefined8 uStack_2758;
  undefined8 uStack_2750;
  undefined8 uStack_2748;
  undefined8 local_2740;
  undefined8 uStack_2738;
  undefined8 uStack_2730;
  undefined8 uStack_2728;
  undefined8 local_2720;
  undefined8 uStack_2718;
  undefined8 uStack_2710;
  undefined8 uStack_2708;
  undefined8 local_2700;
  undefined8 uStack_26f8;
  undefined8 uStack_26f0;
  undefined8 uStack_26e8;
  undefined8 local_26e0;
  undefined8 uStack_26d8;
  undefined8 uStack_26d0;
  undefined8 uStack_26c8;
  undefined8 local_26c0;
  undefined8 uStack_26b8;
  undefined8 local_26b0;
  undefined8 uStack_26a8;
  undefined1 local_26a0 [16];
  undefined1 local_2690 [16];
  undefined8 local_2680;
  undefined8 uStack_2678;
  undefined8 uStack_2670;
  undefined8 uStack_2668;
  undefined8 local_2660;
  undefined8 uStack_2658;
  undefined8 uStack_2650;
  undefined8 uStack_2648;
  undefined8 local_2640;
  undefined8 uStack_2638;
  undefined8 uStack_2630;
  undefined8 uStack_2628;
  undefined8 local_2620;
  undefined8 uStack_2618;
  undefined8 uStack_2610;
  undefined8 uStack_2608;
  undefined8 local_2600;
  undefined8 uStack_25f8;
  undefined8 uStack_25f0;
  undefined8 uStack_25e8;
  undefined8 local_25e0;
  undefined8 uStack_25d8;
  undefined8 uStack_25d0;
  undefined8 uStack_25c8;
  undefined8 local_25c0;
  undefined8 uStack_25b8;
  undefined8 local_25b0;
  undefined8 uStack_25a8;
  undefined1 local_25a0 [16];
  undefined1 local_2590 [16];
  undefined8 local_2580;
  undefined8 uStack_2578;
  undefined8 uStack_2570;
  undefined8 uStack_2568;
  undefined8 local_2560;
  undefined8 uStack_2558;
  undefined8 uStack_2550;
  undefined8 uStack_2548;
  undefined8 local_2540;
  undefined8 uStack_2538;
  undefined8 uStack_2530;
  undefined8 uStack_2528;
  undefined8 local_2520;
  undefined8 uStack_2518;
  undefined8 uStack_2510;
  undefined8 uStack_2508;
  undefined8 local_2500;
  undefined8 uStack_24f8;
  undefined8 uStack_24f0;
  undefined8 uStack_24e8;
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [16];
  undefined4 local_24a4;
  undefined8 local_24a0;
  undefined8 uStack_2498;
  undefined8 uStack_2490;
  undefined8 uStack_2488;
  undefined8 local_2480;
  undefined8 uStack_2478;
  undefined8 uStack_2470;
  undefined8 uStack_2468;
  undefined8 local_2460;
  undefined8 uStack_2458;
  undefined8 uStack_2450;
  undefined8 uStack_2448;
  undefined8 local_2440;
  undefined8 uStack_2438;
  undefined8 uStack_2430;
  undefined8 uStack_2428;
  undefined1 local_2410 [16];
  undefined1 local_2400 [16];
  undefined4 local_23e4;
  undefined8 local_23e0;
  undefined8 uStack_23d8;
  undefined8 uStack_23d0;
  undefined8 uStack_23c8;
  undefined8 local_23c0;
  undefined8 uStack_23b8;
  undefined8 uStack_23b0;
  undefined8 uStack_23a8;
  undefined8 local_23a0;
  undefined8 uStack_2398;
  undefined8 uStack_2390;
  undefined8 uStack_2388;
  undefined8 local_2380;
  undefined8 uStack_2378;
  undefined8 local_2370;
  undefined8 uStack_2368;
  undefined8 local_2360;
  undefined8 uStack_2358;
  undefined8 local_2350;
  undefined8 uStack_2348;
  undefined8 local_2340;
  undefined8 uStack_2338;
  undefined8 local_2330;
  undefined8 uStack_2328;
  undefined8 local_2320;
  undefined8 uStack_2318;
  undefined8 local_2310;
  undefined8 uStack_2308;
  undefined4 local_22f4;
  undefined8 local_22f0;
  undefined8 uStack_22e8;
  undefined4 local_22d4;
  undefined8 local_22d0;
  undefined8 uStack_22c8;
  undefined4 local_22b4;
  undefined8 local_22b0;
  undefined8 uStack_22a8;
  undefined4 local_2294;
  undefined8 local_2290;
  undefined8 uStack_2288;
  undefined8 local_2280;
  undefined8 uStack_2278;
  undefined8 uStack_2270;
  undefined8 uStack_2268;
  undefined8 local_2260;
  undefined8 uStack_2258;
  undefined8 uStack_2250;
  undefined8 uStack_2248;
  undefined8 local_2240;
  undefined8 uStack_2238;
  undefined8 uStack_2230;
  undefined8 uStack_2228;
  undefined8 local_2220;
  undefined8 uStack_2218;
  undefined8 uStack_2210;
  undefined8 uStack_2208;
  undefined1 local_2200 [8];
  float fStack_21f8;
  float fStack_21f4;
  float fStack_21f0;
  float fStack_21ec;
  float fStack_21e8;
  undefined8 local_21e0;
  undefined8 uStack_21d8;
  undefined8 uStack_21d0;
  undefined8 uStack_21c8;
  undefined8 local_21c0;
  undefined8 uStack_21b8;
  undefined8 uStack_21b0;
  undefined8 uStack_21a8;
  undefined4 local_2188;
  undefined4 local_2184;
  undefined8 local_2180;
  undefined8 uStack_2178;
  undefined8 uStack_2170;
  undefined8 uStack_2168;
  float local_2160;
  float fStack_215c;
  float fStack_2158;
  float fStack_2154;
  float fStack_2150;
  float fStack_214c;
  float fStack_2148;
  undefined4 uStack_2144;
  undefined1 local_2140 [16];
  undefined1 auStack_2130 [16];
  undefined4 local_2120;
  undefined4 local_211c;
  undefined4 local_2118;
  undefined4 local_2114;
  undefined4 local_2110;
  undefined4 local_210c;
  undefined4 local_2108;
  undefined4 local_2104;
  undefined1 local_2100 [16];
  undefined1 auStack_20f0 [16];
  undefined4 local_20e0;
  undefined4 local_20dc;
  undefined4 local_20d8;
  undefined4 local_20d4;
  undefined4 local_20d0;
  undefined4 local_20cc;
  undefined4 local_20c8;
  undefined4 local_20c4;
  undefined8 local_20c0;
  undefined8 uStack_20b8;
  undefined8 uStack_20b0;
  undefined8 uStack_20a8;
  float local_20a0;
  float fStack_209c;
  float fStack_2098;
  float fStack_2094;
  float fStack_2090;
  float fStack_208c;
  float fStack_2088;
  undefined4 uStack_2084;
  undefined8 local_2080;
  undefined8 uStack_2078;
  undefined8 uStack_2070;
  undefined8 uStack_2068;
  undefined8 local_2060;
  undefined8 uStack_2058;
  undefined8 uStack_2050;
  undefined8 uStack_2048;
  undefined4 local_2024;
  undefined8 local_2020;
  undefined8 uStack_2018;
  undefined8 uStack_2010;
  undefined8 uStack_2008;
  undefined8 local_2000;
  ulong uStack_1ff8;
  undefined8 uStack_1ff0;
  undefined8 uStack_1fe8;
  undefined1 local_1fe0 [16];
  undefined1 auStack_1fd0 [16];
  undefined4 local_1fc0;
  undefined4 local_1fbc;
  undefined4 local_1fb8;
  undefined4 local_1fb4;
  undefined4 local_1fb0;
  undefined4 local_1fac;
  undefined4 local_1fa8;
  undefined4 local_1fa4;
  undefined1 local_1fa0 [32];
  float local_1f80;
  float fStack_1f7c;
  float fStack_1f78;
  float fStack_1f74;
  float fStack_1f70;
  float fStack_1f6c;
  float fStack_1f68;
  float fStack_1f64;
  undefined8 local_1f60;
  undefined8 uStack_1f58;
  undefined8 uStack_1f50;
  undefined8 uStack_1f48;
  undefined8 local_1f40;
  undefined8 uStack_1f38;
  undefined8 uStack_1f30;
  undefined8 uStack_1f28;
  undefined8 local_1f20;
  undefined8 uStack_1f18;
  undefined8 uStack_1f10;
  undefined8 uStack_1f08;
  undefined1 local_1f00 [32];
  undefined8 local_1ee0;
  undefined8 uStack_1ed8;
  undefined8 uStack_1ed0;
  undefined8 uStack_1ec8;
  undefined8 local_1ec0;
  undefined8 uStack_1eb8;
  undefined8 uStack_1eb0;
  undefined8 uStack_1ea8;
  undefined1 local_1ea0 [8];
  undefined8 uStack_1e98;
  undefined8 uStack_1e90;
  undefined8 uStack_1e88;
  undefined8 local_1e80;
  undefined8 uStack_1e78;
  undefined8 uStack_1e70;
  undefined8 uStack_1e68;
  undefined1 local_1e60 [32];
  undefined8 local_1e40;
  undefined8 uStack_1e38;
  undefined8 uStack_1e30;
  undefined8 uStack_1e28;
  undefined8 local_1e20;
  undefined8 uStack_1e18;
  undefined8 uStack_1e10;
  undefined8 uStack_1e08;
  undefined8 local_1e00;
  undefined8 uStack_1df8;
  undefined8 uStack_1df0;
  undefined8 uStack_1de8;
  undefined8 local_1de0;
  undefined8 uStack_1dd8;
  undefined8 uStack_1dd0;
  undefined8 uStack_1dc8;
  undefined8 local_1dc0;
  undefined8 uStack_1db8;
  undefined8 uStack_1db0;
  undefined8 uStack_1da8;
  undefined8 local_1da0;
  undefined8 uStack_1d98;
  undefined8 uStack_1d90;
  undefined8 uStack_1d88;
  undefined8 local_1d80;
  undefined8 uStack_1d78;
  undefined8 uStack_1d70;
  undefined8 uStack_1d68;
  undefined8 local_1d60;
  undefined8 uStack_1d58;
  undefined8 uStack_1d50;
  undefined8 uStack_1d48;
  undefined8 local_1d40;
  undefined8 uStack_1d38;
  undefined8 uStack_1d30;
  undefined8 uStack_1d28;
  undefined8 local_1d20;
  undefined8 uStack_1d18;
  undefined8 uStack_1d10;
  undefined8 uStack_1d08;
  undefined8 local_1d00;
  undefined8 uStack_1cf8;
  undefined8 uStack_1cf0;
  undefined8 uStack_1ce8;
  undefined8 local_1ce0;
  undefined8 uStack_1cd8;
  undefined8 uStack_1cd0;
  undefined8 uStack_1cc8;
  undefined8 local_1cc0;
  undefined8 uStack_1cb8;
  undefined8 uStack_1cb0;
  undefined8 uStack_1ca8;
  undefined8 local_1ca0;
  undefined8 uStack_1c98;
  undefined8 uStack_1c90;
  undefined8 uStack_1c88;
  undefined8 local_1c80;
  undefined8 uStack_1c78;
  undefined8 uStack_1c70;
  undefined8 uStack_1c68;
  undefined8 local_1c60;
  undefined8 uStack_1c58;
  undefined8 uStack_1c50;
  undefined8 uStack_1c48;
  undefined8 local_1c40;
  undefined8 uStack_1c38;
  undefined8 uStack_1c30;
  undefined8 uStack_1c28;
  undefined8 local_1c20;
  undefined8 uStack_1c18;
  undefined8 uStack_1c10;
  undefined8 uStack_1c08;
  undefined8 local_1c00;
  undefined8 uStack_1bf8;
  undefined8 uStack_1bf0;
  undefined8 uStack_1be8;
  undefined8 local_1be0;
  undefined8 uStack_1bd8;
  undefined8 uStack_1bd0;
  undefined8 uStack_1bc8;
  undefined8 local_1bc0;
  undefined8 uStack_1bb8;
  undefined8 uStack_1bb0;
  undefined8 uStack_1ba8;
  undefined8 local_1ba0;
  undefined8 uStack_1b98;
  undefined8 uStack_1b90;
  undefined8 uStack_1b88;
  float local_1b80;
  float fStack_1b7c;
  float fStack_1b78;
  float fStack_1b74;
  float fStack_1b70;
  float fStack_1b6c;
  float fStack_1b68;
  undefined4 uStack_1b64;
  undefined8 local_1b60;
  undefined8 uStack_1b58;
  undefined8 uStack_1b50;
  undefined8 uStack_1b48;
  float local_1b40;
  float fStack_1b3c;
  float fStack_1b38;
  float fStack_1b34;
  float fStack_1b30;
  float fStack_1b2c;
  float fStack_1b28;
  float fStack_1b24;
  undefined8 local_1b20;
  undefined8 uStack_1b18;
  undefined8 uStack_1b10;
  undefined8 uStack_1b08;
  float local_1b00;
  float fStack_1afc;
  float fStack_1af8;
  float fStack_1af4;
  float fStack_1af0;
  float fStack_1aec;
  float fStack_1ae8;
  float fStack_1ae4;
  undefined8 local_1ae0;
  undefined8 uStack_1ad8;
  undefined8 uStack_1ad0;
  undefined8 uStack_1ac8;
  float local_1ac0;
  float fStack_1abc;
  float fStack_1ab8;
  float fStack_1ab4;
  float fStack_1ab0;
  float fStack_1aac;
  float fStack_1aa8;
  float fStack_1aa4;
  undefined8 local_1aa0;
  undefined8 uStack_1a98;
  undefined8 uStack_1a90;
  undefined8 uStack_1a88;
  float local_1a80;
  float fStack_1a7c;
  float fStack_1a78;
  float fStack_1a74;
  float fStack_1a70;
  float fStack_1a6c;
  float fStack_1a68;
  float fStack_1a64;
  undefined8 local_1a60;
  undefined8 uStack_1a58;
  undefined8 uStack_1a50;
  undefined8 uStack_1a48;
  float local_1a40;
  float fStack_1a3c;
  float fStack_1a38;
  float fStack_1a34;
  float fStack_1a30;
  float fStack_1a2c;
  float fStack_1a28;
  float fStack_1a24;
  undefined8 local_1a20;
  undefined8 uStack_1a18;
  undefined8 uStack_1a10;
  undefined8 uStack_1a08;
  float local_1a00;
  float fStack_19fc;
  float fStack_19f8;
  float fStack_19f4;
  float fStack_19f0;
  float fStack_19ec;
  float fStack_19e8;
  float fStack_19e4;
  undefined8 local_19e0;
  undefined8 uStack_19d8;
  undefined8 uStack_19d0;
  undefined8 uStack_19c8;
  undefined8 local_19c0;
  undefined8 uStack_19b8;
  undefined8 uStack_19b0;
  undefined8 uStack_19a8;
  undefined8 local_19a0;
  undefined8 uStack_1998;
  undefined8 uStack_1990;
  undefined8 uStack_1988;
  undefined8 local_1980;
  undefined8 uStack_1978;
  undefined8 uStack_1970;
  undefined8 uStack_1968;
  undefined8 local_1960;
  undefined8 uStack_1958;
  undefined8 uStack_1950;
  undefined8 uStack_1948;
  undefined8 local_1940;
  undefined8 uStack_1938;
  undefined8 uStack_1930;
  undefined8 uStack_1928;
  undefined8 local_1920;
  undefined8 uStack_1918;
  undefined8 uStack_1910;
  undefined8 uStack_1908;
  undefined8 local_1900;
  undefined8 uStack_18f8;
  undefined8 uStack_18f0;
  undefined8 uStack_18e8;
  undefined8 local_18e0;
  undefined8 uStack_18d8;
  undefined8 uStack_18d0;
  undefined8 uStack_18c8;
  undefined8 local_18c0;
  undefined8 uStack_18b8;
  undefined8 uStack_18b0;
  undefined8 uStack_18a8;
  undefined8 local_18a0;
  undefined8 uStack_1898;
  undefined8 uStack_1890;
  undefined8 uStack_1888;
  undefined8 local_1880;
  undefined8 uStack_1878;
  undefined8 uStack_1870;
  undefined8 uStack_1868;
  undefined8 local_1860;
  undefined8 uStack_1858;
  undefined8 uStack_1850;
  undefined8 uStack_1848;
  undefined8 local_1840;
  undefined8 uStack_1838;
  undefined8 uStack_1830;
  undefined8 uStack_1828;
  undefined8 local_1820;
  undefined8 uStack_1818;
  undefined8 uStack_1810;
  undefined8 uStack_1808;
  undefined8 local_1800;
  undefined8 uStack_17f8;
  undefined8 uStack_17f0;
  undefined8 uStack_17e8;
  undefined8 local_17e0;
  undefined8 uStack_17d8;
  undefined8 uStack_17d0;
  undefined8 uStack_17c8;
  undefined8 local_17c0;
  undefined8 uStack_17b8;
  undefined8 uStack_17b0;
  undefined8 uStack_17a8;
  undefined8 local_17a0;
  undefined8 uStack_1798;
  undefined8 uStack_1790;
  undefined8 uStack_1788;
  undefined8 local_1780;
  undefined8 uStack_1778;
  undefined8 uStack_1770;
  undefined8 uStack_1768;
  undefined8 local_1760;
  undefined8 uStack_1758;
  undefined8 uStack_1750;
  undefined8 uStack_1748;
  undefined8 local_1740;
  undefined8 uStack_1738;
  undefined8 uStack_1730;
  undefined8 uStack_1728;
  undefined1 local_1720 [32];
  undefined8 local_1700;
  undefined8 uStack_16f8;
  undefined8 uStack_16f0;
  undefined8 uStack_16e8;
  undefined8 local_16e0;
  undefined8 uStack_16d8;
  undefined8 uStack_16d0;
  undefined8 uStack_16c8;
  undefined8 local_16c0;
  undefined8 uStack_16b8;
  undefined8 uStack_16b0;
  undefined8 uStack_16a8;
  undefined8 local_16a0;
  undefined8 uStack_1698;
  undefined8 uStack_1690;
  undefined8 uStack_1688;
  undefined8 local_1680;
  undefined8 uStack_1678;
  undefined8 uStack_1670;
  undefined8 uStack_1668;
  undefined8 local_1660;
  undefined8 uStack_1658;
  undefined8 uStack_1650;
  undefined8 uStack_1648;
  undefined8 local_1640;
  undefined8 uStack_1638;
  undefined8 uStack_1630;
  undefined8 uStack_1628;
  undefined8 local_1620;
  undefined8 uStack_1618;
  undefined8 uStack_1610;
  undefined8 uStack_1608;
  undefined8 local_1600;
  undefined8 uStack_15f8;
  undefined8 uStack_15f0;
  undefined8 uStack_15e8;
  undefined8 local_15e0;
  undefined8 uStack_15d8;
  undefined8 uStack_15d0;
  undefined8 uStack_15c8;
  undefined8 local_15c0;
  undefined8 uStack_15b8;
  undefined8 uStack_15b0;
  undefined8 uStack_15a8;
  float local_15a0;
  float fStack_159c;
  float fStack_1598;
  float fStack_1594;
  float fStack_1590;
  float fStack_158c;
  float fStack_1588;
  float fStack_1584;
  undefined8 local_1580;
  undefined8 uStack_1578;
  undefined8 uStack_1570;
  undefined8 uStack_1568;
  undefined8 local_1560;
  undefined8 uStack_1558;
  undefined8 uStack_1550;
  undefined8 uStack_1548;
  undefined8 local_1540;
  undefined8 uStack_1538;
  undefined8 uStack_1530;
  undefined8 uStack_1528;
  undefined8 local_1520;
  undefined8 uStack_1518;
  undefined8 uStack_1510;
  undefined8 uStack_1508;
  undefined8 local_1500;
  undefined8 uStack_14f8;
  undefined8 uStack_14f0;
  undefined8 uStack_14e8;
  undefined8 local_14e0;
  undefined8 uStack_14d8;
  undefined8 uStack_14d0;
  undefined8 uStack_14c8;
  float local_14c0;
  float fStack_14bc;
  float fStack_14b8;
  float fStack_14b4;
  float fStack_14b0;
  float fStack_14ac;
  float fStack_14a8;
  float fStack_14a4;
  undefined8 local_14a0;
  undefined8 uStack_1498;
  undefined8 uStack_1490;
  undefined8 uStack_1488;
  undefined8 local_1480;
  undefined8 uStack_1478;
  undefined8 uStack_1470;
  undefined8 uStack_1468;
  undefined8 local_1460;
  undefined8 uStack_1458;
  undefined8 uStack_1450;
  undefined8 uStack_1448;
  undefined8 local_1440;
  undefined8 uStack_1438;
  undefined8 uStack_1430;
  undefined8 uStack_1428;
  undefined8 local_1420;
  undefined8 uStack_1418;
  undefined8 uStack_1410;
  undefined8 uStack_1408;
  undefined8 local_1400;
  undefined8 uStack_13f8;
  undefined8 uStack_13f0;
  undefined8 uStack_13e8;
  undefined8 local_13e0;
  undefined8 uStack_13d8;
  undefined8 local_13d0;
  undefined8 uStack_13c8;
  undefined1 local_13c0 [16];
  undefined1 local_13b0 [16];
  undefined8 local_13a0;
  undefined8 uStack_1398;
  undefined8 uStack_1390;
  undefined8 uStack_1388;
  undefined8 local_1380;
  undefined8 uStack_1378;
  undefined8 uStack_1370;
  undefined8 uStack_1368;
  undefined8 local_1360;
  undefined8 uStack_1358;
  undefined8 uStack_1350;
  undefined8 uStack_1348;
  undefined8 local_1340;
  undefined8 uStack_1338;
  undefined8 uStack_1330;
  undefined8 uStack_1328;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined1 local_12f0 [16];
  undefined1 local_12e0 [16];
  undefined4 local_12c4;
  undefined8 local_12c0;
  undefined8 uStack_12b8;
  undefined8 uStack_12b0;
  undefined8 uStack_12a8;
  undefined8 local_12a0;
  undefined8 uStack_1298;
  undefined8 uStack_1290;
  undefined8 uStack_1288;
  undefined8 local_1280;
  undefined8 uStack_1278;
  undefined8 local_1270;
  undefined8 uStack_1268;
  undefined8 local_1260;
  undefined8 uStack_1258;
  undefined8 local_1250;
  undefined8 uStack_1248;
  undefined4 local_1234;
  undefined8 local_1230;
  undefined8 uStack_1228;
  undefined4 local_1214;
  undefined8 local_1210;
  undefined8 uStack_1208;
  undefined1 local_1200 [8];
  undefined8 uStack_11f8;
  undefined8 uStack_11f0;
  undefined8 uStack_11e8;
  float local_11e0;
  float fStack_11dc;
  float fStack_11d8;
  float fStack_11d4;
  float fStack_11d0;
  float fStack_11cc;
  float fStack_11c8;
  float fStack_11c4;
  undefined1 local_11c0 [32];
  undefined1 local_11a0 [32];
  undefined1 local_1180 [8];
  undefined8 uStack_1178;
  undefined8 uStack_1170;
  undefined8 uStack_1168;
  undefined1 local_1160 [32];
  undefined8 local_1140;
  undefined8 uStack_1138;
  undefined8 uStack_1130;
  undefined8 uStack_1128;
  undefined8 local_1120;
  undefined8 uStack_1118;
  undefined8 uStack_1110;
  undefined8 uStack_1108;
  undefined1 local_1100 [8];
  undefined8 uStack_10f8;
  undefined8 uStack_10f0;
  undefined8 uStack_10e8;
  undefined8 local_10e0;
  undefined8 uStack_10d8;
  undefined8 uStack_10d0;
  undefined8 uStack_10c8;
  undefined8 local_10c0;
  undefined8 uStack_10b8;
  undefined8 uStack_10b0;
  undefined8 uStack_10a8;
  undefined8 local_10a0;
  undefined8 uStack_1098;
  undefined8 uStack_1090;
  undefined8 uStack_1088;
  undefined8 local_1080;
  undefined8 uStack_1078;
  undefined8 uStack_1070;
  undefined8 uStack_1068;
  undefined8 local_1060;
  undefined8 uStack_1058;
  undefined8 uStack_1050;
  undefined8 uStack_1048;
  undefined8 local_1040;
  undefined8 uStack_1038;
  undefined8 uStack_1030;
  undefined8 uStack_1028;
  undefined8 local_1020;
  undefined8 uStack_1018;
  undefined8 uStack_1010;
  undefined8 uStack_1008;
  undefined8 local_1000;
  undefined8 uStack_ff8;
  undefined8 uStack_ff0;
  undefined8 uStack_fe8;
  undefined8 local_fe0;
  undefined8 uStack_fd8;
  undefined8 uStack_fd0;
  undefined8 uStack_fc8;
  undefined8 local_fc0;
  undefined8 uStack_fb8;
  undefined8 uStack_fb0;
  undefined8 uStack_fa8;
  undefined8 local_fa0;
  undefined8 uStack_f98;
  undefined8 uStack_f90;
  undefined8 uStack_f88;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 uStack_f70;
  undefined8 uStack_f68;
  undefined8 local_f60;
  undefined8 uStack_f58;
  undefined8 uStack_f50;
  undefined8 uStack_f48;
  undefined8 local_f40;
  undefined8 uStack_f38;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f20;
  undefined8 uStack_f18;
  undefined8 uStack_f10;
  undefined8 uStack_f08;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 local_ec0;
  undefined8 uStack_eb8;
  undefined8 uStack_eb0;
  undefined8 uStack_ea8;
  undefined8 local_ea0;
  undefined8 uStack_e98;
  undefined8 uStack_e90;
  undefined8 uStack_e88;
  undefined8 local_e80;
  undefined8 uStack_e78;
  undefined8 uStack_e70;
  undefined8 uStack_e68;
  undefined8 local_e60;
  undefined8 uStack_e58;
  undefined8 uStack_e50;
  undefined8 uStack_e48;
  undefined8 local_e40;
  undefined8 uStack_e38;
  undefined8 uStack_e30;
  undefined8 uStack_e28;
  undefined8 local_e20;
  undefined8 uStack_e18;
  undefined8 uStack_e10;
  undefined8 uStack_e08;
  undefined8 local_e00;
  undefined8 uStack_df8;
  undefined8 uStack_df0;
  undefined8 uStack_de8;
  undefined8 local_de0;
  undefined8 uStack_dd8;
  undefined8 uStack_dd0;
  undefined8 uStack_dc8;
  undefined8 local_dc0;
  undefined8 uStack_db8;
  undefined8 uStack_db0;
  undefined8 uStack_da8;
  undefined8 local_da0;
  undefined8 uStack_d98;
  undefined8 uStack_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  undefined8 uStack_d70;
  undefined8 uStack_d68;
  undefined8 local_d60;
  undefined8 uStack_d58;
  undefined8 uStack_d50;
  undefined8 uStack_d48;
  undefined8 local_d40;
  undefined8 uStack_d38;
  undefined8 uStack_d30;
  undefined8 uStack_d28;
  undefined8 local_d20;
  undefined8 uStack_d18;
  undefined8 uStack_d10;
  undefined8 uStack_d08;
  float local_d00;
  float fStack_cfc;
  float fStack_cf8;
  float fStack_cf4;
  float fStack_cf0;
  float fStack_cec;
  float fStack_ce8;
  float fStack_ce4;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  float fStack_cb0;
  float fStack_cac;
  float fStack_ca8;
  float fStack_ca4;
  undefined8 local_ca0;
  undefined8 uStack_c98;
  undefined8 uStack_c90;
  undefined8 uStack_c88;
  float local_c80;
  float fStack_c7c;
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  float fStack_c64;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 uStack_c50;
  undefined8 uStack_c48;
  float local_c40;
  float fStack_c3c;
  float fStack_c38;
  float fStack_c34;
  float fStack_c30;
  float fStack_c2c;
  float fStack_c28;
  float fStack_c24;
  undefined8 local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  float local_c00;
  float fStack_bfc;
  float fStack_bf8;
  float fStack_bf4;
  float fStack_bf0;
  float fStack_bec;
  float fStack_be8;
  float fStack_be4;
  undefined8 local_be0;
  undefined8 uStack_bd8;
  undefined8 uStack_bd0;
  undefined8 uStack_bc8;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float fStack_bb0;
  float fStack_bac;
  float fStack_ba8;
  float fStack_ba4;
  undefined8 local_ba0;
  undefined8 uStack_b98;
  undefined8 uStack_b90;
  undefined8 uStack_b88;
  float local_b80;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  float fStack_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined8 local_b60;
  undefined8 uStack_b58;
  undefined8 uStack_b50;
  undefined8 uStack_b48;
  float local_b40;
  float fStack_b3c;
  float fStack_b38;
  float fStack_b34;
  float fStack_b30;
  float fStack_b2c;
  float fStack_b28;
  float fStack_b24;
  undefined8 local_b20;
  undefined8 uStack_b18;
  undefined8 uStack_b10;
  undefined8 uStack_b08;
  float local_b00;
  float fStack_afc;
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  undefined4 uStack_ae4;
  undefined8 local_ae0;
  undefined8 uStack_ad8;
  undefined8 uStack_ad0;
  undefined8 uStack_ac8;
  float local_ac0;
  float fStack_abc;
  float fStack_ab8;
  float fStack_ab4;
  float fStack_ab0;
  float fStack_aac;
  float fStack_aa8;
  float fStack_aa4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 uStack_a90;
  undefined8 uStack_a88;
  undefined8 local_a80;
  undefined8 uStack_a78;
  undefined8 uStack_a70;
  undefined8 uStack_a68;
  undefined8 local_a60;
  undefined8 uStack_a58;
  undefined8 uStack_a50;
  undefined8 uStack_a48;
  undefined8 local_a40;
  undefined8 uStack_a38;
  undefined8 uStack_a30;
  undefined8 uStack_a28;
  undefined8 local_a20;
  undefined8 uStack_a18;
  undefined8 uStack_a10;
  undefined8 uStack_a08;
  undefined8 local_a00;
  undefined8 uStack_9f8;
  undefined8 uStack_9f0;
  undefined8 uStack_9e8;
  undefined8 local_9e0;
  undefined8 uStack_9d8;
  undefined8 uStack_9d0;
  undefined8 uStack_9c8;
  undefined8 local_9c0;
  undefined8 uStack_9b8;
  undefined8 uStack_9b0;
  undefined8 uStack_9a8;
  undefined8 local_9a0;
  undefined8 uStack_998;
  undefined8 uStack_990;
  undefined8 uStack_988;
  undefined8 local_980;
  undefined8 uStack_978;
  undefined8 uStack_970;
  undefined8 uStack_968;
  undefined8 local_960;
  undefined8 uStack_958;
  undefined8 uStack_950;
  undefined8 uStack_948;
  undefined8 local_940;
  undefined8 uStack_938;
  undefined8 uStack_930;
  undefined8 uStack_928;
  undefined8 local_920;
  undefined8 uStack_918;
  undefined8 uStack_910;
  undefined8 uStack_908;
  undefined8 local_900;
  undefined8 uStack_8f8;
  undefined8 uStack_8f0;
  undefined8 uStack_8e8;
  undefined8 local_8e0;
  undefined8 uStack_8d8;
  undefined8 uStack_8d0;
  undefined8 uStack_8c8;
  undefined8 local_8c0;
  undefined8 uStack_8b8;
  undefined8 uStack_8b0;
  undefined8 uStack_8a8;
  undefined8 local_8a0;
  undefined8 uStack_898;
  undefined8 uStack_890;
  undefined8 uStack_888;
  undefined8 local_880;
  undefined8 uStack_878;
  undefined8 uStack_870;
  undefined8 uStack_868;
  undefined8 local_860;
  undefined8 uStack_858;
  undefined8 uStack_850;
  undefined8 uStack_848;
  undefined8 local_840;
  undefined8 uStack_838;
  undefined8 uStack_830;
  undefined8 uStack_828;
  undefined8 local_820;
  undefined8 uStack_818;
  undefined8 uStack_810;
  undefined8 uStack_808;
  undefined8 local_800;
  undefined8 uStack_7f8;
  undefined8 uStack_7f0;
  undefined8 uStack_7e8;
  undefined8 local_7e0;
  undefined8 uStack_7d8;
  undefined8 uStack_7d0;
  undefined8 uStack_7c8;
  undefined8 local_7c0;
  undefined8 uStack_7b8;
  undefined8 uStack_7b0;
  undefined8 uStack_7a8;
  undefined8 local_7a0;
  undefined8 uStack_798;
  undefined8 uStack_790;
  undefined8 uStack_788;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined8 local_760;
  undefined8 uStack_758;
  undefined8 uStack_750;
  undefined8 uStack_748;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined8 local_720;
  undefined8 uStack_718;
  undefined8 uStack_710;
  undefined8 uStack_708;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined8 local_6e0;
  undefined8 uStack_6d8;
  undefined8 uStack_6d0;
  undefined8 uStack_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined1 local_6a0 [32];
  undefined8 local_680;
  undefined8 uStack_678;
  undefined8 uStack_670;
  undefined8 uStack_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined8 local_640;
  undefined8 uStack_638;
  undefined8 uStack_630;
  undefined8 uStack_628;
  undefined1 local_620 [32];
  undefined8 local_600;
  undefined8 uStack_5f8;
  undefined8 uStack_5f0;
  undefined8 uStack_5e8;
  undefined8 local_5e0;
  undefined8 uStack_5d8;
  undefined8 uStack_5d0;
  undefined8 uStack_5c8;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 local_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  float local_460;
  float fStack_45c;
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  float fStack_444;
  undefined8 local_440;
  undefined8 uStack_438;
  undefined8 uStack_430;
  undefined8 uStack_428;
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined8 local_400;
  undefined8 uStack_3f8;
  undefined8 uStack_3f0;
  undefined8 uStack_3e8;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3b0 [16];
  undefined1 local_3a0 [16];
  undefined4 local_384;
  undefined8 local_380;
  undefined8 uStack_378;
  undefined8 uStack_370;
  undefined8 uStack_368;
  undefined8 local_360;
  undefined8 uStack_358;
  undefined8 uStack_350;
  undefined8 uStack_348;
  undefined8 local_340;
  undefined8 uStack_338;
  undefined8 uStack_330;
  undefined8 uStack_328;
  undefined8 local_320;
  undefined8 uStack_318;
  undefined8 uStack_310;
  undefined8 uStack_308;
  undefined8 local_300;
  undefined8 uStack_2f8;
  undefined8 uStack_2f0;
  undefined8 uStack_2e8;
  undefined8 local_2e0;
  undefined8 uStack_2d8;
  undefined8 uStack_2d0;
  undefined8 uStack_2c8;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  undefined8 local_280;
  undefined8 uStack_278;
  undefined8 uStack_270;
  undefined8 uStack_268;
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 local_230;
  undefined8 uStack_228;
  undefined1 local_220 [16];
  undefined1 local_210 [16];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 local_1c0;
  undefined8 uStack_1b8;
  undefined8 uStack_1b0;
  undefined8 uStack_1a8;
  undefined4 local_184;
  undefined8 local_180;
  undefined8 uStack_178;
  undefined4 local_164;
  undefined8 local_160;
  undefined8 uStack_158;
  undefined8 local_150;
  undefined8 uStack_148;
  undefined8 local_140;
  undefined8 uStack_138;
  undefined8 local_130;
  undefined8 uStack_128;
  undefined8 local_120;
  undefined8 uStack_118;
  long local_108;
  undefined4 local_fc;
  long local_f8;
  undefined8 *local_f0;
  undefined4 local_e4;
  int local_e0;
  int local_dc;
  undefined8 *local_d8;
  long local_d0;
  undefined4 local_c4;
  long local_c0;
  long local_b8;
  undefined4 local_ac;
  int local_a8;
  int local_a4;
  undefined8 *local_a0;
  long local_98;
  undefined4 local_8c;
  long local_88;
  long local_80;
  undefined4 local_74;
  int local_70;
  int local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  long local_38;
  
  local_52bc = *(int *)((long)in_RDI + 0x2c);
  local_52c0 = (int)in_RDI[7];
  local_52c4 = *(int *)((long)in_RSI + 0x2c);
  local_52c8 = (int)in_RSI[6];
  local_52cc = (int)in_RSI[7];
  local_52d0 = in_R8D * in_R9D;
  local_52b8 = in_R9D;
  local_52b4 = in_R8D;
  local_52b0 = in_RCX;
  local_52a8 = in_RDX;
  local_52a0 = in_RSI;
  local_5298 = in_RDI;
  std::allocator<int>::allocator((allocator<int> *)0x7e5e0d);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffa508,in_stack_ffffffffffffa500,in_stack_ffffffffffffa4f8);
  std::allocator<int>::~allocator((allocator<int> *)0x7e5e39);
  local_5308 = std::vector<int,_std::allocator<int>_>::operator[](&local_52e8,0);
  local_530c = 0;
  local_5310 = 0;
  local_5314 = local_52bc * dilation_w - local_52b4 * in_stack_00000008;
  for (local_5318 = 0; local_5318 < local_52b8; local_5318 = local_5318 + 1) {
    for (local_531c = 0; local_531c < local_52b4; local_531c = local_531c + 1) {
      local_5308[local_530c] = local_5310;
      local_530c = local_530c + 1;
      local_5310 = in_stack_00000008 + local_5310;
    }
    local_5310 = local_5314 + local_5310;
  }
  local_51c0 = local_52b0;
  local_5328 = *local_52b0;
  for (local_532c = 0; local_532c < local_52cc; local_532c = local_532c + 1) {
    local_51f0 = &local_5380;
    local_6c = *(int *)((long)local_52a0 + 0x2c);
    local_70 = (int)local_52a0[6];
    local_74 = *(undefined4 *)((long)local_52a0 + 0x34);
    local_80 = *local_52a0 + local_52a0[8] * (long)local_532c * local_52a0[2];
    local_88 = local_52a0[2];
    local_8c = (undefined4)local_52a0[3];
    local_98 = local_52a0[4];
    local_68 = &local_5380;
    local_58 = (long)local_6c * (long)local_70 * local_88;
    local_51d0 = &local_5380;
    local_5290 = &local_5380;
    local_5c = 0x10;
    local_51fc = local_532c;
    local_51fd = 1;
    local_5380 = 0;
    local_5370 = 0;
    local_5368 = 0;
    local_5358 = 0;
    local_5354 = 0;
    local_5350 = 0;
    local_534c = 0;
    local_5348 = 0;
    local_5340 = 0;
    local_5378 = 0;
    local_5338 = local_80;
    for (local_5384 = 0; local_5384 < local_52c8; local_5384 = local_5384 + 1) {
      for (local_5388 = 0; uVar65 = uStack_4048, uVar64 = uStack_4050, uVar63 = uStack_4058,
          uVar62 = local_4060, local_5388 < local_52c4; local_5388 = local_5388 + 1) {
        local_53c0 = 0;
        uStack_53b8 = 0;
        uStack_53b0 = 0;
        paStack_53a8 = (allocator_type *)0x0;
        if (local_5328 != 0) {
          local_5088 = (undefined8 *)(local_5328 + (long)(local_532c << 3) * 4);
          local_53c0 = *local_5088;
          uStack_53b8 = local_5088[1];
          uStack_53b0 = local_5088[2];
          paStack_53a8 = (allocator_type *)local_5088[3];
        }
        local_5168 = &local_5410;
        local_dc = *(int *)((long)local_52a8 + 0x2c);
        local_e0 = (int)local_52a8[6];
        local_e4 = *(undefined4 *)((long)local_52a8 + 0x34);
        local_f0 = (undefined8 *)(*local_52a8 + local_52a8[8] * (long)local_532c * local_52a8[2]);
        local_f8 = local_52a8[2];
        local_fc = (undefined4)local_52a8[3];
        local_108 = local_52a8[4];
        local_d8 = &local_5410;
        local_38 = (long)local_dc * (long)local_e0 * local_f8;
        local_51c8 = &local_5410;
        local_5280 = &local_5410;
        local_3c = 0x10;
        uStack_4768 = 0;
        uStack_4770 = 0;
        uStack_4778 = 0;
        local_4780 = 0;
        local_5174 = local_532c;
        local_5175 = 1;
        local_5410 = 0;
        local_5400 = 0;
        local_53f8 = 0;
        local_53e8 = 0;
        local_53e4 = 0;
        local_53e0 = 0;
        local_53dc = 0;
        local_53d8 = 0;
        local_53d0 = 0;
        local_5408 = 0;
        local_53c8 = local_f0;
        for (local_5414 = 0; local_5414 < local_52c0; local_5414 = local_5414 + 1) {
          local_5198 = &local_5460;
          local_a4 = *(int *)((long)local_5298 + 0x2c);
          local_a8 = (int)local_5298[6];
          local_ac = *(undefined4 *)((long)local_5298 + 0x34);
          local_b8 = *local_5298 + local_5298[8] * (long)local_5414 * local_5298[2];
          local_c0 = local_5298[2];
          local_c4 = (undefined4)local_5298[3];
          local_d0 = local_5298[4];
          local_a0 = &local_5460;
          local_48 = (long)local_a4 * (long)local_a8 * local_c0;
          local_51b4 = local_5384 * stride_w;
          local_51b0 = &local_5460;
          for (local_546c = 0; local_546c < local_52d0; local_546c = local_546c + 1) {
            local_4e88 = (float *)(local_b8 + (long)local_a4 * (long)local_51b4 * local_c0 +
                                   (long)(local_5388 * dilation_h * 8) * 4 +
                                  (long)(local_5308[local_546c] << 3) * 4);
            local_4ec0 = *local_4e88;
            local_4ba0 = CONCAT44(local_4ec0,local_4ec0);
            uStack_4b98 = CONCAT44(local_4ec0,local_4ec0);
            uStack_4b90 = CONCAT44(local_4ec0,local_4ec0);
            uStack_4b88 = CONCAT44(local_4ec0,local_4ec0);
            local_4ec8 = local_4e88 + 1;
            local_4f00 = *local_4ec8;
            local_4c00 = CONCAT44(local_4f00,local_4f00);
            uStack_4bf8 = CONCAT44(local_4f00,local_4f00);
            uStack_4bf0 = CONCAT44(local_4f00,local_4f00);
            uStack_4be8 = CONCAT44(local_4f00,local_4f00);
            local_4f08 = local_4e88 + 2;
            local_4f40 = *local_4f08;
            local_4c60 = CONCAT44(local_4f40,local_4f40);
            uStack_4c58 = CONCAT44(local_4f40,local_4f40);
            uStack_4c50 = CONCAT44(local_4f40,local_4f40);
            uStack_4c48 = CONCAT44(local_4f40,local_4f40);
            local_4f48 = local_4e88 + 3;
            local_4f80 = *local_4f48;
            local_4cc0 = CONCAT44(local_4f80,local_4f80);
            uStack_4cb8 = CONCAT44(local_4f80,local_4f80);
            uStack_4cb0 = CONCAT44(local_4f80,local_4f80);
            uStack_4ca8 = CONCAT44(local_4f80,local_4f80);
            local_4f88 = local_4e88 + 4;
            local_4fc0 = *local_4f88;
            local_4d20 = CONCAT44(local_4fc0,local_4fc0);
            uStack_4d18 = CONCAT44(local_4fc0,local_4fc0);
            uStack_4d10 = CONCAT44(local_4fc0,local_4fc0);
            uStack_4d08 = CONCAT44(local_4fc0,local_4fc0);
            local_4fc8 = local_4e88 + 5;
            local_5000 = *local_4fc8;
            local_4d80 = CONCAT44(local_5000,local_5000);
            uStack_4d78 = CONCAT44(local_5000,local_5000);
            uStack_4d70 = CONCAT44(local_5000,local_5000);
            uStack_4d68 = CONCAT44(local_5000,local_5000);
            local_5008 = local_4e88 + 6;
            local_5040 = *local_5008;
            local_4de0 = CONCAT44(local_5040,local_5040);
            uStack_4dd8 = CONCAT44(local_5040,local_5040);
            uStack_4dd0 = CONCAT44(local_5040,local_5040);
            uStack_4dc8 = CONCAT44(local_5040,local_5040);
            local_5048 = local_4e88 + 7;
            local_5080 = *local_5048;
            local_4e40 = CONCAT44(local_5080,local_5080);
            uStack_4e38 = CONCAT44(local_5080,local_5080);
            uStack_4e30 = CONCAT44(local_5080,local_5080);
            uStack_4e28 = CONCAT44(local_5080,local_5080);
            local_50c8 = local_53c8;
            local_4bc0 = *local_53c8;
            uStack_4bb8 = local_53c8[1];
            uStack_4bb0 = local_53c8[2];
            uStack_4ba8 = local_53c8[3];
            local_50d0 = local_53c8 + 4;
            local_4c20 = *local_50d0;
            uStack_4c18 = local_53c8[5];
            uStack_4c10 = local_53c8[6];
            uStack_4c08 = local_53c8[7];
            local_4be0 = local_53c0;
            uStack_4bd8 = uStack_53b8;
            uStack_4bd0 = uStack_53b0;
            uStack_4bc8 = paStack_53a8;
            local_4980._0_4_ = (float)local_4bc0;
            local_4980._4_4_ = (float)((ulong)local_4bc0 >> 0x20);
            uStack_4978._0_4_ = (float)uStack_4bb8;
            uStack_4978._4_4_ = (float)((ulong)uStack_4bb8 >> 0x20);
            uStack_4970._0_4_ = (float)uStack_4bb0;
            uStack_4970._4_4_ = (float)((ulong)uStack_4bb0 >> 0x20);
            uStack_4968._0_4_ = (float)uStack_4ba8;
            local_4b60 = local_4ec0 * (float)local_4980;
            fStack_4b5c = local_4ec0 * local_4980._4_4_;
            fStack_4b58 = local_4ec0 * (float)uStack_4978;
            fStack_4b54 = local_4ec0 * uStack_4978._4_4_;
            fStack_4b50 = local_4ec0 * (float)uStack_4970;
            fStack_4b4c = local_4ec0 * uStack_4970._4_4_;
            fStack_4b48 = local_4ec0 * (float)uStack_4968;
            uVar6 = local_53c0;
            uVar7 = uStack_53b8;
            uVar8 = uStack_53b0;
            uVar9 = paStack_53a8;
            local_4b80._0_4_ = (float)local_53c0;
            local_4b80._4_4_ = (float)((ulong)local_53c0 >> 0x20);
            uStack_4b78._0_4_ = (float)uStack_53b8;
            uStack_4b78._4_4_ = (float)((ulong)uStack_53b8 >> 0x20);
            uStack_4b70._0_4_ = (float)uStack_53b0;
            uStack_4b70._4_4_ = (float)((ulong)uStack_53b0 >> 0x20);
            uStack_4b68._0_4_ = SUB84(paStack_53a8,0);
            uStack_4b68._4_4_ = (float)((ulong)paStack_53a8 >> 0x20);
            local_4c40 = CONCAT44(fStack_4b5c + local_4b80._4_4_,local_4b60 + (float)local_4b80);
            uStack_4c38 = CONCAT44(fStack_4b54 + uStack_4b78._4_4_,fStack_4b58 + (float)uStack_4b78)
            ;
            uStack_4c30 = CONCAT44(fStack_4b4c + uStack_4b70._4_4_,fStack_4b50 + (float)uStack_4b70)
            ;
            uStack_4c28 = CONCAT44(local_4ec0 + uStack_4b68._4_4_,fStack_4b48 + (float)uStack_4b68);
            local_4940._0_4_ = (float)local_4c20;
            local_4940._4_4_ = (float)((ulong)local_4c20 >> 0x20);
            uStack_4938._0_4_ = (float)uStack_4c18;
            uStack_4938._4_4_ = (float)((ulong)uStack_4c18 >> 0x20);
            uStack_4930._0_4_ = (float)uStack_4c10;
            uStack_4930._4_4_ = (float)((ulong)uStack_4c10 >> 0x20);
            uStack_4928._0_4_ = (float)uStack_4c08;
            local_4b20 = local_4f00 * (float)local_4940;
            fStack_4b1c = local_4f00 * local_4940._4_4_;
            fStack_4b18 = local_4f00 * (float)uStack_4938;
            fStack_4b14 = local_4f00 * uStack_4938._4_4_;
            fStack_4b10 = local_4f00 * (float)uStack_4930;
            fStack_4b0c = local_4f00 * uStack_4930._4_4_;
            fStack_4b08 = local_4f00 * (float)uStack_4928;
            fVar132 = local_4b20 + local_4b60 + (float)local_4b80;
            fVar135 = fStack_4b1c + fStack_4b5c + local_4b80._4_4_;
            fVar137 = fStack_4b18 + fStack_4b58 + (float)uStack_4b78;
            fVar139 = fStack_4b14 + fStack_4b54 + uStack_4b78._4_4_;
            fVar141 = fStack_4b10 + fStack_4b50 + (float)uStack_4b70;
            fVar143 = fStack_4b0c + fStack_4b4c + uStack_4b70._4_4_;
            fVar145 = fStack_4b08 + fStack_4b48 + (float)uStack_4b68;
            fVar147 = local_4f00 + local_4ec0 + uStack_4b68._4_4_;
            local_4ca0 = CONCAT44(fVar135,fVar132);
            uStack_4c98 = CONCAT44(fVar139,fVar137);
            uStack_4c90 = CONCAT44(fVar143,fVar141);
            uStack_4c88 = CONCAT44(fVar147,fVar145);
            local_50d8 = local_53c8 + 8;
            local_4c80 = *local_50d8;
            uStack_4c78 = local_53c8[9];
            uStack_4c70 = local_53c8[10];
            uStack_4c68 = local_53c8[0xb];
            local_50e0 = local_53c8 + 0xc;
            local_4ce0 = *local_50e0;
            uStack_4cd8 = local_53c8[0xd];
            uStack_4cd0 = local_53c8[0xe];
            uStack_4cc8 = local_53c8[0xf];
            local_4900._0_4_ = (float)local_4c80;
            local_4900._4_4_ = (float)((ulong)local_4c80 >> 0x20);
            uStack_48f8._0_4_ = (float)uStack_4c78;
            uStack_48f8._4_4_ = (float)((ulong)uStack_4c78 >> 0x20);
            uStack_48f0._0_4_ = (float)uStack_4c70;
            uStack_48f0._4_4_ = (float)((ulong)uStack_4c70 >> 0x20);
            uStack_48e8._0_4_ = (float)uStack_4c68;
            local_4ae0 = local_4f40 * (float)local_4900;
            fStack_4adc = local_4f40 * local_4900._4_4_;
            fStack_4ad8 = local_4f40 * (float)uStack_48f8;
            fStack_4ad4 = local_4f40 * uStack_48f8._4_4_;
            fStack_4ad0 = local_4f40 * (float)uStack_48f0;
            fStack_4acc = local_4f40 * uStack_48f0._4_4_;
            fStack_4ac8 = local_4f40 * (float)uStack_48e8;
            fVar132 = local_4ae0 + fVar132;
            fVar135 = fStack_4adc + fVar135;
            fVar137 = fStack_4ad8 + fVar137;
            fVar139 = fStack_4ad4 + fVar139;
            fVar141 = fStack_4ad0 + fVar141;
            fVar143 = fStack_4acc + fVar143;
            fVar145 = fStack_4ac8 + fVar145;
            fVar147 = local_4f40 + fVar147;
            local_4d00 = CONCAT44(fVar135,fVar132);
            uStack_4cf8 = CONCAT44(fVar139,fVar137);
            uStack_4cf0 = CONCAT44(fVar143,fVar141);
            uStack_4ce8 = CONCAT44(fVar147,fVar145);
            local_48c0._0_4_ = (float)local_4ce0;
            local_48c0._4_4_ = (float)((ulong)local_4ce0 >> 0x20);
            uStack_48b8._0_4_ = (float)uStack_4cd8;
            uStack_48b8._4_4_ = (float)((ulong)uStack_4cd8 >> 0x20);
            uStack_48b0._0_4_ = (float)uStack_4cd0;
            uStack_48b0._4_4_ = (float)((ulong)uStack_4cd0 >> 0x20);
            uStack_48a8._0_4_ = (float)uStack_4cc8;
            local_4aa0 = local_4f80 * (float)local_48c0;
            fStack_4a9c = local_4f80 * local_48c0._4_4_;
            fStack_4a98 = local_4f80 * (float)uStack_48b8;
            fStack_4a94 = local_4f80 * uStack_48b8._4_4_;
            fStack_4a90 = local_4f80 * (float)uStack_48b0;
            fStack_4a8c = local_4f80 * uStack_48b0._4_4_;
            fStack_4a88 = local_4f80 * (float)uStack_48a8;
            fVar132 = local_4aa0 + fVar132;
            fVar135 = fStack_4a9c + fVar135;
            fVar137 = fStack_4a98 + fVar137;
            fVar139 = fStack_4a94 + fVar139;
            fVar141 = fStack_4a90 + fVar141;
            fVar143 = fStack_4a8c + fVar143;
            fVar145 = fStack_4a88 + fVar145;
            fVar147 = local_4f80 + fVar147;
            local_4d60 = CONCAT44(fVar135,fVar132);
            uStack_4d58 = CONCAT44(fVar139,fVar137);
            uStack_4d50 = CONCAT44(fVar143,fVar141);
            uStack_4d48 = CONCAT44(fVar147,fVar145);
            local_50e8 = local_53c8 + 0x10;
            local_4d40 = *local_50e8;
            uStack_4d38 = local_53c8[0x11];
            uStack_4d30 = local_53c8[0x12];
            uStack_4d28 = local_53c8[0x13];
            local_50f0 = local_53c8 + 0x14;
            local_4da0 = *local_50f0;
            uStack_4d98 = local_53c8[0x15];
            uStack_4d90 = local_53c8[0x16];
            uStack_4d88 = local_53c8[0x17];
            local_4880._0_4_ = (float)local_4d40;
            local_4880._4_4_ = (float)((ulong)local_4d40 >> 0x20);
            uStack_4878._0_4_ = (float)uStack_4d38;
            uStack_4878._4_4_ = (float)((ulong)uStack_4d38 >> 0x20);
            uStack_4870._0_4_ = (float)uStack_4d30;
            uStack_4870._4_4_ = (float)((ulong)uStack_4d30 >> 0x20);
            uStack_4868._0_4_ = (float)uStack_4d28;
            local_4a60 = local_4fc0 * (float)local_4880;
            fStack_4a5c = local_4fc0 * local_4880._4_4_;
            fStack_4a58 = local_4fc0 * (float)uStack_4878;
            fStack_4a54 = local_4fc0 * uStack_4878._4_4_;
            fStack_4a50 = local_4fc0 * (float)uStack_4870;
            fStack_4a4c = local_4fc0 * uStack_4870._4_4_;
            fStack_4a48 = local_4fc0 * (float)uStack_4868;
            fVar132 = local_4a60 + fVar132;
            fVar135 = fStack_4a5c + fVar135;
            fVar137 = fStack_4a58 + fVar137;
            fVar139 = fStack_4a54 + fVar139;
            fVar141 = fStack_4a50 + fVar141;
            fVar143 = fStack_4a4c + fVar143;
            fVar145 = fStack_4a48 + fVar145;
            fVar147 = local_4fc0 + fVar147;
            local_4dc0 = CONCAT44(fVar135,fVar132);
            uStack_4db8 = CONCAT44(fVar139,fVar137);
            uStack_4db0 = CONCAT44(fVar143,fVar141);
            uStack_4da8 = CONCAT44(fVar147,fVar145);
            local_4840._0_4_ = (float)local_4da0;
            local_4840._4_4_ = (float)((ulong)local_4da0 >> 0x20);
            uStack_4838._0_4_ = (float)uStack_4d98;
            uStack_4838._4_4_ = (float)((ulong)uStack_4d98 >> 0x20);
            uStack_4830._0_4_ = (float)uStack_4d90;
            uStack_4830._4_4_ = (float)((ulong)uStack_4d90 >> 0x20);
            uStack_4828._0_4_ = (float)uStack_4d88;
            local_4a20 = local_5000 * (float)local_4840;
            fStack_4a1c = local_5000 * local_4840._4_4_;
            fStack_4a18 = local_5000 * (float)uStack_4838;
            fStack_4a14 = local_5000 * uStack_4838._4_4_;
            fStack_4a10 = local_5000 * (float)uStack_4830;
            fStack_4a0c = local_5000 * uStack_4830._4_4_;
            fStack_4a08 = local_5000 * (float)uStack_4828;
            fVar132 = local_4a20 + fVar132;
            fVar135 = fStack_4a1c + fVar135;
            fVar137 = fStack_4a18 + fVar137;
            fVar139 = fStack_4a14 + fVar139;
            fVar141 = fStack_4a10 + fVar141;
            fVar143 = fStack_4a0c + fVar143;
            fVar145 = fStack_4a08 + fVar145;
            fVar147 = local_5000 + fVar147;
            local_4e20 = CONCAT44(fVar135,fVar132);
            uStack_4e18 = CONCAT44(fVar139,fVar137);
            uStack_4e10 = CONCAT44(fVar143,fVar141);
            uStack_4e08 = CONCAT44(fVar147,fVar145);
            local_50f8 = local_53c8 + 0x18;
            local_4e00 = *local_50f8;
            uStack_4df8 = local_53c8[0x19];
            uStack_4df0 = local_53c8[0x1a];
            uStack_4de8 = local_53c8[0x1b];
            local_5100 = local_53c8 + 0x1c;
            local_4e60 = *local_5100;
            uStack_4e58 = local_53c8[0x1d];
            uStack_4e50 = local_53c8[0x1e];
            uStack_4e48 = local_53c8[0x1f];
            local_4800._0_4_ = (float)local_4e00;
            local_4800._4_4_ = (float)((ulong)local_4e00 >> 0x20);
            uStack_47f8._0_4_ = (float)uStack_4df8;
            uStack_47f8._4_4_ = (float)((ulong)uStack_4df8 >> 0x20);
            uStack_47f0._0_4_ = (float)uStack_4df0;
            uStack_47f0._4_4_ = (float)((ulong)uStack_4df0 >> 0x20);
            uStack_47e8._0_4_ = (float)uStack_4de8;
            local_49e0 = local_5040 * (float)local_4800;
            fStack_49dc = local_5040 * local_4800._4_4_;
            fStack_49d8 = local_5040 * (float)uStack_47f8;
            fStack_49d4 = local_5040 * uStack_47f8._4_4_;
            fStack_49d0 = local_5040 * (float)uStack_47f0;
            fStack_49cc = local_5040 * uStack_47f0._4_4_;
            fStack_49c8 = local_5040 * (float)uStack_47e8;
            fVar132 = local_49e0 + fVar132;
            fVar135 = fStack_49dc + fVar135;
            fVar137 = fStack_49d8 + fVar137;
            fVar139 = fStack_49d4 + fVar139;
            fVar141 = fStack_49d0 + fVar141;
            fVar143 = fStack_49cc + fVar143;
            fVar145 = fStack_49c8 + fVar145;
            fVar147 = local_5040 + fVar147;
            local_4e80 = CONCAT44(fVar135,fVar132);
            uStack_4e78 = CONCAT44(fVar139,fVar137);
            uStack_4e70 = CONCAT44(fVar143,fVar141);
            uStack_4e68 = CONCAT44(fVar147,fVar145);
            local_47c0._0_4_ = (float)local_4e60;
            local_47c0._4_4_ = (float)((ulong)local_4e60 >> 0x20);
            uStack_47b8._0_4_ = (float)uStack_4e58;
            uStack_47b8._4_4_ = (float)((ulong)uStack_4e58 >> 0x20);
            uStack_47b0._0_4_ = (float)uStack_4e50;
            uStack_47b0._4_4_ = (float)((ulong)uStack_4e50 >> 0x20);
            uStack_47a8._0_4_ = (float)uStack_4e48;
            local_49a0 = local_5080 * (float)local_47c0;
            fStack_499c = local_5080 * local_47c0._4_4_;
            fStack_4998 = local_5080 * (float)uStack_47b8;
            fStack_4994 = local_5080 * uStack_47b8._4_4_;
            fStack_4990 = local_5080 * (float)uStack_47b0;
            fStack_498c = local_5080 * uStack_47b0._4_4_;
            fStack_4988 = local_5080 * (float)uStack_47a8;
            local_53c0 = CONCAT44(fStack_499c + fVar135,local_49a0 + fVar132);
            uStack_53b8 = CONCAT44(fStack_4994 + fVar139,fStack_4998 + fVar137);
            uStack_53b0 = CONCAT44(fStack_498c + fVar143,fStack_4990 + fVar141);
            paStack_53a8 = (allocator_type *)CONCAT44(local_5080 + fVar147,fStack_4988 + fVar145);
            local_53c8 = local_53c8 + 0x20;
            fStack_507c = local_5080;
            fStack_5078 = local_5080;
            fStack_5074 = local_5080;
            fStack_5070 = local_5080;
            fStack_506c = local_5080;
            fStack_5068 = local_5080;
            fStack_5064 = local_5080;
            local_504c = local_5080;
            fStack_503c = local_5040;
            fStack_5038 = local_5040;
            fStack_5034 = local_5040;
            fStack_5030 = local_5040;
            fStack_502c = local_5040;
            fStack_5028 = local_5040;
            fStack_5024 = local_5040;
            local_500c = local_5040;
            fStack_4ffc = local_5000;
            fStack_4ff8 = local_5000;
            fStack_4ff4 = local_5000;
            fStack_4ff0 = local_5000;
            fStack_4fec = local_5000;
            fStack_4fe8 = local_5000;
            fStack_4fe4 = local_5000;
            local_4fcc = local_5000;
            fStack_4fbc = local_4fc0;
            fStack_4fb8 = local_4fc0;
            fStack_4fb4 = local_4fc0;
            fStack_4fb0 = local_4fc0;
            fStack_4fac = local_4fc0;
            fStack_4fa8 = local_4fc0;
            fStack_4fa4 = local_4fc0;
            local_4f8c = local_4fc0;
            fStack_4f7c = local_4f80;
            fStack_4f78 = local_4f80;
            fStack_4f74 = local_4f80;
            fStack_4f70 = local_4f80;
            fStack_4f6c = local_4f80;
            fStack_4f68 = local_4f80;
            fStack_4f64 = local_4f80;
            local_4f4c = local_4f80;
            fStack_4f3c = local_4f40;
            fStack_4f38 = local_4f40;
            fStack_4f34 = local_4f40;
            fStack_4f30 = local_4f40;
            fStack_4f2c = local_4f40;
            fStack_4f28 = local_4f40;
            fStack_4f24 = local_4f40;
            local_4f0c = local_4f40;
            fStack_4efc = local_4f00;
            fStack_4ef8 = local_4f00;
            fStack_4ef4 = local_4f00;
            fStack_4ef0 = local_4f00;
            fStack_4eec = local_4f00;
            fStack_4ee8 = local_4f00;
            fStack_4ee4 = local_4f00;
            local_4ecc = local_4f00;
            fStack_4ebc = local_4ec0;
            fStack_4eb8 = local_4ec0;
            fStack_4eb4 = local_4ec0;
            fStack_4eb0 = local_4ec0;
            fStack_4eac = local_4ec0;
            fStack_4ea8 = local_4ec0;
            fStack_4ea4 = local_4ec0;
            local_4e8c = local_4ec0;
            local_4b80 = uVar6;
            uStack_4b78 = uVar7;
            uStack_4b70 = uVar8;
            uStack_4b68 = uVar9;
            fStack_4b44 = local_4ec0;
            local_4b40 = local_4c40;
            uStack_4b38 = uStack_4c38;
            uStack_4b30 = uStack_4c30;
            uStack_4b28 = uStack_4c28;
            fStack_4b04 = local_4f00;
            local_4b00 = local_4ca0;
            uStack_4af8 = uStack_4c98;
            uStack_4af0 = uStack_4c90;
            uStack_4ae8 = uStack_4c88;
            fStack_4ac4 = local_4f40;
            local_4ac0 = local_4d00;
            uStack_4ab8 = uStack_4cf8;
            uStack_4ab0 = uStack_4cf0;
            uStack_4aa8 = uStack_4ce8;
            fStack_4a84 = local_4f80;
            local_4a80 = local_4d60;
            uStack_4a78 = uStack_4d58;
            uStack_4a70 = uStack_4d50;
            uStack_4a68 = uStack_4d48;
            fStack_4a44 = local_4fc0;
            local_4a40 = local_4dc0;
            uStack_4a38 = uStack_4db8;
            uStack_4a30 = uStack_4db0;
            uStack_4a28 = uStack_4da8;
            fStack_4a04 = local_5000;
            local_4a00 = local_4e20;
            uStack_49f8 = uStack_4e18;
            uStack_49f0 = uStack_4e10;
            uStack_49e8 = uStack_4e08;
            fStack_49c4 = local_5040;
            local_49c0 = local_4e80;
            uStack_49b8 = uStack_4e78;
            uStack_49b0 = uStack_4e70;
            uStack_49a8 = uStack_4e68;
            fStack_4984 = local_5080;
            local_4980 = local_4bc0;
            uStack_4978 = uStack_4bb8;
            uStack_4970 = uStack_4bb0;
            uStack_4968 = uStack_4ba8;
            local_4960 = local_4ec0;
            fStack_495c = local_4ec0;
            fStack_4958 = local_4ec0;
            fStack_4954 = local_4ec0;
            fStack_4950 = local_4ec0;
            fStack_494c = local_4ec0;
            fStack_4948 = local_4ec0;
            fStack_4944 = local_4ec0;
            local_4940 = local_4c20;
            uStack_4938 = uStack_4c18;
            uStack_4930 = uStack_4c10;
            uStack_4928 = uStack_4c08;
            local_4920 = local_4f00;
            fStack_491c = local_4f00;
            fStack_4918 = local_4f00;
            fStack_4914 = local_4f00;
            fStack_4910 = local_4f00;
            fStack_490c = local_4f00;
            fStack_4908 = local_4f00;
            fStack_4904 = local_4f00;
            local_4900 = local_4c80;
            uStack_48f8 = uStack_4c78;
            uStack_48f0 = uStack_4c70;
            uStack_48e8 = uStack_4c68;
            local_48e0 = local_4f40;
            fStack_48dc = local_4f40;
            fStack_48d8 = local_4f40;
            fStack_48d4 = local_4f40;
            fStack_48d0 = local_4f40;
            fStack_48cc = local_4f40;
            fStack_48c8 = local_4f40;
            fStack_48c4 = local_4f40;
            local_48c0 = local_4ce0;
            uStack_48b8 = uStack_4cd8;
            uStack_48b0 = uStack_4cd0;
            uStack_48a8 = uStack_4cc8;
            local_48a0 = local_4f80;
            fStack_489c = local_4f80;
            fStack_4898 = local_4f80;
            fStack_4894 = local_4f80;
            fStack_4890 = local_4f80;
            fStack_488c = local_4f80;
            fStack_4888 = local_4f80;
            fStack_4884 = local_4f80;
            local_4880 = local_4d40;
            uStack_4878 = uStack_4d38;
            uStack_4870 = uStack_4d30;
            uStack_4868 = uStack_4d28;
            local_4860 = local_4fc0;
            fStack_485c = local_4fc0;
            fStack_4858 = local_4fc0;
            fStack_4854 = local_4fc0;
            fStack_4850 = local_4fc0;
            fStack_484c = local_4fc0;
            fStack_4848 = local_4fc0;
            fStack_4844 = local_4fc0;
            local_4840 = local_4da0;
            uStack_4838 = uStack_4d98;
            uStack_4830 = uStack_4d90;
            uStack_4828 = uStack_4d88;
            local_4820 = local_5000;
            fStack_481c = local_5000;
            fStack_4818 = local_5000;
            fStack_4814 = local_5000;
            fStack_4810 = local_5000;
            fStack_480c = local_5000;
            fStack_4808 = local_5000;
            fStack_4804 = local_5000;
            local_4800 = local_4e00;
            uStack_47f8 = uStack_4df8;
            uStack_47f0 = uStack_4df0;
            uStack_47e8 = uStack_4de8;
            local_47e0 = local_5040;
            fStack_47dc = local_5040;
            fStack_47d8 = local_5040;
            fStack_47d4 = local_5040;
            fStack_47d0 = local_5040;
            fStack_47cc = local_5040;
            fStack_47c8 = local_5040;
            fStack_47c4 = local_5040;
            local_47c0 = local_4e60;
            uStack_47b8 = uStack_4e58;
            uStack_47b0 = uStack_4e50;
            uStack_47a8 = uStack_4e48;
            local_47a0 = local_5080;
            fStack_479c = local_5080;
            fStack_4798 = local_5080;
            fStack_4794 = local_5080;
            fStack_4790 = local_5080;
            fStack_478c = local_5080;
            fStack_4788 = local_5080;
            fStack_4784 = local_5080;
          }
          local_5270 = &local_5460;
          local_4c = 0x10;
          local_51a4 = local_5414;
          local_51a5 = 1;
          local_5460 = 0;
          local_5450 = 0;
          local_5448 = 0;
          local_5438 = 0;
          local_5434 = 0;
          local_5430 = 0;
          local_542c = 0;
          local_5428 = 0;
          local_5420 = 0;
          local_5458 = 0;
          local_5248 = local_5270;
          local_5440 = local_d0;
        }
        local_46c0 = local_53c0;
        uStack_46b8 = uStack_53b8;
        uStack_46b0 = uStack_53b0;
        uStack_46a8 = paStack_53a8;
        local_46c4 = stride_h;
        local_46d0 = (long *)CONCAT44(in_stack_00000034,activation_type);
        local_4060._0_4_ = (float)local_53c0;
        fVar132 = (float)local_4060;
        local_4060._4_4_ = (float)((ulong)local_53c0 >> 0x20);
        fVar135 = local_4060._4_4_;
        uStack_4058._0_4_ = (float)uStack_53b8;
        fVar137 = (float)uStack_4058;
        uStack_4058._4_4_ = (float)((ulong)uStack_53b8 >> 0x20);
        fVar139 = uStack_4058._4_4_;
        uStack_4050._0_4_ = (float)uStack_53b0;
        fVar141 = (float)uStack_4050;
        uStack_4050._4_4_ = (float)((ulong)uStack_53b0 >> 0x20);
        fVar143 = uStack_4050._4_4_;
        uStack_4048._0_4_ = SUB84(paStack_53a8,0);
        fVar145 = (float)uStack_4048;
        local_4060 = uVar62;
        uStack_4058 = uVar63;
        uStack_4050 = uVar64;
        uStack_4048 = uVar65;
        switch(stride_h) {
        case 1:
          local_4520._8_8_ = SUB328(ZEXT832(0),4);
          local_44e0 = local_53c0;
          uStack_44d8 = uStack_53b8;
          uStack_44d0 = uStack_53b0;
          uStack_44c8 = paStack_53a8;
          local_4500 = 0;
          uStack_44f8 = local_4520._8_8_;
          uStack_44f0 = 0;
          uStack_44e8 = 0;
          auVar10._8_8_ = uStack_53b8;
          auVar10._0_8_ = local_53c0;
          auVar10._16_8_ = uStack_53b0;
          auVar10._24_8_ = paStack_53a8;
          local_46a0 = vmaxps_avx(auVar10,ZEXT832((ulong)local_4520._8_8_) << 0x40);
          local_4520 = ZEXT832(0) << 0x20;
          break;
        case 2:
          local_4640 = 0;
          local_4424 = *(uint *)*local_46d0;
          local_4420 = local_53c0;
          uStack_4418 = uStack_53b8;
          uStack_4410 = uStack_53b0;
          uStack_4408 = paStack_53a8;
          local_4320 = ZEXT1232(ZEXT812(0));
          local_42c0 = 0;
          uStack_42b8 = 0;
          uStack_42b0 = 0;
          uStack_42a8 = 0;
          local_42e0 = local_53c0;
          uStack_42d8 = uStack_53b8;
          uStack_42d0 = uStack_53b0;
          uStack_42c8 = paStack_53a8;
          auVar13._8_8_ = uStack_53b8;
          auVar13._0_8_ = local_53c0;
          auVar13._16_8_ = uStack_53b0;
          auVar13._24_8_ = paStack_53a8;
          local_4460 = vmaxps_avx(ZEXT832(0),auVar13);
          local_4280 = 0;
          uStack_4278 = 0;
          uStack_4270 = 0;
          uStack_4268 = 0;
          local_42a0 = local_53c0;
          uStack_4298 = uStack_53b8;
          uStack_4290 = uStack_53b0;
          uStack_4288 = paStack_53a8;
          auVar14._8_8_ = uStack_53b8;
          auVar14._0_8_ = local_53c0;
          auVar14._16_8_ = uStack_53b0;
          auVar14._24_8_ = paStack_53a8;
          local_4480 = vminps_avx(ZEXT832(0),auVar14);
          auVar2 = vinsertps_avx(ZEXT416(local_4424),ZEXT416(local_4424),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4424),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4424),0x30);
          auVar1 = vinsertps_avx(ZEXT416(local_4424),ZEXT416(local_4424),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_4424),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_4424),0x30);
          auVar133._16_16_ = auVar2;
          auVar133._0_16_ = auVar1;
          local_4360._0_8_ = auVar1._0_8_;
          local_4360._8_8_ = auVar1._8_8_;
          local_4360._16_8_ = auVar2._0_8_;
          local_4360._24_8_ = auVar2._8_8_;
          local_43a0 = local_4360._0_8_;
          uVar66 = local_43a0;
          uStack_4398 = local_4360._8_8_;
          uVar67 = uStack_4398;
          uStack_4390 = local_4360._16_8_;
          uVar68 = uStack_4390;
          uStack_4388 = local_4360._24_8_;
          uVar69 = uStack_4388;
          local_43c0 = local_4480._0_8_;
          uVar6 = local_43c0;
          uStack_43b8 = local_4480._8_8_;
          uVar7 = uStack_43b8;
          uStack_43b0 = local_4480._16_8_;
          uVar8 = uStack_43b0;
          uStack_43a8 = local_4480._24_8_;
          uVar9 = uStack_43a8;
          local_43a0._0_4_ = auVar1._0_4_;
          local_43a0._4_4_ = auVar1._4_4_;
          uStack_4398._0_4_ = auVar1._8_4_;
          uStack_4398._4_4_ = auVar1._12_4_;
          uStack_4390._0_4_ = auVar2._0_4_;
          uStack_4390._4_4_ = auVar2._4_4_;
          uStack_4388._0_4_ = auVar2._8_4_;
          uStack_4388._4_4_ = auVar2._12_4_;
          local_43c0._0_4_ = local_4480._0_4_;
          local_43c0._4_4_ = local_4480._4_4_;
          uStack_43b8._0_4_ = local_4480._8_4_;
          uStack_43b8._4_4_ = local_4480._12_4_;
          uStack_43b0._0_4_ = local_4480._16_4_;
          uStack_43b0._4_4_ = local_4480._20_4_;
          uStack_43a8._0_4_ = local_4480._24_4_;
          local_4400 = (float)local_43a0 * (float)local_43c0;
          fStack_43fc = local_43a0._4_4_ * local_43c0._4_4_;
          fStack_43f8 = (float)uStack_4398 * (float)uStack_43b8;
          fStack_43f4 = uStack_4398._4_4_ * uStack_43b8._4_4_;
          fStack_43f0 = (float)uStack_4390 * (float)uStack_43b0;
          fStack_43ec = uStack_4390._4_4_ * uStack_43b0._4_4_;
          fStack_43e8 = (float)uStack_4388 * (float)uStack_43a8;
          local_43e0 = local_4460._0_8_;
          uVar62 = local_43e0;
          uStack_43d8 = local_4460._8_8_;
          uVar63 = uStack_43d8;
          uStack_43d0 = local_4460._16_8_;
          uVar64 = uStack_43d0;
          uStack_43c8 = local_4460._24_8_;
          uVar65 = uStack_43c8;
          fStack_43e4 = uStack_4388._4_4_;
          local_43e0._0_4_ = local_4460._0_4_;
          local_43e0._4_4_ = local_4460._4_4_;
          uStack_43d8._0_4_ = local_4460._8_4_;
          uStack_43d8._4_4_ = local_4460._12_4_;
          uStack_43d0._0_4_ = local_4460._16_4_;
          uStack_43d0._4_4_ = local_4460._20_4_;
          uStack_43c8._0_4_ = local_4460._24_4_;
          uStack_43c8._4_4_ = local_4460._28_4_;
          local_46a0._4_4_ = local_43e0._4_4_ + fStack_43fc;
          local_46a0._0_4_ = (float)local_43e0 + local_4400;
          local_46a0._12_4_ = uStack_43d8._4_4_ + fStack_43f4;
          local_46a0._8_4_ = (float)uStack_43d8 + fStack_43f8;
          local_46a0._20_4_ = uStack_43d0._4_4_ + fStack_43ec;
          local_46a0._16_4_ = (float)uStack_43d0 + fStack_43f0;
          local_46a0._28_4_ = uStack_43c8._4_4_ + uStack_4388._4_4_;
          local_46a0._24_4_ = (float)uStack_43c8 + fStack_43e8;
          local_4638 = local_46d0;
          local_43e0 = uVar62;
          uStack_43d8 = uVar63;
          uStack_43d0 = uVar64;
          uStack_43c8 = uVar65;
          local_43c0 = uVar6;
          uStack_43b8 = uVar7;
          uStack_43b0 = uVar8;
          uStack_43a8 = uVar9;
          local_43a0 = uVar66;
          uStack_4398 = uVar67;
          uStack_4390 = uVar68;
          uStack_4388 = uVar69;
          local_4364 = local_4424;
          local_4360 = auVar133;
          local_4340 = local_4424;
          local_433c = local_4424;
          local_4338 = local_4424;
          local_4334 = local_4424;
          local_4330 = local_4424;
          local_432c = local_4424;
          local_4328 = local_4424;
          local_4324 = local_4424;
          local_4300 = local_4320;
          break;
        case 3:
          local_4650 = 0;
          local_4624 = *(uint *)*local_46d0;
          auVar2 = vinsertps_avx(ZEXT416(local_4624),ZEXT416(local_4624),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4624),0x20);
          local_4620 = vinsertps_avx(auVar2,ZEXT416(local_4624),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_4624),ZEXT416(local_4624),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4624),0x20);
          auStack_4610 = vinsertps_avx(auVar2,ZEXT416(local_4624),0x30);
          local_4700 = local_4620._0_8_;
          uStack_46f8 = local_4620._8_8_;
          uStack_46f0 = auStack_4610._0_8_;
          uStack_46e8 = auStack_4610._8_8_;
          local_4660 = 1;
          local_4628 = *(uint *)(*local_46d0 + 4);
          auVar2 = vinsertps_avx(ZEXT416(local_4628),ZEXT416(local_4628),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4628),0x20);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4628),0x30);
          auVar1 = vinsertps_avx(ZEXT416(local_4628),ZEXT416(local_4628),0x10);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_4628),0x20);
          auVar1 = vinsertps_avx(auVar1,ZEXT416(local_4628),0x30);
          auVar134._16_16_ = auVar2;
          auVar134._0_16_ = auVar1;
          local_45e0._0_8_ = auVar1._0_8_;
          local_45e0._8_8_ = auVar1._8_8_;
          local_45e0._16_8_ = auVar2._0_8_;
          local_45e0._24_8_ = auVar2._8_8_;
          local_4720 = local_45e0._0_8_;
          uStack_4718 = local_45e0._8_8_;
          uStack_4710 = local_45e0._16_8_;
          uStack_4708 = local_45e0._24_8_;
          local_44a0 = local_53c0;
          uStack_4498 = uStack_53b8;
          uStack_4490 = uStack_53b0;
          uStack_4488 = paStack_53a8;
          local_44c0 = local_4620._0_8_;
          uStack_44b8 = local_4620._8_8_;
          uStack_44b0 = auStack_4610._0_8_;
          uStack_44a8 = auStack_4610._8_8_;
          auVar12._8_8_ = uStack_53b8;
          auVar12._0_8_ = local_53c0;
          auVar12._16_8_ = uStack_53b0;
          auVar12._24_8_ = paStack_53a8;
          auVar11._16_8_ = auStack_4610._0_8_;
          auVar11._0_16_ = local_4620;
          auVar11._24_8_ = auStack_4610._8_8_;
          local_4240 = vmaxps_avx(auVar12,auVar11);
          local_4260 = local_45e0._0_8_;
          uStack_4258 = local_45e0._8_8_;
          uStack_4250 = local_45e0._16_8_;
          uStack_4248 = local_45e0._24_8_;
          auVar15._16_8_ = local_45e0._16_8_;
          auVar15._0_16_ = auVar1;
          auVar15._24_8_ = local_45e0._24_8_;
          local_46a0 = vminps_avx(local_4240,auVar15);
          local_4658 = local_46d0;
          local_4648 = local_46d0;
          local_4600 = local_4624;
          local_45fc = local_4624;
          local_45f8 = local_4624;
          local_45f4 = local_4624;
          local_45f0 = local_4624;
          local_45ec = local_4624;
          local_45e8 = local_4624;
          local_45e4 = local_4624;
          local_45e0 = auVar134;
          local_45c0 = local_4628;
          local_45bc = local_4628;
          local_45b8 = local_4628;
          local_45b4 = local_4628;
          local_45b0 = local_4628;
          local_45ac = local_4628;
          local_45a8 = local_4628;
          local_45a4 = local_4628;
          break;
        case 4:
          local_4200 = local_53c0;
          uStack_41f8 = uStack_53b8;
          uStack_41f0 = uStack_53b0;
          uStack_41e8 = paStack_53a8;
          local_4184 = 0x3f800000;
          local_4104 = 0x3f800000;
          local_4108 = 0x3f800000;
          local_410c = 0x3f800000;
          local_4110 = 0x3f800000;
          local_4114 = 0x3f800000;
          local_4118 = 0x3f800000;
          local_411c = 0x3f800000;
          local_4120 = 0x3f800000;
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          local_4140 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          auStack_4130 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          local_4220 = local_4140._0_8_;
          uStack_4218 = local_4140._8_8_;
          uStack_4210 = auStack_4130._0_8_;
          uStack_4208 = auStack_4130._8_8_;
          local_2c20 = ZEXT832(0) << 0x20;
          local_4100._8_8_ = SUB328(ZEXT832(0),4);
          local_4160 = 0;
          uStack_4158 = local_4100._8_8_;
          uStack_4150 = 0;
          uStack_4148 = 0;
          local_4180 = local_53c0;
          uStack_4178 = uStack_53b8;
          uStack_4170 = uStack_53b0;
          uStack_4168 = paStack_53a8;
          auVar16._8_8_ = uStack_53b8;
          auVar16._0_8_ = local_53c0;
          auVar16._16_8_ = uStack_53b0;
          auVar16._24_8_ = paStack_53a8;
          auVar4 = vsubps_avx(ZEXT832((ulong)local_4100._8_8_) << 0x40,auVar16);
          local_33e0 = 0x3f8000003f800000;
          uStack_33d8 = 0x3f8000003f800000;
          uStack_33d0 = 0x3f8000003f800000;
          uStack_33c8 = 0x3f8000003f800000;
          local_3360._0_8_ = auVar4._0_8_;
          local_3360._8_8_ = auVar4._8_8_;
          local_3360._16_8_ = auVar4._16_8_;
          local_3360._24_8_ = auVar4._24_8_;
          local_2ba0 = local_3360._0_8_;
          uStack_2b98 = local_3360._8_8_;
          uStack_2b90 = local_3360._16_8_;
          uStack_2b88 = local_3360._24_8_;
          local_2bc0 = 0x42b0c0a542b0c0a5;
          uStack_2bb8 = 0x42b0c0a542b0c0a5;
          uStack_2bb0 = 0x42b0c0a542b0c0a5;
          uStack_2ba8 = 0x42b0c0a542b0c0a5;
          auVar22._8_8_ = 0x42b0c0a542b0c0a5;
          auVar22._0_8_ = 0x42b0c0a542b0c0a5;
          auVar22._16_8_ = 0x42b0c0a542b0c0a5;
          auVar22._24_8_ = 0x42b0c0a542b0c0a5;
          auVar4 = vminps_avx(auVar4,auVar22);
          local_3360._0_8_ = auVar4._0_8_;
          local_3360._8_8_ = auVar4._8_8_;
          local_3360._16_8_ = auVar4._16_8_;
          local_3360._24_8_ = auVar4._24_8_;
          local_2be0 = local_3360._0_8_;
          uStack_2bd8 = local_3360._8_8_;
          uStack_2bd0 = local_3360._16_8_;
          uStack_2bc8 = local_3360._24_8_;
          local_2c00 = 0xc2b0c0a5c2b0c0a5;
          uStack_2bf8 = 0xc2b0c0a5c2b0c0a5;
          uStack_2bf0 = 0xc2b0c0a5c2b0c0a5;
          uStack_2be8 = 0xc2b0c0a5c2b0c0a5;
          auVar21._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar21._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar21._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar21._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar3 = vmaxps_avx(auVar4,auVar21);
          local_3360._0_8_ = auVar3._0_8_;
          local_3360._8_8_ = auVar3._8_8_;
          local_3360._16_8_ = auVar3._16_8_;
          local_3360._24_8_ = auVar3._24_8_;
          local_30c0 = local_3360._0_8_;
          uStack_30b8 = local_3360._8_8_;
          uStack_30b0 = local_3360._16_8_;
          uStack_30a8 = local_3360._24_8_;
          local_30e0 = 0x3fb8aa3b3fb8aa3b;
          uStack_30d8 = 0x3fb8aa3b3fb8aa3b;
          uStack_30d0 = 0x3fb8aa3b3fb8aa3b;
          uStack_30c8 = 0x3fb8aa3b3fb8aa3b;
          local_3100 = 0x3f0000003f000000;
          uStack_30f8 = 0x3f0000003f000000;
          uStack_30f0 = 0x3f0000003f000000;
          uStack_30e8 = 0x3f0000003f000000;
          local_2e80 = local_3360._0_8_;
          uVar6 = local_2e80;
          uStack_2e78 = local_3360._8_8_;
          uVar7 = uStack_2e78;
          uStack_2e70 = local_3360._16_8_;
          uVar8 = uStack_2e70;
          uStack_2e68 = local_3360._24_8_;
          uVar9 = uStack_2e68;
          local_2ea0 = 0x3fb8aa3b3fb8aa3b;
          uStack_2e98 = 0x3fb8aa3b3fb8aa3b;
          uStack_2e90 = 0x3fb8aa3b3fb8aa3b;
          uStack_2e88 = 0x3fb8aa3b3fb8aa3b;
          local_2e80._0_4_ = auVar3._0_4_;
          local_2e80._4_4_ = auVar3._4_4_;
          uStack_2e78._0_4_ = auVar3._8_4_;
          uStack_2e78._4_4_ = auVar3._12_4_;
          uStack_2e70._0_4_ = auVar3._16_4_;
          uStack_2e70._4_4_ = auVar3._20_4_;
          uStack_2e68._0_4_ = auVar3._24_4_;
          local_3080 = (float)local_2e80 * 1.442695;
          fStack_307c = local_2e80._4_4_ * 1.442695;
          fStack_3078 = (float)uStack_2e78 * 1.442695;
          fStack_3074 = uStack_2e78._4_4_ * 1.442695;
          fStack_3070 = (float)uStack_2e70 * 1.442695;
          fStack_306c = uStack_2e70._4_4_ * 1.442695;
          fStack_3068 = (float)uStack_2e68 * 1.442695;
          uStack_3064 = 0x3fb8aa3b;
          local_30a0 = 0x3f0000003f000000;
          uStack_3098 = 0x3f0000003f000000;
          uStack_3090 = 0x3f0000003f000000;
          uStack_3088 = 0x3f0000003f000000;
          local_33a0._4_4_ = fStack_307c + 0.5;
          local_33a0._0_4_ = local_3080 + 0.5;
          uStack_3398._0_4_ = fStack_3078 + 0.5;
          uStack_3398._4_4_ = fStack_3074 + 0.5;
          uStack_3390._0_4_ = fStack_3070 + 0.5;
          uStack_3390._4_4_ = fStack_306c + 0.5;
          uStack_3388._0_4_ = fStack_3068 + 0.5;
          uStack_3388._4_4_ = 0x3ff8aa3b;
          auVar5 = vroundps_avx(_local_33a0,1);
          auVar4 = vcmpps_avx(_local_33a0,auVar5,1);
          local_3400._0_8_ = auVar4._0_8_;
          local_3400._8_8_ = auVar4._8_8_;
          local_3400._16_8_ = auVar4._16_8_;
          local_3400._24_8_ = auVar4._24_8_;
          local_2b60 = local_3400._0_8_;
          uStack_2b58 = local_3400._8_8_;
          uStack_2b50 = local_3400._16_8_;
          uStack_2b48 = local_3400._24_8_;
          local_2b80 = 0x3f8000003f800000;
          uStack_2b78 = 0x3f8000003f800000;
          uStack_2b70 = 0x3f8000003f800000;
          uStack_2b68 = 0x3f8000003f800000;
          auVar23._8_8_ = 0x3f8000003f800000;
          auVar23._0_8_ = 0x3f8000003f800000;
          auVar23._16_8_ = 0x3f8000003f800000;
          auVar23._24_8_ = 0x3f8000003f800000;
          local_3400 = vandps_avx(auVar4,auVar23);
          local_3380 = auVar5._0_8_;
          uStack_3378 = auVar5._8_8_;
          uStack_3370 = auVar5._16_8_;
          uStack_3368 = auVar5._24_8_;
          local_2c40 = local_3380;
          uStack_2c38 = uStack_3378;
          uStack_2c30 = uStack_3370;
          uStack_2c28 = uStack_3368;
          local_2c60 = local_3400._0_8_;
          uStack_2c58 = local_3400._8_8_;
          uStack_2c50 = local_3400._16_8_;
          uStack_2c48 = local_3400._24_8_;
          _local_33a0 = vsubps_avx(auVar5,local_3400);
          local_29e0 = local_33a0;
          uStack_29d8 = uStack_3398;
          uStack_29d0 = uStack_3390;
          uStack_29c8 = uStack_3388;
          local_2a00 = 0x3f3180003f318000;
          uStack_29f8 = 0x3f3180003f318000;
          uStack_29f0 = 0x3f3180003f318000;
          uStack_29e8 = 0x3f3180003f318000;
          local_2a20 = local_3360._0_8_;
          uStack_2a18 = local_3360._8_8_;
          uStack_2a10 = local_3360._16_8_;
          uStack_2a08 = local_3360._24_8_;
          local_29a0 = local_33a0;
          uVar75 = local_29a0;
          uStack_2998 = uStack_3398;
          uVar76 = uStack_2998;
          uStack_2990 = uStack_3390;
          uVar77 = uStack_2990;
          uStack_2988 = uStack_3388;
          uVar78 = uStack_2988;
          local_29c0 = 0x3f3180003f318000;
          uStack_29b8 = 0x3f3180003f318000;
          uStack_29b0 = 0x3f3180003f318000;
          uStack_29a8 = 0x3f3180003f318000;
          local_29a0._0_4_ = local_33a0._0_4_;
          local_29a0._4_4_ = local_33a0._4_4_;
          uStack_2998._0_4_ = local_33a0._8_4_;
          uStack_2998._4_4_ = local_33a0._12_4_;
          uStack_2990._0_4_ = local_33a0._16_4_;
          uStack_2990._4_4_ = local_33a0._20_4_;
          uStack_2988._0_4_ = local_33a0._24_4_;
          uStack_2988._4_4_ = local_33a0._28_4_;
          local_2980 = (float)local_29a0 * 0.6933594;
          fStack_297c = local_29a0._4_4_ * 0.6933594;
          fStack_2978 = (float)uStack_2998 * 0.6933594;
          fStack_2974 = uStack_2998._4_4_ * 0.6933594;
          fStack_2970 = (float)uStack_2990 * 0.6933594;
          fStack_296c = uStack_2990._4_4_ * 0.6933594;
          fStack_2968 = (float)uStack_2988 * 0.6933594;
          local_2960 = local_3360._0_8_;
          uStack_2958 = local_3360._8_8_;
          uStack_2950 = local_3360._16_8_;
          uStack_2948 = local_3360._24_8_;
          fStack_2964 = uStack_2988._4_4_;
          auVar26._4_4_ = fStack_297c;
          auVar26._0_4_ = local_2980;
          auVar26._8_4_ = fStack_2978;
          auVar26._12_4_ = fStack_2974;
          auVar26._16_4_ = fStack_2970;
          auVar26._20_4_ = fStack_296c;
          auVar26._24_4_ = fStack_2968;
          auVar26._28_4_ = uStack_2988._4_4_;
          auVar4 = vsubps_avx(auVar3,auVar26);
          local_3360._0_8_ = auVar4._0_8_;
          local_3360._8_8_ = auVar4._8_8_;
          local_3360._16_8_ = auVar4._16_8_;
          local_3360._24_8_ = auVar4._24_8_;
          local_2ac0 = local_33a0;
          uStack_2ab8 = uStack_3398;
          uStack_2ab0 = uStack_3390;
          uStack_2aa8 = uStack_3388;
          local_2ae0 = 0xb95e8083b95e8083;
          uStack_2ad8 = 0xb95e8083b95e8083;
          uStack_2ad0 = 0xb95e8083b95e8083;
          uStack_2ac8 = 0xb95e8083b95e8083;
          local_2b00 = local_3360._0_8_;
          uStack_2af8 = local_3360._8_8_;
          uStack_2af0 = local_3360._16_8_;
          uStack_2ae8 = local_3360._24_8_;
          local_2a80 = local_33a0;
          uStack_2a78 = uStack_3398;
          uStack_2a70 = uStack_3390;
          uStack_2a68 = uStack_3388;
          local_2aa0 = 0xb95e8083b95e8083;
          uStack_2a98 = 0xb95e8083b95e8083;
          uStack_2a90 = 0xb95e8083b95e8083;
          uStack_2a88 = 0xb95e8083b95e8083;
          local_2a60 = (float)local_29a0 * -0.00021219444;
          fStack_2a5c = local_29a0._4_4_ * -0.00021219444;
          fStack_2a58 = (float)uStack_2998 * -0.00021219444;
          fStack_2a54 = uStack_2998._4_4_ * -0.00021219444;
          fStack_2a50 = (float)uStack_2990 * -0.00021219444;
          fStack_2a4c = uStack_2990._4_4_ * -0.00021219444;
          fStack_2a48 = (float)uStack_2988 * -0.00021219444;
          local_2a40 = local_3360._0_8_;
          uStack_2a38 = local_3360._8_8_;
          uStack_2a30 = local_3360._16_8_;
          uStack_2a28 = local_3360._24_8_;
          fStack_2a44 = uStack_2988._4_4_;
          auVar25._4_4_ = fStack_2a5c;
          auVar25._0_4_ = local_2a60;
          auVar25._8_4_ = fStack_2a58;
          auVar25._12_4_ = fStack_2a54;
          auVar25._16_4_ = fStack_2a50;
          auVar25._20_4_ = fStack_2a4c;
          auVar25._24_4_ = fStack_2a48;
          auVar25._28_4_ = uStack_2988._4_4_;
          local_3360 = vsubps_avx(auVar4,auVar25);
          local_2c80 = local_3360._0_8_;
          uVar71 = local_2c80;
          uStack_2c78 = local_3360._8_8_;
          uVar72 = uStack_2c78;
          uStack_2c70 = local_3360._16_8_;
          uVar73 = uStack_2c70;
          uStack_2c68 = local_3360._24_8_;
          uVar74 = uStack_2c68;
          local_2ca0 = local_3360._0_8_;
          uStack_2c98 = local_3360._8_8_;
          uStack_2c90 = local_3360._16_8_;
          uStack_2c88 = local_3360._24_8_;
          local_2c80._0_4_ = local_3360._0_4_;
          local_2c80._4_4_ = local_3360._4_4_;
          uStack_2c78._0_4_ = local_3360._8_4_;
          uStack_2c78._4_4_ = local_3360._12_4_;
          uStack_2c70._0_4_ = local_3360._16_4_;
          uStack_2c70._4_4_ = local_3360._20_4_;
          uStack_2c68._0_4_ = local_3360._24_4_;
          uStack_2c68._4_4_ = local_3360._28_4_;
          local_3380 = CONCAT44(local_2c80._4_4_ * local_2c80._4_4_,
                                (float)local_2c80 * (float)local_2c80);
          uStack_3378._0_4_ = (float)uStack_2c78 * (float)uStack_2c78;
          uStack_3378._4_4_ = uStack_2c78._4_4_ * uStack_2c78._4_4_;
          uStack_3370._0_4_ = (float)uStack_2c70 * (float)uStack_2c70;
          uStack_3370._4_4_ = uStack_2c70._4_4_ * uStack_2c70._4_4_;
          auVar70 = _local_3380;
          uStack_3368._0_4_ = (float)uStack_2c68 * (float)uStack_2c68;
          uStack_3368._4_4_ = uStack_2c68._4_4_;
          auVar4 = _local_3380;
          local_3120 = 0x3950696739506967;
          uStack_3118 = 0x3950696739506967;
          uStack_3110 = 0x3950696739506967;
          uStack_3108 = 0x3950696739506967;
          local_3140 = local_3360._0_8_;
          uStack_3138 = local_3360._8_8_;
          uStack_3130 = local_3360._16_8_;
          uStack_3128 = local_3360._24_8_;
          local_3160 = 0x3ab743ce3ab743ce;
          uStack_3158 = 0x3ab743ce3ab743ce;
          uStack_3150 = 0x3ab743ce3ab743ce;
          uStack_3148 = 0x3ab743ce3ab743ce;
          local_2e40 = 0x3950696739506967;
          uStack_2e38 = 0x3950696739506967;
          uStack_2e30 = 0x3950696739506967;
          uStack_2e28 = 0x3950696739506967;
          local_2e60 = local_3360._0_8_;
          uStack_2e58 = local_3360._8_8_;
          uStack_2e50 = local_3360._16_8_;
          uStack_2e48 = local_3360._24_8_;
          local_3040 = (float)local_2c80 * 0.00019875691;
          fStack_303c = local_2c80._4_4_ * 0.00019875691;
          fStack_3038 = (float)uStack_2c78 * 0.00019875691;
          fStack_3034 = uStack_2c78._4_4_ * 0.00019875691;
          fStack_3030 = (float)uStack_2c70 * 0.00019875691;
          fStack_302c = uStack_2c70._4_4_ * 0.00019875691;
          fStack_3028 = (float)uStack_2c68 * 0.00019875691;
          fStack_3024 = uStack_2c68._4_4_;
          local_3060 = 0x3ab743ce3ab743ce;
          uStack_3058 = 0x3ab743ce3ab743ce;
          uStack_3050 = 0x3ab743ce3ab743ce;
          uStack_3048 = 0x3ab743ce3ab743ce;
          local_3420 = CONCAT44(fStack_303c + 0.0013981999,local_3040 + 0.0013981999);
          uStack_3418 = CONCAT44(fStack_3034 + 0.0013981999,fStack_3038 + 0.0013981999);
          uStack_3410 = CONCAT44(fStack_302c + 0.0013981999,fStack_3030 + 0.0013981999);
          uStack_3408 = CONCAT44(uStack_2c68._4_4_ + 0.0013981999,fStack_3028 + 0.0013981999);
          local_3180 = local_3420;
          uStack_3178 = uStack_3418;
          uStack_3170 = uStack_3410;
          uStack_3168 = uStack_3408;
          local_31a0 = local_3360._0_8_;
          uStack_3198 = local_3360._8_8_;
          uStack_3190 = local_3360._16_8_;
          uStack_3188 = local_3360._24_8_;
          local_31c0 = 0x3c0889083c088908;
          uStack_31b8 = 0x3c0889083c088908;
          uStack_31b0 = 0x3c0889083c088908;
          uStack_31a8 = 0x3c0889083c088908;
          local_2e00 = local_3420;
          uStack_2df8 = uStack_3418;
          uStack_2df0 = uStack_3410;
          uStack_2de8 = uStack_3408;
          local_2e20 = local_3360._0_8_;
          uStack_2e18 = local_3360._8_8_;
          uStack_2e10 = local_3360._16_8_;
          uStack_2e08 = local_3360._24_8_;
          local_3000 = (local_3040 + 0.0013981999) * (float)local_2c80;
          fStack_2ffc = (fStack_303c + 0.0013981999) * local_2c80._4_4_;
          fStack_2ff8 = (fStack_3038 + 0.0013981999) * (float)uStack_2c78;
          fStack_2ff4 = (fStack_3034 + 0.0013981999) * uStack_2c78._4_4_;
          fStack_2ff0 = (fStack_3030 + 0.0013981999) * (float)uStack_2c70;
          fStack_2fec = (fStack_302c + 0.0013981999) * uStack_2c70._4_4_;
          fStack_2fe8 = (fStack_3028 + 0.0013981999) * (float)uStack_2c68;
          fStack_2fe4 = uStack_2c68._4_4_;
          local_3020 = 0x3c0889083c088908;
          uStack_3018 = 0x3c0889083c088908;
          uStack_3010 = 0x3c0889083c088908;
          uStack_3008 = 0x3c0889083c088908;
          local_3420 = CONCAT44(fStack_2ffc + 0.008333452,local_3000 + 0.008333452);
          uStack_3418 = CONCAT44(fStack_2ff4 + 0.008333452,fStack_2ff8 + 0.008333452);
          uStack_3410 = CONCAT44(fStack_2fec + 0.008333452,fStack_2ff0 + 0.008333452);
          uStack_3408 = CONCAT44(uStack_2c68._4_4_ + 0.008333452,fStack_2fe8 + 0.008333452);
          local_31e0 = local_3420;
          uStack_31d8 = uStack_3418;
          uStack_31d0 = uStack_3410;
          uStack_31c8 = uStack_3408;
          local_3200 = local_3360._0_8_;
          uStack_31f8 = local_3360._8_8_;
          uStack_31f0 = local_3360._16_8_;
          uStack_31e8 = local_3360._24_8_;
          local_3220 = 0x3d2aa9c13d2aa9c1;
          uStack_3218 = 0x3d2aa9c13d2aa9c1;
          uStack_3210 = 0x3d2aa9c13d2aa9c1;
          uStack_3208 = 0x3d2aa9c13d2aa9c1;
          local_2dc0 = local_3420;
          uStack_2db8 = uStack_3418;
          uStack_2db0 = uStack_3410;
          uStack_2da8 = uStack_3408;
          local_2de0 = local_3360._0_8_;
          uStack_2dd8 = local_3360._8_8_;
          uStack_2dd0 = local_3360._16_8_;
          uStack_2dc8 = local_3360._24_8_;
          local_2fc0 = (local_3000 + 0.008333452) * (float)local_2c80;
          fStack_2fbc = (fStack_2ffc + 0.008333452) * local_2c80._4_4_;
          fStack_2fb8 = (fStack_2ff8 + 0.008333452) * (float)uStack_2c78;
          fStack_2fb4 = (fStack_2ff4 + 0.008333452) * uStack_2c78._4_4_;
          fStack_2fb0 = (fStack_2ff0 + 0.008333452) * (float)uStack_2c70;
          fStack_2fac = (fStack_2fec + 0.008333452) * uStack_2c70._4_4_;
          fStack_2fa8 = (fStack_2fe8 + 0.008333452) * (float)uStack_2c68;
          fStack_2fa4 = uStack_2c68._4_4_;
          local_2fe0 = 0x3d2aa9c13d2aa9c1;
          uStack_2fd8 = 0x3d2aa9c13d2aa9c1;
          uStack_2fd0 = 0x3d2aa9c13d2aa9c1;
          uStack_2fc8 = 0x3d2aa9c13d2aa9c1;
          local_3420 = CONCAT44(fStack_2fbc + 0.041665796,local_2fc0 + 0.041665796);
          uStack_3418 = CONCAT44(fStack_2fb4 + 0.041665796,fStack_2fb8 + 0.041665796);
          uStack_3410 = CONCAT44(fStack_2fac + 0.041665796,fStack_2fb0 + 0.041665796);
          uStack_3408 = CONCAT44(uStack_2c68._4_4_ + 0.041665796,fStack_2fa8 + 0.041665796);
          local_3240 = local_3420;
          uStack_3238 = uStack_3418;
          uStack_3230 = uStack_3410;
          uStack_3228 = uStack_3408;
          local_3260 = local_3360._0_8_;
          uStack_3258 = local_3360._8_8_;
          uStack_3250 = local_3360._16_8_;
          uStack_3248 = local_3360._24_8_;
          local_3280 = 0x3e2aaaaa3e2aaaaa;
          uStack_3278 = 0x3e2aaaaa3e2aaaaa;
          uStack_3270 = 0x3e2aaaaa3e2aaaaa;
          uStack_3268 = 0x3e2aaaaa3e2aaaaa;
          local_2d80 = local_3420;
          uStack_2d78 = uStack_3418;
          uStack_2d70 = uStack_3410;
          uStack_2d68 = uStack_3408;
          local_2da0 = local_3360._0_8_;
          uStack_2d98 = local_3360._8_8_;
          uStack_2d90 = local_3360._16_8_;
          uStack_2d88 = local_3360._24_8_;
          local_2f80 = (local_2fc0 + 0.041665796) * (float)local_2c80;
          fStack_2f7c = (fStack_2fbc + 0.041665796) * local_2c80._4_4_;
          fStack_2f78 = (fStack_2fb8 + 0.041665796) * (float)uStack_2c78;
          fStack_2f74 = (fStack_2fb4 + 0.041665796) * uStack_2c78._4_4_;
          fStack_2f70 = (fStack_2fb0 + 0.041665796) * (float)uStack_2c70;
          fStack_2f6c = (fStack_2fac + 0.041665796) * uStack_2c70._4_4_;
          fStack_2f68 = (fStack_2fa8 + 0.041665796) * (float)uStack_2c68;
          fStack_2f64 = uStack_2c68._4_4_;
          local_2fa0 = 0x3e2aaaaa3e2aaaaa;
          uStack_2f98 = 0x3e2aaaaa3e2aaaaa;
          uStack_2f90 = 0x3e2aaaaa3e2aaaaa;
          uStack_2f88 = 0x3e2aaaaa3e2aaaaa;
          local_3420 = CONCAT44(fStack_2f7c + 0.16666666,local_2f80 + 0.16666666);
          uStack_3418 = CONCAT44(fStack_2f74 + 0.16666666,fStack_2f78 + 0.16666666);
          uStack_3410 = CONCAT44(fStack_2f6c + 0.16666666,fStack_2f70 + 0.16666666);
          uStack_3408 = CONCAT44(uStack_2c68._4_4_ + 0.16666666,fStack_2f68 + 0.16666666);
          local_32a0 = local_3420;
          uStack_3298 = uStack_3418;
          uStack_3290 = uStack_3410;
          uStack_3288 = uStack_3408;
          local_32c0 = local_3360._0_8_;
          uStack_32b8 = local_3360._8_8_;
          uStack_32b0 = local_3360._16_8_;
          uStack_32a8 = local_3360._24_8_;
          local_32e0 = 0x3f0000003f000000;
          uStack_32d8 = 0x3f0000003f000000;
          uStack_32d0 = 0x3f0000003f000000;
          uStack_32c8 = 0x3f0000003f000000;
          local_2d40 = local_3420;
          uStack_2d38 = uStack_3418;
          uStack_2d30 = uStack_3410;
          uStack_2d28 = uStack_3408;
          local_2d60 = local_3360._0_8_;
          uStack_2d58 = local_3360._8_8_;
          uStack_2d50 = local_3360._16_8_;
          uStack_2d48 = local_3360._24_8_;
          local_2f40 = (local_2f80 + 0.16666666) * (float)local_2c80;
          fStack_2f3c = (fStack_2f7c + 0.16666666) * local_2c80._4_4_;
          fStack_2f38 = (fStack_2f78 + 0.16666666) * (float)uStack_2c78;
          fStack_2f34 = (fStack_2f74 + 0.16666666) * uStack_2c78._4_4_;
          fStack_2f30 = (fStack_2f70 + 0.16666666) * (float)uStack_2c70;
          fStack_2f2c = (fStack_2f6c + 0.16666666) * uStack_2c70._4_4_;
          fStack_2f28 = (fStack_2f68 + 0.16666666) * (float)uStack_2c68;
          fStack_2f24 = uStack_2c68._4_4_;
          local_2f60 = 0x3f0000003f000000;
          uStack_2f58 = 0x3f0000003f000000;
          uStack_2f50 = 0x3f0000003f000000;
          uStack_2f48 = 0x3f0000003f000000;
          local_3420 = CONCAT44(fStack_2f3c + 0.5,local_2f40 + 0.5);
          uStack_3418 = CONCAT44(fStack_2f34 + 0.5,fStack_2f38 + 0.5);
          uStack_3410 = CONCAT44(fStack_2f2c + 0.5,fStack_2f30 + 0.5);
          uStack_3408 = CONCAT44(uStack_2c68._4_4_ + 0.5,fStack_2f28 + 0.5);
          uStack_3370 = auVar70._16_8_;
          uStack_3368 = auVar4._24_8_;
          local_3300 = local_3420;
          uStack_32f8 = uStack_3418;
          uStack_32f0 = uStack_3410;
          uStack_32e8 = uStack_3408;
          local_3320 = local_3380;
          uStack_3318 = uStack_3378;
          uStack_3310 = uStack_3370;
          uStack_3308 = uStack_3368;
          local_3340 = local_3360._0_8_;
          uStack_3338 = local_3360._8_8_;
          uStack_3330 = local_3360._16_8_;
          uStack_3328 = local_3360._24_8_;
          local_2d00 = local_3420;
          uStack_2cf8 = uStack_3418;
          uStack_2cf0 = uStack_3410;
          uStack_2ce8 = uStack_3408;
          local_2d20 = local_3380;
          uStack_2d18 = uStack_3378;
          uStack_2d10 = uStack_3370;
          uStack_2d08 = uStack_3368;
          local_2f00 = (local_2f40 + 0.5) * (float)local_2c80 * (float)local_2c80;
          fStack_2efc = (fStack_2f3c + 0.5) * local_2c80._4_4_ * local_2c80._4_4_;
          fStack_2ef8 = (fStack_2f38 + 0.5) * (float)uStack_2c78 * (float)uStack_2c78;
          fStack_2ef4 = (fStack_2f34 + 0.5) * uStack_2c78._4_4_ * uStack_2c78._4_4_;
          fStack_2ef0 = (fStack_2f30 + 0.5) * (float)uStack_2c70 * (float)uStack_2c70;
          fStack_2eec = (fStack_2f2c + 0.5) * uStack_2c70._4_4_ * uStack_2c70._4_4_;
          fStack_2ee8 = (fStack_2f28 + 0.5) * (float)uStack_2c68 * (float)uStack_2c68;
          fStack_2ee4 = uStack_2c68._4_4_;
          local_2f20 = local_3360._0_8_;
          uStack_2f18 = local_3360._8_8_;
          uStack_2f10 = local_3360._16_8_;
          uStack_2f08 = local_3360._24_8_;
          local_3420 = CONCAT44(fStack_2efc + local_2c80._4_4_,local_2f00 + (float)local_2c80);
          uStack_3418 = CONCAT44(fStack_2ef4 + uStack_2c78._4_4_,fStack_2ef8 + (float)uStack_2c78);
          uStack_3410 = CONCAT44(fStack_2eec + uStack_2c70._4_4_,fStack_2ef0 + (float)uStack_2c70);
          uStack_3408 = CONCAT44(uStack_2c68._4_4_ + uStack_2c68._4_4_,
                                 fStack_2ee8 + (float)uStack_2c68);
          local_2ec0 = local_3420;
          uStack_2eb8 = uStack_3418;
          uStack_2eb0 = uStack_3410;
          uStack_2ea8 = uStack_3408;
          local_2ee0 = 0x3f8000003f800000;
          uStack_2ed8 = 0x3f8000003f800000;
          uStack_2ed0 = 0x3f8000003f800000;
          uStack_2ec8 = 0x3f8000003f800000;
          local_3d40 = local_2f00 + (float)local_2c80 + 1.0;
          fStack_3d3c = fStack_2efc + local_2c80._4_4_ + 1.0;
          fStack_3d38 = fStack_2ef8 + (float)uStack_2c78 + 1.0;
          fStack_3d34 = fStack_2ef4 + uStack_2c78._4_4_ + 1.0;
          fStack_3d30 = fStack_2ef0 + (float)uStack_2c70 + 1.0;
          fStack_3d2c = fStack_2eec + uStack_2c70._4_4_ + 1.0;
          fStack_3d28 = fStack_2ee8 + (float)uStack_2c68 + 1.0;
          fStack_3d24 = uStack_2c68._4_4_ + uStack_2c68._4_4_ + 1.0;
          local_3420 = CONCAT44(fStack_3d3c,local_3d40);
          uStack_3418 = CONCAT44(fStack_3d34,fStack_3d38);
          uStack_3410 = CONCAT44(fStack_3d2c,fStack_3d30);
          uStack_3408 = CONCAT44(fStack_3d24,fStack_3d28);
          local_2780 = local_33a0;
          uStack_2778 = uStack_3398;
          uStack_2770 = uStack_3390;
          uStack_2768 = uStack_3388;
          local_33c0 = CONCAT44((int)local_29a0._4_4_,(int)(float)local_29a0);
          uStack_33b8 = CONCAT44((int)uStack_2998._4_4_,(int)(float)uStack_2998);
          uStack_33b0 = CONCAT44((int)uStack_2990._4_4_,(int)(float)uStack_2990);
          uStack_33a8 = CONCAT44((int)uStack_2988._4_4_,(int)(float)uStack_2988);
          local_2660 = local_33c0;
          uStack_2658 = uStack_33b8;
          uStack_2650 = uStack_33b0;
          uStack_2648 = uStack_33a8;
          local_2680 = 0x7f0000007f;
          uStack_2678 = 0x7f0000007f;
          uStack_2670 = 0x7f0000007f;
          uStack_2668 = 0x7f0000007f;
          local_2700 = local_33c0;
          uStack_26f8 = uStack_33b8;
          uStack_26f0 = uStack_33b0;
          uStack_26e8 = uStack_33a8;
          local_2720 = 0x7f0000007f;
          uStack_2718 = 0x7f0000007f;
          uStack_2710 = 0x7f0000007f;
          uStack_2708 = 0x7f0000007f;
          local_26b0 = 0x7f0000007f;
          uStack_26a8 = 0x7f0000007f;
          local_26c0 = 0x7f0000007f;
          uStack_26b8 = 0x7f0000007f;
          local_2310 = local_33c0;
          uStack_2308 = uStack_33b8;
          local_2320 = 0x7f0000007f;
          uStack_2318 = 0x7f0000007f;
          auVar34._8_8_ = uStack_33b8;
          auVar34._0_8_ = local_33c0;
          auVar33._8_8_ = 0x7f0000007f;
          auVar33._0_8_ = 0x7f0000007f;
          local_2690 = vpaddd_avx(auVar34,auVar33);
          local_2330 = uStack_33b0;
          uStack_2328 = uStack_33a8;
          local_2340 = 0x7f0000007f;
          uStack_2338 = 0x7f0000007f;
          auVar32._8_8_ = uStack_33a8;
          auVar32._0_8_ = uStack_33b0;
          auVar31._8_8_ = 0x7f0000007f;
          auVar31._0_8_ = 0x7f0000007f;
          local_26a0 = vpaddd_avx(auVar32,auVar31);
          local_2740 = local_2690._0_8_;
          uStack_2738 = local_2690._8_8_;
          uStack_2730 = local_26a0._0_8_;
          uStack_2728 = local_26a0._8_8_;
          local_26e0 = local_2690._0_8_;
          uStack_26d8 = local_2690._8_8_;
          uStack_26d0 = local_26a0._0_8_;
          uStack_26c8 = local_26a0._8_8_;
          local_24a0 = local_2690._0_8_;
          uStack_2498 = local_2690._8_8_;
          uStack_2490 = local_26a0._0_8_;
          uStack_2488 = local_26a0._8_8_;
          local_24a4 = 0x17;
          local_2520 = local_2690._0_8_;
          uStack_2518 = local_2690._8_8_;
          uStack_2510 = local_26a0._0_8_;
          uStack_2508 = local_26a0._8_8_;
          local_2290 = local_2690._0_8_;
          uStack_2288 = local_2690._8_8_;
          local_2294 = 0x17;
          local_24c0 = vpslld_avx(local_2690,ZEXT416(0x17));
          local_22b0 = local_26a0._0_8_;
          uStack_22a8 = local_26a0._8_8_;
          local_22b4 = 0x17;
          local_24d0 = vpslld_avx(local_26a0,ZEXT416(0x17));
          local_2540 = local_24c0._0_8_;
          uStack_2538 = local_24c0._8_8_;
          uStack_2530 = local_24d0._0_8_;
          uStack_2528 = local_24d0._8_8_;
          local_2500 = local_24c0._0_8_;
          uStack_24f8 = local_24c0._8_8_;
          uStack_24f0 = local_24d0._0_8_;
          uStack_24e8 = local_24d0._8_8_;
          local_33c0 = local_24c0._0_8_;
          uStack_33b8 = local_24c0._8_8_;
          uStack_33b0 = local_24d0._0_8_;
          uStack_33a8 = local_24d0._8_8_;
          local_23c0 = local_24c0._0_8_;
          uStack_23b8 = local_24c0._8_8_;
          uStack_23b0 = local_24d0._0_8_;
          uStack_23a8 = local_24d0._8_8_;
          local_3440 = local_24c0._0_8_;
          uStack_3438 = local_24c0._8_8_;
          uStack_3430 = local_24d0._0_8_;
          uStack_3428 = local_24d0._8_8_;
          local_2cc0 = local_3420;
          uStack_2cb8 = uStack_3418;
          uStack_2cb0 = uStack_3410;
          uStack_2ca8 = uStack_3408;
          local_2ce0 = local_24c0._0_8_;
          uVar66 = local_2ce0;
          uStack_2cd8 = local_24c0._8_8_;
          uVar67 = uStack_2cd8;
          uStack_2cd0 = local_24d0._0_8_;
          uVar68 = uStack_2cd0;
          uStack_2cc8 = local_24d0._8_8_;
          uVar69 = uStack_2cc8;
          local_2ce0._0_4_ = local_24c0._0_4_;
          local_2ce0._4_4_ = local_24c0._4_4_;
          uStack_2cd8._0_4_ = local_24c0._8_4_;
          uStack_2cd8._4_4_ = local_24c0._12_4_;
          uStack_2cd0._0_4_ = local_24d0._0_4_;
          uStack_2cd0._4_4_ = local_24d0._4_4_;
          uStack_2cc8._0_4_ = local_24d0._8_4_;
          local_3d40 = local_3d40 * (float)local_2ce0;
          fStack_3d3c = fStack_3d3c * local_2ce0._4_4_;
          fStack_3d38 = fStack_3d38 * (float)uStack_2cd8;
          fStack_3d34 = fStack_3d34 * uStack_2cd8._4_4_;
          fStack_3d30 = fStack_3d30 * (float)uStack_2cd0;
          fStack_3d2c = fStack_3d2c * uStack_2cd0._4_4_;
          fStack_3d28 = fStack_3d28 * (float)uStack_2cc8;
          local_3420 = CONCAT44(fStack_3d3c,local_3d40);
          uStack_3418 = CONCAT44(fStack_3d34,fStack_3d38);
          uStack_3410 = CONCAT44(fStack_3d2c,fStack_3d30);
          uStack_3408 = CONCAT44(fStack_3d24,fStack_3d28);
          local_41c0 = local_4140._0_8_;
          uVar62 = local_41c0;
          uStack_41b8 = local_4140._8_8_;
          uVar63 = uStack_41b8;
          uStack_41b0 = auStack_4130._0_8_;
          uVar64 = uStack_41b0;
          uStack_41a8 = auStack_4130._8_8_;
          uVar65 = uStack_41a8;
          local_41e0 = local_3420;
          uStack_41d8 = uStack_3418;
          uStack_41d0 = uStack_3410;
          uStack_41c8 = uStack_3408;
          local_41c0._0_4_ = local_4140._0_4_;
          local_41c0._4_4_ = local_4140._4_4_;
          uStack_41b8._0_4_ = local_4140._8_4_;
          uStack_41b8._4_4_ = local_4140._12_4_;
          uStack_41b0._0_4_ = auStack_4130._0_4_;
          uStack_41b0._4_4_ = auStack_4130._4_4_;
          uStack_41a8._0_4_ = auStack_4130._8_4_;
          uStack_41a8._4_4_ = auStack_4130._12_4_;
          local_3d40 = (float)local_41c0 + local_3d40;
          fStack_3d3c = local_41c0._4_4_ + fStack_3d3c;
          fStack_3d38 = (float)uStack_41b8 + fStack_3d38;
          fStack_3d34 = uStack_41b8._4_4_ + fStack_3d34;
          fStack_3d30 = (float)uStack_41b0 + fStack_3d30;
          fStack_3d2c = uStack_41b0._4_4_ + fStack_3d2c;
          fStack_3d28 = (float)uStack_41a8 + fStack_3d28;
          fStack_3d24 = uStack_41a8._4_4_ + fStack_3d24;
          local_3d20 = local_4140._0_8_;
          uStack_3d18 = local_4140._8_8_;
          uStack_3d10 = auStack_4130._0_8_;
          uStack_3d08 = auStack_4130._8_8_;
          auVar18._16_8_ = auStack_4130._0_8_;
          auVar18._0_16_ = local_4140;
          auVar18._24_8_ = auStack_4130._8_8_;
          auVar17._4_4_ = fStack_3d3c;
          auVar17._0_4_ = local_3d40;
          auVar17._8_4_ = fStack_3d38;
          auVar17._12_4_ = fStack_3d34;
          auVar17._16_4_ = fStack_3d30;
          auVar17._20_4_ = fStack_3d2c;
          auVar17._24_4_ = fStack_3d28;
          auVar17._28_4_ = fStack_3d24;
          local_46a0 = vdivps_avx(auVar18,auVar17);
          local_41c0 = uVar62;
          uStack_41b8 = uVar63;
          uStack_41b0 = uVar64;
          uStack_41a8 = uVar65;
          local_4100 = local_2c20;
          _local_3380 = auVar4;
          local_2e80 = uVar6;
          uStack_2e78 = uVar7;
          uStack_2e70 = uVar8;
          uStack_2e68 = uVar9;
          local_2ce0 = uVar66;
          uStack_2cd8 = uVar67;
          uStack_2cd0 = uVar68;
          uStack_2cc8 = uVar69;
          local_2c80 = uVar71;
          uStack_2c78 = uVar72;
          uStack_2c70 = uVar73;
          uStack_2c68 = uVar74;
          local_29a0 = uVar75;
          uStack_2998 = uVar76;
          uStack_2990 = uVar77;
          uStack_2988 = uVar78;
          break;
        case 5:
          local_40e0 = local_53c0;
          uStack_40d8 = uStack_53b8;
          uStack_40d0 = uStack_53b0;
          uStack_40c8 = paStack_53a8;
          local_3c20._8_8_ = uStack_53b8;
          local_3c20._0_8_ = local_53c0;
          local_34e0 = ZEXT832(0) << 0x20;
          local_3ca0 = 0x3f8000003f800000;
          uStack_3c98 = 0x3f8000003f800000;
          uStack_3c90 = 0x3f8000003f800000;
          uStack_3c88 = 0x3f8000003f800000;
          local_3460 = local_53c0;
          uStack_3458 = uStack_53b8;
          uStack_3450 = uStack_53b0;
          uStack_3448 = paStack_53a8;
          local_3480 = 0x42b0c0a542b0c0a5;
          uStack_3478 = 0x42b0c0a542b0c0a5;
          uStack_3470 = 0x42b0c0a542b0c0a5;
          uStack_3468 = 0x42b0c0a542b0c0a5;
          auVar20._16_8_ = uStack_53b0;
          auVar20._0_16_ = local_3c20._0_16_;
          auVar20._24_8_ = paStack_53a8;
          auVar19._8_8_ = 0x42b0c0a542b0c0a5;
          auVar19._0_8_ = 0x42b0c0a542b0c0a5;
          auVar19._16_8_ = 0x42b0c0a542b0c0a5;
          auVar19._24_8_ = 0x42b0c0a542b0c0a5;
          auVar4 = vminps_avx(auVar20,auVar19);
          local_3c20._0_8_ = auVar4._0_8_;
          local_3c20._8_8_ = auVar4._8_8_;
          local_3c20._16_8_ = auVar4._16_8_;
          local_3c20._24_8_ = auVar4._24_8_;
          local_34a0 = local_3c20._0_8_;
          uStack_3498 = local_3c20._8_8_;
          uStack_3490 = local_3c20._16_8_;
          uStack_3488 = local_3c20._24_8_;
          local_34c0 = 0xc2b0c0a5c2b0c0a5;
          uStack_34b8 = 0xc2b0c0a5c2b0c0a5;
          uStack_34b0 = 0xc2b0c0a5c2b0c0a5;
          uStack_34a8 = 0xc2b0c0a5c2b0c0a5;
          auVar5._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar5._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar5._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar5._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar3 = vmaxps_avx(auVar4,auVar5);
          local_3c20._0_8_ = auVar3._0_8_;
          local_3c20._8_8_ = auVar3._8_8_;
          local_3c20._16_8_ = auVar3._16_8_;
          local_3c20._24_8_ = auVar3._24_8_;
          local_3980 = local_3c20._0_8_;
          uStack_3978 = local_3c20._8_8_;
          uStack_3970 = local_3c20._16_8_;
          uStack_3968 = local_3c20._24_8_;
          local_39a0 = 0x3fb8aa3b3fb8aa3b;
          uStack_3998 = 0x3fb8aa3b3fb8aa3b;
          uStack_3990 = 0x3fb8aa3b3fb8aa3b;
          uStack_3988 = 0x3fb8aa3b3fb8aa3b;
          local_39c0 = 0x3f0000003f000000;
          uStack_39b8 = 0x3f0000003f000000;
          uStack_39b0 = 0x3f0000003f000000;
          uStack_39a8 = 0x3f0000003f000000;
          local_3740 = local_3c20._0_8_;
          uVar67 = local_3740;
          uStack_3738 = local_3c20._8_8_;
          uVar68 = uStack_3738;
          uStack_3730 = local_3c20._16_8_;
          uVar69 = uStack_3730;
          uStack_3728 = local_3c20._24_8_;
          uVar71 = uStack_3728;
          local_3760 = 0x3fb8aa3b3fb8aa3b;
          uStack_3758 = 0x3fb8aa3b3fb8aa3b;
          uStack_3750 = 0x3fb8aa3b3fb8aa3b;
          uStack_3748 = 0x3fb8aa3b3fb8aa3b;
          local_3740._0_4_ = auVar3._0_4_;
          local_3740._4_4_ = auVar3._4_4_;
          uStack_3738._0_4_ = auVar3._8_4_;
          uStack_3738._4_4_ = auVar3._12_4_;
          uStack_3730._0_4_ = auVar3._16_4_;
          uStack_3730._4_4_ = auVar3._20_4_;
          uStack_3728._0_4_ = auVar3._24_4_;
          local_3940 = (float)local_3740 * 1.442695;
          fStack_393c = local_3740._4_4_ * 1.442695;
          fStack_3938 = (float)uStack_3738 * 1.442695;
          fStack_3934 = uStack_3738._4_4_ * 1.442695;
          fStack_3930 = (float)uStack_3730 * 1.442695;
          fStack_392c = uStack_3730._4_4_ * 1.442695;
          fStack_3928 = (float)uStack_3728 * 1.442695;
          uStack_3924 = 0x3fb8aa3b;
          local_3960 = 0x3f0000003f000000;
          uStack_3958 = 0x3f0000003f000000;
          uStack_3950 = 0x3f0000003f000000;
          uStack_3948 = 0x3f0000003f000000;
          local_3c60._4_4_ = fStack_393c + 0.5;
          local_3c60._0_4_ = local_3940 + 0.5;
          uStack_3c58._0_4_ = fStack_3938 + 0.5;
          uStack_3c58._4_4_ = fStack_3934 + 0.5;
          uStack_3c50._0_4_ = fStack_3930 + 0.5;
          uStack_3c50._4_4_ = fStack_392c + 0.5;
          uStack_3c48._0_4_ = fStack_3928 + 0.5;
          uStack_3c48._4_4_ = 0x3ff8aa3b;
          auVar5 = vroundps_avx(_local_3c60,1);
          auVar4 = vcmpps_avx(_local_3c60,auVar5,1);
          local_3cc0._0_8_ = auVar4._0_8_;
          local_3cc0._8_8_ = auVar4._8_8_;
          local_3cc0._16_8_ = auVar4._16_8_;
          local_3cc0._24_8_ = auVar4._24_8_;
          local_2b20 = local_3cc0._0_8_;
          uStack_2b18 = local_3cc0._8_8_;
          uStack_2b10 = local_3cc0._16_8_;
          uStack_2b08 = local_3cc0._24_8_;
          local_2b40 = 0x3f8000003f800000;
          uStack_2b38 = 0x3f8000003f800000;
          uStack_2b30 = 0x3f8000003f800000;
          uStack_2b28 = 0x3f8000003f800000;
          auVar24._8_8_ = 0x3f8000003f800000;
          auVar24._0_8_ = 0x3f8000003f800000;
          auVar24._16_8_ = 0x3f8000003f800000;
          auVar24._24_8_ = 0x3f8000003f800000;
          local_3cc0 = vandps_avx(auVar4,auVar24);
          local_3c40 = auVar5._0_8_;
          uStack_3c38 = auVar5._8_8_;
          uStack_3c30 = auVar5._16_8_;
          uStack_3c28 = auVar5._24_8_;
          local_3500 = local_3c40;
          uStack_34f8 = uStack_3c38;
          uStack_34f0 = uStack_3c30;
          uStack_34e8 = uStack_3c28;
          local_3520 = local_3cc0._0_8_;
          uStack_3518 = local_3cc0._8_8_;
          uStack_3510 = local_3cc0._16_8_;
          uStack_3508 = local_3cc0._24_8_;
          _local_3c60 = vsubps_avx(auVar5,local_3cc0);
          local_2820 = local_3c60;
          uStack_2818 = uStack_3c58;
          uStack_2810 = uStack_3c50;
          uStack_2808 = uStack_3c48;
          local_2840 = 0x3f3180003f318000;
          uStack_2838 = 0x3f3180003f318000;
          uStack_2830 = 0x3f3180003f318000;
          uStack_2828 = 0x3f3180003f318000;
          local_2860 = local_3c20._0_8_;
          uStack_2858 = local_3c20._8_8_;
          uStack_2850 = local_3c20._16_8_;
          uStack_2848 = local_3c20._24_8_;
          local_27e0 = local_3c60;
          uVar80 = local_27e0;
          uStack_27d8 = uStack_3c58;
          uVar81 = uStack_27d8;
          uStack_27d0 = uStack_3c50;
          uVar82 = uStack_27d0;
          uStack_27c8 = uStack_3c48;
          uVar83 = uStack_27c8;
          local_2800 = 0x3f3180003f318000;
          uStack_27f8 = 0x3f3180003f318000;
          uStack_27f0 = 0x3f3180003f318000;
          uStack_27e8 = 0x3f3180003f318000;
          local_27e0._0_4_ = local_3c60._0_4_;
          local_27e0._4_4_ = local_3c60._4_4_;
          uStack_27d8._0_4_ = local_3c60._8_4_;
          uStack_27d8._4_4_ = local_3c60._12_4_;
          uStack_27d0._0_4_ = local_3c60._16_4_;
          uStack_27d0._4_4_ = local_3c60._20_4_;
          uStack_27c8._0_4_ = local_3c60._24_4_;
          uStack_27c8._4_4_ = local_3c60._28_4_;
          local_27c0 = (float)local_27e0 * 0.6933594;
          fStack_27bc = local_27e0._4_4_ * 0.6933594;
          fStack_27b8 = (float)uStack_27d8 * 0.6933594;
          fStack_27b4 = uStack_27d8._4_4_ * 0.6933594;
          fStack_27b0 = (float)uStack_27d0 * 0.6933594;
          fStack_27ac = uStack_27d0._4_4_ * 0.6933594;
          fStack_27a8 = (float)uStack_27c8 * 0.6933594;
          local_27a0 = local_3c20._0_8_;
          uStack_2798 = local_3c20._8_8_;
          uStack_2790 = local_3c20._16_8_;
          uStack_2788 = local_3c20._24_8_;
          fStack_27a4 = uStack_27c8._4_4_;
          auVar28._4_4_ = fStack_27bc;
          auVar28._0_4_ = local_27c0;
          auVar28._8_4_ = fStack_27b8;
          auVar28._12_4_ = fStack_27b4;
          auVar28._16_4_ = fStack_27b0;
          auVar28._20_4_ = fStack_27ac;
          auVar28._24_4_ = fStack_27a8;
          auVar28._28_4_ = uStack_27c8._4_4_;
          auVar4 = vsubps_avx(auVar3,auVar28);
          local_3c20._0_8_ = auVar4._0_8_;
          local_3c20._8_8_ = auVar4._8_8_;
          local_3c20._16_8_ = auVar4._16_8_;
          local_3c20._24_8_ = auVar4._24_8_;
          local_2900 = local_3c60;
          uStack_28f8 = uStack_3c58;
          uStack_28f0 = uStack_3c50;
          uStack_28e8 = uStack_3c48;
          local_2920 = 0xb95e8083b95e8083;
          uStack_2918 = 0xb95e8083b95e8083;
          uStack_2910 = 0xb95e8083b95e8083;
          uStack_2908 = 0xb95e8083b95e8083;
          local_2940 = local_3c20._0_8_;
          uStack_2938 = local_3c20._8_8_;
          uStack_2930 = local_3c20._16_8_;
          uStack_2928 = local_3c20._24_8_;
          local_28c0 = local_3c60;
          uStack_28b8 = uStack_3c58;
          uStack_28b0 = uStack_3c50;
          uStack_28a8 = uStack_3c48;
          local_28e0 = 0xb95e8083b95e8083;
          uStack_28d8 = 0xb95e8083b95e8083;
          uStack_28d0 = 0xb95e8083b95e8083;
          uStack_28c8 = 0xb95e8083b95e8083;
          local_28a0 = (float)local_27e0 * -0.00021219444;
          fStack_289c = local_27e0._4_4_ * -0.00021219444;
          fStack_2898 = (float)uStack_27d8 * -0.00021219444;
          fStack_2894 = uStack_27d8._4_4_ * -0.00021219444;
          fStack_2890 = (float)uStack_27d0 * -0.00021219444;
          fStack_288c = uStack_27d0._4_4_ * -0.00021219444;
          fStack_2888 = (float)uStack_27c8 * -0.00021219444;
          local_2880 = local_3c20._0_8_;
          uStack_2878 = local_3c20._8_8_;
          uStack_2870 = local_3c20._16_8_;
          uStack_2868 = local_3c20._24_8_;
          fStack_2884 = uStack_27c8._4_4_;
          auVar27._4_4_ = fStack_289c;
          auVar27._0_4_ = local_28a0;
          auVar27._8_4_ = fStack_2898;
          auVar27._12_4_ = fStack_2894;
          auVar27._16_4_ = fStack_2890;
          auVar27._20_4_ = fStack_288c;
          auVar27._24_4_ = fStack_2888;
          auVar27._28_4_ = uStack_27c8._4_4_;
          local_3c20 = vsubps_avx(auVar4,auVar27);
          local_3540 = local_3c20._0_8_;
          uVar76 = local_3540;
          uStack_3538 = local_3c20._8_8_;
          uVar77 = uStack_3538;
          uStack_3530 = local_3c20._16_8_;
          uVar78 = uStack_3530;
          uStack_3528 = local_3c20._24_8_;
          uVar79 = uStack_3528;
          local_3560 = local_3c20._0_8_;
          uStack_3558 = local_3c20._8_8_;
          uStack_3550 = local_3c20._16_8_;
          uStack_3548 = local_3c20._24_8_;
          local_3540._0_4_ = local_3c20._0_4_;
          local_3540._4_4_ = local_3c20._4_4_;
          uStack_3538._0_4_ = local_3c20._8_4_;
          uStack_3538._4_4_ = local_3c20._12_4_;
          uStack_3530._0_4_ = local_3c20._16_4_;
          uStack_3530._4_4_ = local_3c20._20_4_;
          uStack_3528._0_4_ = local_3c20._24_4_;
          uStack_3528._4_4_ = local_3c20._28_4_;
          local_3c40 = CONCAT44(local_3540._4_4_ * local_3540._4_4_,
                                (float)local_3540 * (float)local_3540);
          uStack_3c38._0_4_ = (float)uStack_3538 * (float)uStack_3538;
          uStack_3c38._4_4_ = uStack_3538._4_4_ * uStack_3538._4_4_;
          uStack_3c30._0_4_ = (float)uStack_3530 * (float)uStack_3530;
          uStack_3c30._4_4_ = uStack_3530._4_4_ * uStack_3530._4_4_;
          auVar70 = _local_3c40;
          uStack_3c28._0_4_ = (float)uStack_3528 * (float)uStack_3528;
          uStack_3c28._4_4_ = uStack_3528._4_4_;
          auVar19 = _local_3c40;
          local_39e0 = 0x3950696739506967;
          uStack_39d8 = 0x3950696739506967;
          uStack_39d0 = 0x3950696739506967;
          uStack_39c8 = 0x3950696739506967;
          local_3a00 = local_3c20._0_8_;
          uStack_39f8 = local_3c20._8_8_;
          uStack_39f0 = local_3c20._16_8_;
          uStack_39e8 = local_3c20._24_8_;
          local_3a20 = 0x3ab743ce3ab743ce;
          uStack_3a18 = 0x3ab743ce3ab743ce;
          uStack_3a10 = 0x3ab743ce3ab743ce;
          uStack_3a08 = 0x3ab743ce3ab743ce;
          local_3700 = 0x3950696739506967;
          uStack_36f8 = 0x3950696739506967;
          uStack_36f0 = 0x3950696739506967;
          uStack_36e8 = 0x3950696739506967;
          local_3720 = local_3c20._0_8_;
          uStack_3718 = local_3c20._8_8_;
          uStack_3710 = local_3c20._16_8_;
          uStack_3708 = local_3c20._24_8_;
          local_3900 = (float)local_3540 * 0.00019875691;
          fStack_38fc = local_3540._4_4_ * 0.00019875691;
          fStack_38f8 = (float)uStack_3538 * 0.00019875691;
          fStack_38f4 = uStack_3538._4_4_ * 0.00019875691;
          fStack_38f0 = (float)uStack_3530 * 0.00019875691;
          fStack_38ec = uStack_3530._4_4_ * 0.00019875691;
          fStack_38e8 = (float)uStack_3528 * 0.00019875691;
          fStack_38e4 = uStack_3528._4_4_;
          local_3920 = 0x3ab743ce3ab743ce;
          uStack_3918 = 0x3ab743ce3ab743ce;
          uStack_3910 = 0x3ab743ce3ab743ce;
          uStack_3908 = 0x3ab743ce3ab743ce;
          local_3ce0 = CONCAT44(fStack_38fc + 0.0013981999,local_3900 + 0.0013981999);
          uStack_3cd8 = CONCAT44(fStack_38f4 + 0.0013981999,fStack_38f8 + 0.0013981999);
          uStack_3cd0 = CONCAT44(fStack_38ec + 0.0013981999,fStack_38f0 + 0.0013981999);
          uStack_3cc8 = CONCAT44(uStack_3528._4_4_ + 0.0013981999,fStack_38e8 + 0.0013981999);
          local_3a40 = local_3ce0;
          uStack_3a38 = uStack_3cd8;
          uStack_3a30 = uStack_3cd0;
          uStack_3a28 = uStack_3cc8;
          local_3a60 = local_3c20._0_8_;
          uStack_3a58 = local_3c20._8_8_;
          uStack_3a50 = local_3c20._16_8_;
          uStack_3a48 = local_3c20._24_8_;
          local_3a80 = 0x3c0889083c088908;
          uStack_3a78 = 0x3c0889083c088908;
          uStack_3a70 = 0x3c0889083c088908;
          uStack_3a68 = 0x3c0889083c088908;
          local_36c0 = local_3ce0;
          uStack_36b8 = uStack_3cd8;
          uStack_36b0 = uStack_3cd0;
          uStack_36a8 = uStack_3cc8;
          local_36e0 = local_3c20._0_8_;
          uStack_36d8 = local_3c20._8_8_;
          uStack_36d0 = local_3c20._16_8_;
          uStack_36c8 = local_3c20._24_8_;
          local_38c0 = (local_3900 + 0.0013981999) * (float)local_3540;
          fStack_38bc = (fStack_38fc + 0.0013981999) * local_3540._4_4_;
          fStack_38b8 = (fStack_38f8 + 0.0013981999) * (float)uStack_3538;
          fStack_38b4 = (fStack_38f4 + 0.0013981999) * uStack_3538._4_4_;
          fStack_38b0 = (fStack_38f0 + 0.0013981999) * (float)uStack_3530;
          fStack_38ac = (fStack_38ec + 0.0013981999) * uStack_3530._4_4_;
          fStack_38a8 = (fStack_38e8 + 0.0013981999) * (float)uStack_3528;
          fStack_38a4 = uStack_3528._4_4_;
          local_38e0 = 0x3c0889083c088908;
          uStack_38d8 = 0x3c0889083c088908;
          uStack_38d0 = 0x3c0889083c088908;
          uStack_38c8 = 0x3c0889083c088908;
          local_3ce0 = CONCAT44(fStack_38bc + 0.008333452,local_38c0 + 0.008333452);
          uStack_3cd8 = CONCAT44(fStack_38b4 + 0.008333452,fStack_38b8 + 0.008333452);
          uStack_3cd0 = CONCAT44(fStack_38ac + 0.008333452,fStack_38b0 + 0.008333452);
          uStack_3cc8 = CONCAT44(uStack_3528._4_4_ + 0.008333452,fStack_38a8 + 0.008333452);
          local_3aa0 = local_3ce0;
          uStack_3a98 = uStack_3cd8;
          uStack_3a90 = uStack_3cd0;
          uStack_3a88 = uStack_3cc8;
          local_3ac0 = local_3c20._0_8_;
          uStack_3ab8 = local_3c20._8_8_;
          uStack_3ab0 = local_3c20._16_8_;
          uStack_3aa8 = local_3c20._24_8_;
          local_3ae0 = 0x3d2aa9c13d2aa9c1;
          uStack_3ad8 = 0x3d2aa9c13d2aa9c1;
          uStack_3ad0 = 0x3d2aa9c13d2aa9c1;
          uStack_3ac8 = 0x3d2aa9c13d2aa9c1;
          local_3680 = local_3ce0;
          uStack_3678 = uStack_3cd8;
          uStack_3670 = uStack_3cd0;
          uStack_3668 = uStack_3cc8;
          local_36a0 = local_3c20._0_8_;
          uStack_3698 = local_3c20._8_8_;
          uStack_3690 = local_3c20._16_8_;
          uStack_3688 = local_3c20._24_8_;
          local_3880 = (local_38c0 + 0.008333452) * (float)local_3540;
          fStack_387c = (fStack_38bc + 0.008333452) * local_3540._4_4_;
          fStack_3878 = (fStack_38b8 + 0.008333452) * (float)uStack_3538;
          fStack_3874 = (fStack_38b4 + 0.008333452) * uStack_3538._4_4_;
          fStack_3870 = (fStack_38b0 + 0.008333452) * (float)uStack_3530;
          fStack_386c = (fStack_38ac + 0.008333452) * uStack_3530._4_4_;
          fStack_3868 = (fStack_38a8 + 0.008333452) * (float)uStack_3528;
          fStack_3864 = uStack_3528._4_4_;
          local_38a0 = 0x3d2aa9c13d2aa9c1;
          uStack_3898 = 0x3d2aa9c13d2aa9c1;
          uStack_3890 = 0x3d2aa9c13d2aa9c1;
          uStack_3888 = 0x3d2aa9c13d2aa9c1;
          local_3ce0 = CONCAT44(fStack_387c + 0.041665796,local_3880 + 0.041665796);
          uStack_3cd8 = CONCAT44(fStack_3874 + 0.041665796,fStack_3878 + 0.041665796);
          uStack_3cd0 = CONCAT44(fStack_386c + 0.041665796,fStack_3870 + 0.041665796);
          uStack_3cc8 = CONCAT44(uStack_3528._4_4_ + 0.041665796,fStack_3868 + 0.041665796);
          local_3b00 = local_3ce0;
          uStack_3af8 = uStack_3cd8;
          uStack_3af0 = uStack_3cd0;
          uStack_3ae8 = uStack_3cc8;
          local_3b20 = local_3c20._0_8_;
          uStack_3b18 = local_3c20._8_8_;
          uStack_3b10 = local_3c20._16_8_;
          uStack_3b08 = local_3c20._24_8_;
          local_3b40 = 0x3e2aaaaa3e2aaaaa;
          uStack_3b38 = 0x3e2aaaaa3e2aaaaa;
          uStack_3b30 = 0x3e2aaaaa3e2aaaaa;
          uStack_3b28 = 0x3e2aaaaa3e2aaaaa;
          local_3640 = local_3ce0;
          uStack_3638 = uStack_3cd8;
          uStack_3630 = uStack_3cd0;
          uStack_3628 = uStack_3cc8;
          local_3660 = local_3c20._0_8_;
          uStack_3658 = local_3c20._8_8_;
          uStack_3650 = local_3c20._16_8_;
          uStack_3648 = local_3c20._24_8_;
          local_3840 = (local_3880 + 0.041665796) * (float)local_3540;
          fStack_383c = (fStack_387c + 0.041665796) * local_3540._4_4_;
          fStack_3838 = (fStack_3878 + 0.041665796) * (float)uStack_3538;
          fStack_3834 = (fStack_3874 + 0.041665796) * uStack_3538._4_4_;
          fStack_3830 = (fStack_3870 + 0.041665796) * (float)uStack_3530;
          fStack_382c = (fStack_386c + 0.041665796) * uStack_3530._4_4_;
          fStack_3828 = (fStack_3868 + 0.041665796) * (float)uStack_3528;
          fStack_3824 = uStack_3528._4_4_;
          local_3860 = 0x3e2aaaaa3e2aaaaa;
          uStack_3858 = 0x3e2aaaaa3e2aaaaa;
          uStack_3850 = 0x3e2aaaaa3e2aaaaa;
          uStack_3848 = 0x3e2aaaaa3e2aaaaa;
          local_3ce0 = CONCAT44(fStack_383c + 0.16666666,local_3840 + 0.16666666);
          uStack_3cd8 = CONCAT44(fStack_3834 + 0.16666666,fStack_3838 + 0.16666666);
          uStack_3cd0 = CONCAT44(fStack_382c + 0.16666666,fStack_3830 + 0.16666666);
          uStack_3cc8 = CONCAT44(uStack_3528._4_4_ + 0.16666666,fStack_3828 + 0.16666666);
          local_3b60 = local_3ce0;
          uStack_3b58 = uStack_3cd8;
          uStack_3b50 = uStack_3cd0;
          uStack_3b48 = uStack_3cc8;
          local_3b80 = local_3c20._0_8_;
          uStack_3b78 = local_3c20._8_8_;
          uStack_3b70 = local_3c20._16_8_;
          uStack_3b68 = local_3c20._24_8_;
          local_3ba0 = 0x3f0000003f000000;
          uStack_3b98 = 0x3f0000003f000000;
          uStack_3b90 = 0x3f0000003f000000;
          uStack_3b88 = 0x3f0000003f000000;
          local_3600 = local_3ce0;
          uStack_35f8 = uStack_3cd8;
          uStack_35f0 = uStack_3cd0;
          uStack_35e8 = uStack_3cc8;
          local_3620 = local_3c20._0_8_;
          uStack_3618 = local_3c20._8_8_;
          uStack_3610 = local_3c20._16_8_;
          uStack_3608 = local_3c20._24_8_;
          local_3800 = (local_3840 + 0.16666666) * (float)local_3540;
          fStack_37fc = (fStack_383c + 0.16666666) * local_3540._4_4_;
          fStack_37f8 = (fStack_3838 + 0.16666666) * (float)uStack_3538;
          fStack_37f4 = (fStack_3834 + 0.16666666) * uStack_3538._4_4_;
          fStack_37f0 = (fStack_3830 + 0.16666666) * (float)uStack_3530;
          fStack_37ec = (fStack_382c + 0.16666666) * uStack_3530._4_4_;
          fStack_37e8 = (fStack_3828 + 0.16666666) * (float)uStack_3528;
          fStack_37e4 = uStack_3528._4_4_;
          local_3820 = 0x3f0000003f000000;
          uStack_3818 = 0x3f0000003f000000;
          uStack_3810 = 0x3f0000003f000000;
          uStack_3808 = 0x3f0000003f000000;
          local_3ce0 = CONCAT44(fStack_37fc + 0.5,local_3800 + 0.5);
          uStack_3cd8 = CONCAT44(fStack_37f4 + 0.5,fStack_37f8 + 0.5);
          uStack_3cd0 = CONCAT44(fStack_37ec + 0.5,fStack_37f0 + 0.5);
          uStack_3cc8 = CONCAT44(uStack_3528._4_4_ + 0.5,fStack_37e8 + 0.5);
          uStack_3c30 = auVar70._16_8_;
          uStack_3c28 = auVar19._24_8_;
          local_3bc0 = local_3ce0;
          uStack_3bb8 = uStack_3cd8;
          uStack_3bb0 = uStack_3cd0;
          uStack_3ba8 = uStack_3cc8;
          local_3be0 = local_3c40;
          uStack_3bd8 = uStack_3c38;
          uStack_3bd0 = uStack_3c30;
          uStack_3bc8 = uStack_3c28;
          local_3c00 = local_3c20._0_8_;
          uStack_3bf8 = local_3c20._8_8_;
          uStack_3bf0 = local_3c20._16_8_;
          uStack_3be8 = local_3c20._24_8_;
          local_35c0 = local_3ce0;
          uStack_35b8 = uStack_3cd8;
          uStack_35b0 = uStack_3cd0;
          uStack_35a8 = uStack_3cc8;
          local_35e0 = local_3c40;
          uStack_35d8 = uStack_3c38;
          uStack_35d0 = uStack_3c30;
          uStack_35c8 = uStack_3c28;
          local_37c0 = (local_3800 + 0.5) * (float)local_3540 * (float)local_3540;
          fStack_37bc = (fStack_37fc + 0.5) * local_3540._4_4_ * local_3540._4_4_;
          fStack_37b8 = (fStack_37f8 + 0.5) * (float)uStack_3538 * (float)uStack_3538;
          fStack_37b4 = (fStack_37f4 + 0.5) * uStack_3538._4_4_ * uStack_3538._4_4_;
          fStack_37b0 = (fStack_37f0 + 0.5) * (float)uStack_3530 * (float)uStack_3530;
          fStack_37ac = (fStack_37ec + 0.5) * uStack_3530._4_4_ * uStack_3530._4_4_;
          fStack_37a8 = (fStack_37e8 + 0.5) * (float)uStack_3528 * (float)uStack_3528;
          fStack_37a4 = uStack_3528._4_4_;
          local_37e0 = local_3c20._0_8_;
          uStack_37d8 = local_3c20._8_8_;
          uStack_37d0 = local_3c20._16_8_;
          uStack_37c8 = local_3c20._24_8_;
          local_3ce0 = CONCAT44(fStack_37bc + local_3540._4_4_,local_37c0 + (float)local_3540);
          uStack_3cd8 = CONCAT44(fStack_37b4 + uStack_3538._4_4_,fStack_37b8 + (float)uStack_3538);
          uStack_3cd0 = CONCAT44(fStack_37ac + uStack_3530._4_4_,fStack_37b0 + (float)uStack_3530);
          uStack_3cc8 = CONCAT44(uStack_3528._4_4_ + uStack_3528._4_4_,
                                 fStack_37a8 + (float)uStack_3528);
          local_3780 = local_3ce0;
          uStack_3778 = uStack_3cd8;
          uStack_3770 = uStack_3cd0;
          uStack_3768 = uStack_3cc8;
          local_37a0 = 0x3f8000003f800000;
          uStack_3798 = 0x3f8000003f800000;
          uStack_3790 = 0x3f8000003f800000;
          uStack_3788 = 0x3f8000003f800000;
          fVar147 = local_37c0 + (float)local_3540 + 1.0;
          fVar136 = fStack_37bc + local_3540._4_4_ + 1.0;
          fVar138 = fStack_37b8 + (float)uStack_3538 + 1.0;
          fVar140 = fStack_37b4 + uStack_3538._4_4_ + 1.0;
          fVar142 = fStack_37b0 + (float)uStack_3530 + 1.0;
          fVar144 = fStack_37ac + uStack_3530._4_4_ + 1.0;
          fVar146 = fStack_37a8 + (float)uStack_3528 + 1.0;
          fVar148 = uStack_3528._4_4_ + uStack_3528._4_4_ + 1.0;
          local_3ce0 = CONCAT44(fVar136,fVar147);
          uStack_3cd8 = CONCAT44(fVar140,fVar138);
          uStack_3cd0 = CONCAT44(fVar144,fVar142);
          uStack_3cc8 = CONCAT44(fVar148,fVar146);
          local_2760 = local_3c60;
          uStack_2758 = uStack_3c58;
          uStack_2750 = uStack_3c50;
          uStack_2748 = uStack_3c48;
          local_3c80 = CONCAT44((int)local_27e0._4_4_,(int)(float)local_27e0);
          uStack_3c78 = CONCAT44((int)uStack_27d8._4_4_,(int)(float)uStack_27d8);
          uStack_3c70 = CONCAT44((int)uStack_27d0._4_4_,(int)(float)uStack_27d0);
          uStack_3c68 = CONCAT44((int)uStack_27c8._4_4_,(int)(float)uStack_27c8);
          local_2560 = local_3c80;
          uStack_2558 = uStack_3c78;
          uStack_2550 = uStack_3c70;
          uStack_2548 = uStack_3c68;
          local_2580 = 0x7f0000007f;
          uStack_2578 = 0x7f0000007f;
          uStack_2570 = 0x7f0000007f;
          uStack_2568 = 0x7f0000007f;
          local_2600 = local_3c80;
          uStack_25f8 = uStack_3c78;
          uStack_25f0 = uStack_3c70;
          uStack_25e8 = uStack_3c68;
          local_2620 = 0x7f0000007f;
          uStack_2618 = 0x7f0000007f;
          uStack_2610 = 0x7f0000007f;
          uStack_2608 = 0x7f0000007f;
          local_25b0 = 0x7f0000007f;
          uStack_25a8 = 0x7f0000007f;
          local_25c0 = 0x7f0000007f;
          uStack_25b8 = 0x7f0000007f;
          local_2350 = local_3c80;
          uStack_2348 = uStack_3c78;
          local_2360 = 0x7f0000007f;
          uStack_2358 = 0x7f0000007f;
          auVar30._8_8_ = uStack_3c78;
          auVar30._0_8_ = local_3c80;
          auVar29._8_8_ = 0x7f0000007f;
          auVar29._0_8_ = 0x7f0000007f;
          local_2590 = vpaddd_avx(auVar30,auVar29);
          local_2370 = uStack_3c70;
          uStack_2368 = uStack_3c68;
          local_2380 = 0x7f0000007f;
          uStack_2378 = 0x7f0000007f;
          auVar1._8_8_ = uStack_3c68;
          auVar1._0_8_ = uStack_3c70;
          auVar2._8_8_ = 0x7f0000007f;
          auVar2._0_8_ = 0x7f0000007f;
          local_25a0 = vpaddd_avx(auVar1,auVar2);
          local_2640 = local_2590._0_8_;
          uStack_2638 = local_2590._8_8_;
          uStack_2630 = local_25a0._0_8_;
          uStack_2628 = local_25a0._8_8_;
          local_25e0 = local_2590._0_8_;
          uStack_25d8 = local_2590._8_8_;
          uStack_25d0 = local_25a0._0_8_;
          uStack_25c8 = local_25a0._8_8_;
          local_23e0 = local_2590._0_8_;
          uStack_23d8 = local_2590._8_8_;
          uStack_23d0 = local_25a0._0_8_;
          uStack_23c8 = local_25a0._8_8_;
          local_23e4 = 0x17;
          local_2460 = local_2590._0_8_;
          uStack_2458 = local_2590._8_8_;
          uStack_2450 = local_25a0._0_8_;
          uStack_2448 = local_25a0._8_8_;
          local_22d0 = local_2590._0_8_;
          uStack_22c8 = local_2590._8_8_;
          local_22d4 = 0x17;
          local_2400 = vpslld_avx(local_2590,ZEXT416(0x17));
          local_22f0 = local_25a0._0_8_;
          uStack_22e8 = local_25a0._8_8_;
          local_22f4 = 0x17;
          local_2410 = vpslld_avx(local_25a0,ZEXT416(0x17));
          local_2480 = local_2400._0_8_;
          uStack_2478 = local_2400._8_8_;
          uStack_2470 = local_2410._0_8_;
          uStack_2468 = local_2410._8_8_;
          local_2440 = local_2400._0_8_;
          uStack_2438 = local_2400._8_8_;
          uStack_2430 = local_2410._0_8_;
          uStack_2428 = local_2410._8_8_;
          local_3c80 = local_2400._0_8_;
          uStack_3c78 = local_2400._8_8_;
          uStack_3c70 = local_2410._0_8_;
          uStack_3c68 = local_2410._8_8_;
          local_23a0 = local_2400._0_8_;
          uStack_2398 = local_2400._8_8_;
          uStack_2390 = local_2410._0_8_;
          uStack_2388 = local_2410._8_8_;
          local_3d00 = local_2400._0_8_;
          uStack_3cf8 = local_2400._8_8_;
          uStack_3cf0 = local_2410._0_8_;
          uStack_3ce8 = local_2410._8_8_;
          local_3580 = local_3ce0;
          uStack_3578 = uStack_3cd8;
          uStack_3570 = uStack_3cd0;
          uStack_3568 = uStack_3cc8;
          local_35a0 = local_2400._0_8_;
          uVar72 = local_35a0;
          uStack_3598 = local_2400._8_8_;
          uVar73 = uStack_3598;
          uStack_3590 = local_2410._0_8_;
          uVar74 = uStack_3590;
          uStack_3588 = local_2410._8_8_;
          uVar75 = uStack_3588;
          local_35a0._0_4_ = local_2400._0_4_;
          local_35a0._4_4_ = local_2400._4_4_;
          uStack_3598._0_4_ = local_2400._8_4_;
          uStack_3598._4_4_ = local_2400._12_4_;
          uStack_3590._0_4_ = local_2410._0_4_;
          uStack_3590._4_4_ = local_2410._4_4_;
          uStack_3588._0_4_ = local_2410._8_4_;
          fVar147 = fVar147 * (float)local_35a0;
          fVar136 = fVar136 * local_35a0._4_4_;
          fVar138 = fVar138 * (float)uStack_3598;
          fVar140 = fVar140 * uStack_3598._4_4_;
          fVar142 = fVar142 * (float)uStack_3590;
          fVar144 = fVar144 * uStack_3590._4_4_;
          fVar146 = fVar146 * (float)uStack_3588;
          local_3ce0 = CONCAT44(fVar136,fVar147);
          uStack_3cd8 = CONCAT44(fVar140,fVar138);
          uStack_3cd0 = CONCAT44(fVar144,fVar142);
          uStack_3cc8 = CONCAT44(fVar148,fVar146);
          local_4024 = 0x3f800000;
          local_3fe4 = 0x3f800000;
          local_3fe8 = 0x3f800000;
          local_3fec = 0x3f800000;
          local_3ff0 = 0x3f800000;
          local_3ff4 = 0x3f800000;
          local_3ff8 = 0x3f800000;
          local_3ffc = 0x3f800000;
          local_4000 = 0x3f800000;
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          local_4020 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          auStack_4010 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          local_40a0 = local_3ce0;
          uStack_4098 = uStack_3cd8;
          uStack_4090 = uStack_3cd0;
          uStack_4088 = uStack_3cc8;
          local_40c0 = local_4020._0_8_;
          uVar62 = local_40c0;
          uStack_40b8 = local_4020._8_8_;
          uVar63 = uStack_40b8;
          uStack_40b0 = auStack_4010._0_8_;
          uVar64 = uStack_40b0;
          uStack_40a8 = auStack_4010._8_8_;
          uVar65 = uStack_40a8;
          local_40c0._0_4_ = local_4020._0_4_;
          local_40c0._4_4_ = local_4020._4_4_;
          uStack_40b8._0_4_ = local_4020._8_4_;
          uStack_40b8._4_4_ = local_4020._12_4_;
          uStack_40b0._0_4_ = auStack_4010._0_4_;
          uStack_40b0._4_4_ = auStack_4010._4_4_;
          uStack_40a8._0_4_ = auStack_4010._8_4_;
          uStack_40a8._4_4_ = auStack_4010._12_4_;
          local_1100._4_4_ = fVar136 + local_40c0._4_4_;
          local_1100._0_4_ = fVar147 + (float)local_40c0;
          uStack_10f8._0_4_ = fVar138 + (float)uStack_40b8;
          uStack_10f8._4_4_ = fVar140 + uStack_40b8._4_4_;
          uStack_10f0._0_4_ = fVar142 + (float)uStack_40b0;
          uStack_10f0._4_4_ = fVar144 + uStack_40b0._4_4_;
          auVar70 = _local_1100;
          uStack_10e8._0_4_ = fVar146 + (float)uStack_40a8;
          uStack_10e8._4_4_ = fVar148 + uStack_40a8._4_4_;
          auVar4 = _local_1100;
          local_1140 = 0x3f8000003f800000;
          uStack_1138 = 0x3f8000003f800000;
          uStack_1130 = 0x3f8000003f800000;
          uStack_1128 = 0x3f8000003f800000;
          local_620 = ZEXT832(0) << 0x20;
          local_1160 = vcmpps_avx(_local_1100,local_620,2);
          uStack_10f0 = auVar70._16_8_;
          uStack_10e8 = auVar4._24_8_;
          local_5e0 = local_1100;
          uStack_5d8 = uStack_10f8;
          uStack_5d0 = uStack_10f0;
          uStack_5c8 = uStack_10e8;
          local_600 = 0x80000000800000;
          uStack_5f8 = 0x80000000800000;
          uStack_5f0 = 0x80000000800000;
          uStack_5e8 = 0x80000000800000;
          auVar52._16_8_ = uStack_10f0;
          auVar52._0_16_ = _local_1100;
          auVar52._24_8_ = uStack_10e8;
          auVar51._8_8_ = 0x80000000800000;
          auVar51._0_8_ = 0x80000000800000;
          auVar51._16_8_ = 0x80000000800000;
          auVar51._24_8_ = 0x80000000800000;
          auVar4 = vmaxps_avx(auVar52,auVar51);
          local_1100 = auVar4._0_8_;
          uStack_10f8 = auVar4._8_8_;
          uStack_10f0 = auVar4._16_8_;
          uStack_10e8 = auVar4._24_8_;
          local_360 = local_1100;
          uStack_358 = uStack_10f8;
          uStack_350 = uStack_10f0;
          uStack_348 = uStack_10e8;
          local_380 = local_1100;
          uStack_378 = uStack_10f8;
          uStack_370 = uStack_10f0;
          uStack_368 = uStack_10e8;
          local_384 = 0x17;
          local_400 = local_1100;
          uStack_3f8 = uStack_10f8;
          uStack_3f0 = uStack_10f0;
          uStack_3e8 = uStack_10e8;
          local_160 = local_1100;
          uStack_158 = uStack_10f8;
          local_164 = 0x17;
          local_3a0 = vpsrld_avx(auVar4._0_16_,ZEXT416(0x17));
          local_180 = uStack_10f0;
          uStack_178 = uStack_10e8;
          local_184 = 0x17;
          local_3b0 = vpsrld_avx(auVar4._16_16_,ZEXT416(0x17));
          local_420 = local_3a0._0_8_;
          uStack_418 = local_3a0._8_8_;
          uStack_410 = local_3b0._0_8_;
          uStack_408 = local_3b0._8_8_;
          local_3e0 = local_3a0._0_8_;
          uStack_3d8 = local_3a0._8_8_;
          uStack_3d0 = local_3b0._0_8_;
          uStack_3c8 = local_3b0._8_8_;
          local_520 = local_1100;
          uStack_518 = uStack_10f8;
          uStack_510 = uStack_10f0;
          uStack_508 = uStack_10e8;
          local_540 = 0x807fffff807fffff;
          uStack_538 = 0x807fffff807fffff;
          uStack_530 = 0x807fffff807fffff;
          uStack_528 = 0x807fffff807fffff;
          auVar54._8_8_ = 0x807fffff807fffff;
          auVar54._0_8_ = 0x807fffff807fffff;
          auVar54._16_8_ = 0x807fffff807fffff;
          auVar54._24_8_ = 0x807fffff807fffff;
          auVar4 = vandps_avx(auVar4,auVar54);
          local_1100 = auVar4._0_8_;
          uStack_10f8 = auVar4._8_8_;
          uStack_10f0 = auVar4._16_8_;
          uStack_10e8 = auVar4._24_8_;
          local_2e0 = local_1100;
          uStack_2d8 = uStack_10f8;
          uStack_2d0 = uStack_10f0;
          uStack_2c8 = uStack_10e8;
          local_300 = 0x3f0000003f000000;
          uStack_2f8 = 0x3f0000003f000000;
          uStack_2f0 = 0x3f0000003f000000;
          uStack_2e8 = 0x3f0000003f000000;
          auVar58._8_8_ = 0x3f0000003f000000;
          auVar58._0_8_ = 0x3f0000003f000000;
          auVar58._16_8_ = 0x3f0000003f000000;
          auVar58._24_8_ = 0x3f0000003f000000;
          auVar3 = vorps_avx(auVar4,auVar58);
          local_1e0 = local_3a0._0_8_;
          uStack_1d8 = local_3a0._8_8_;
          uStack_1d0 = local_3b0._0_8_;
          uStack_1c8 = local_3b0._8_8_;
          local_200 = 0x7f0000007f;
          uStack_1f8 = 0x7f0000007f;
          uStack_1f0 = 0x7f0000007f;
          uStack_1e8 = 0x7f0000007f;
          local_280 = local_3a0._0_8_;
          uStack_278 = local_3a0._8_8_;
          uStack_270 = local_3b0._0_8_;
          uStack_268 = local_3b0._8_8_;
          local_2a0 = 0x7f0000007f;
          uStack_298 = 0x7f0000007f;
          uStack_290 = 0x7f0000007f;
          uStack_288 = 0x7f0000007f;
          local_230 = 0x7f0000007f;
          uStack_228 = 0x7f0000007f;
          local_240 = 0x7f0000007f;
          uStack_238 = 0x7f0000007f;
          local_120 = local_3a0._0_8_;
          uStack_118 = local_3a0._8_8_;
          local_130 = 0x7f0000007f;
          uStack_128 = 0x7f0000007f;
          auVar61._8_8_ = 0x7f0000007f;
          auVar61._0_8_ = 0x7f0000007f;
          local_210 = vpsubd_avx(local_3a0,auVar61);
          local_140 = local_3b0._0_8_;
          uStack_138 = local_3b0._8_8_;
          local_150 = 0x7f0000007f;
          uStack_148 = 0x7f0000007f;
          auVar60._8_8_ = 0x7f0000007f;
          auVar60._0_8_ = 0x7f0000007f;
          local_220 = vpsubd_avx(local_3b0,auVar60);
          local_2c0 = local_210._0_8_;
          uStack_2b8 = local_210._8_8_;
          uStack_2b0 = local_220._0_8_;
          uStack_2a8 = local_220._8_8_;
          local_260 = local_210._0_8_;
          uStack_258 = local_210._8_8_;
          uStack_250 = local_220._0_8_;
          uStack_248 = local_220._8_8_;
          local_1120 = local_210._0_8_;
          uStack_1118 = local_210._8_8_;
          uStack_1110 = local_220._0_8_;
          uStack_1108 = local_220._8_8_;
          local_1c0 = local_210._0_8_;
          uStack_1b8 = local_210._8_8_;
          uStack_1b0 = local_220._0_8_;
          uStack_1a8 = local_220._8_8_;
          auVar59._16_8_ = local_220._0_8_;
          auVar59._0_16_ = local_210;
          auVar59._24_8_ = local_220._8_8_;
          auVar4 = vcvtdq2ps_avx(auVar59);
          local_1180 = auVar4._0_8_;
          uStack_1178 = auVar4._8_8_;
          uStack_1170 = auVar4._16_8_;
          uStack_1168 = auVar4._24_8_;
          local_a00 = local_1180;
          uVar125 = local_a00;
          uStack_9f8 = uStack_1178;
          uVar126 = uStack_9f8;
          uStack_9f0 = uStack_1170;
          uVar127 = uStack_9f0;
          uStack_9e8 = uStack_1168;
          uVar128 = uStack_9e8;
          local_a20 = 0x3f8000003f800000;
          uStack_a18 = 0x3f8000003f800000;
          uStack_a10 = 0x3f8000003f800000;
          uStack_a08 = 0x3f8000003f800000;
          local_a00._0_4_ = auVar4._0_4_;
          local_a00._4_4_ = auVar4._4_4_;
          uStack_9f8._0_4_ = auVar4._8_4_;
          uStack_9f8._4_4_ = auVar4._12_4_;
          uStack_9f0._0_4_ = auVar4._16_4_;
          uStack_9f0._4_4_ = auVar4._20_4_;
          uStack_9e8._0_4_ = auVar4._24_4_;
          uStack_9e8._4_4_ = auVar4._28_4_;
          local_1180._4_4_ = local_a00._4_4_ + 1.0;
          local_1180._0_4_ = (float)local_a00 + 1.0;
          uStack_1178._0_4_ = (float)uStack_9f8 + 1.0;
          uStack_1178._4_4_ = uStack_9f8._4_4_ + 1.0;
          uStack_1170._0_4_ = (float)uStack_9f0 + 1.0;
          uStack_1170._4_4_ = uStack_9f0._4_4_ + 1.0;
          auVar70 = _local_1180;
          uStack_1168._0_4_ = (float)uStack_9e8 + 1.0;
          uStack_1168._4_4_ = uStack_9e8._4_4_ + 1.0;
          auVar5 = _local_1180;
          local_11a0 = vcmpps_avx(auVar3,_DAT_01f10fa0,1);
          local_1100 = auVar3._0_8_;
          uStack_10f8 = auVar3._8_8_;
          uStack_10f0 = auVar3._16_8_;
          uStack_10e8 = auVar3._24_8_;
          local_560 = local_1100;
          uStack_558 = uStack_10f8;
          uStack_550 = uStack_10f0;
          uStack_548 = uStack_10e8;
          local_580 = local_11a0._0_8_;
          uStack_578 = local_11a0._8_8_;
          uStack_570 = local_11a0._16_8_;
          uStack_568 = local_11a0._24_8_;
          local_11c0 = vandps_avx(auVar3,local_11a0);
          local_640 = local_1100;
          uStack_638 = uStack_10f8;
          uStack_630 = uStack_10f0;
          uStack_628 = uStack_10e8;
          local_660 = 0x3f8000003f800000;
          uStack_658 = 0x3f8000003f800000;
          uStack_650 = 0x3f8000003f800000;
          uStack_648 = 0x3f8000003f800000;
          auVar50._8_8_ = 0x3f8000003f800000;
          auVar50._0_8_ = 0x3f8000003f800000;
          auVar50._16_8_ = 0x3f8000003f800000;
          auVar50._24_8_ = 0x3f8000003f800000;
          auVar4 = vsubps_avx(auVar3,auVar50);
          uStack_1170 = auVar70._16_8_;
          uStack_1168 = auVar5._24_8_;
          local_5a0 = 0x3f8000003f800000;
          uStack_598 = 0x3f8000003f800000;
          uStack_590 = 0x3f8000003f800000;
          uStack_588 = 0x3f8000003f800000;
          local_5c0 = local_11a0._0_8_;
          uStack_5b8 = local_11a0._8_8_;
          uStack_5b0 = local_11a0._16_8_;
          uStack_5a8 = local_11a0._24_8_;
          auVar53._8_8_ = 0x3f8000003f800000;
          auVar53._0_8_ = 0x3f8000003f800000;
          auVar53._16_8_ = 0x3f8000003f800000;
          auVar53._24_8_ = 0x3f8000003f800000;
          local_6a0 = vandps_avx(auVar53,local_11a0);
          local_680 = local_1180;
          uStack_678 = uStack_1178;
          uStack_670 = uStack_1170;
          uStack_668 = uStack_1168;
          auVar49._16_8_ = uStack_1170;
          auVar49._0_16_ = _local_1180;
          auVar49._24_8_ = uStack_1168;
          _local_1180 = vsubps_avx(auVar49,local_6a0);
          local_1100 = auVar4._0_8_;
          uStack_10f8 = auVar4._8_8_;
          uStack_10f0 = auVar4._16_8_;
          uStack_10e8 = auVar4._24_8_;
          local_a40 = local_1100;
          uVar121 = local_a40;
          uStack_a38 = uStack_10f8;
          uVar122 = uStack_a38;
          uStack_a30 = uStack_10f0;
          uVar123 = uStack_a30;
          uStack_a28 = uStack_10e8;
          uVar124 = uStack_a28;
          local_a60 = local_11c0._0_8_;
          uVar117 = local_a60;
          uStack_a58 = local_11c0._8_8_;
          uVar118 = uStack_a58;
          uStack_a50 = local_11c0._16_8_;
          uVar119 = uStack_a50;
          uStack_a48 = local_11c0._24_8_;
          uVar120 = uStack_a48;
          local_a40._0_4_ = auVar4._0_4_;
          local_a40._4_4_ = auVar4._4_4_;
          uStack_a38._0_4_ = auVar4._8_4_;
          uStack_a38._4_4_ = auVar4._12_4_;
          uStack_a30._0_4_ = auVar4._16_4_;
          uStack_a30._4_4_ = auVar4._20_4_;
          uStack_a28._0_4_ = auVar4._24_4_;
          uStack_a28._4_4_ = auVar4._28_4_;
          local_a60._0_4_ = local_11c0._0_4_;
          local_a60._4_4_ = local_11c0._4_4_;
          uStack_a58._0_4_ = local_11c0._8_4_;
          uStack_a58._4_4_ = local_11c0._12_4_;
          uStack_a50._0_4_ = local_11c0._16_4_;
          uStack_a50._4_4_ = local_11c0._20_4_;
          uStack_a48._0_4_ = local_11c0._24_4_;
          uStack_a48._4_4_ = local_11c0._28_4_;
          local_a40._0_4_ = (float)local_a40 + (float)local_a60;
          local_a40._4_4_ = local_a40._4_4_ + local_a60._4_4_;
          uStack_a38._0_4_ = (float)uStack_a38 + (float)uStack_a58;
          uStack_a38._4_4_ = uStack_a38._4_4_ + uStack_a58._4_4_;
          uStack_a30._0_4_ = (float)uStack_a30 + (float)uStack_a50;
          uStack_a30._4_4_ = uStack_a30._4_4_ + uStack_a50._4_4_;
          uStack_a28._0_4_ = (float)uStack_a28 + (float)uStack_a48;
          fStack_11c4 = uStack_a28._4_4_ + uStack_a48._4_4_;
          local_1100._4_4_ = local_a40._4_4_;
          local_1100._0_4_ = (float)local_a40;
          uStack_10f8._0_4_ = (float)uStack_a38;
          uStack_10f8._4_4_ = uStack_a38._4_4_;
          uStack_10f0._0_4_ = (float)uStack_a30;
          uStack_10f0._4_4_ = uStack_a30._4_4_;
          auVar70 = _local_1100;
          uStack_10e8._0_4_ = (float)uStack_a28;
          uStack_10e8._4_4_ = fStack_11c4;
          auVar4 = _local_1100;
          uStack_10f0 = auVar70._16_8_;
          uStack_10e8 = auVar4._24_8_;
          local_6c0 = local_1100;
          uStack_6b8 = uStack_10f8;
          uStack_6b0 = uStack_10f0;
          uStack_6a8 = uStack_10e8;
          local_6e0 = local_1100;
          uStack_6d8 = uStack_10f8;
          uStack_6d0 = uStack_10f0;
          uStack_6c8 = uStack_10e8;
          local_11e0 = (float)local_a40 * (float)local_a40;
          fStack_11dc = local_a40._4_4_ * local_a40._4_4_;
          fStack_11d8 = (float)uStack_a38 * (float)uStack_a38;
          fStack_11d4 = uStack_a38._4_4_ * uStack_a38._4_4_;
          fStack_11d0 = (float)uStack_a30 * (float)uStack_a30;
          fStack_11cc = uStack_a30._4_4_ * uStack_a30._4_4_;
          fStack_11c8 = (float)uStack_a28 * (float)uStack_a28;
          local_d40 = 0x3d9021bb3d9021bb;
          uStack_d38 = 0x3d9021bb3d9021bb;
          uStack_d30 = 0x3d9021bb3d9021bb;
          uStack_d28 = 0x3d9021bb3d9021bb;
          local_d60 = local_1100;
          uStack_d58 = uStack_10f8;
          uStack_d50 = uStack_10f0;
          uStack_d48 = uStack_10e8;
          local_d80 = 0xbdebd1b8bdebd1b8;
          uStack_d78 = 0xbdebd1b8bdebd1b8;
          uStack_d70 = 0xbdebd1b8bdebd1b8;
          uStack_d68 = 0xbdebd1b8bdebd1b8;
          local_9c0 = 0x3d9021bb3d9021bb;
          uStack_9b8 = 0x3d9021bb3d9021bb;
          uStack_9b0 = 0x3d9021bb3d9021bb;
          uStack_9a8 = 0x3d9021bb3d9021bb;
          local_9e0 = local_1100;
          uStack_9d8 = uStack_10f8;
          uStack_9d0 = uStack_10f0;
          uStack_9c8 = uStack_10e8;
          local_d00 = (float)local_a40 * 0.070376836;
          fStack_cfc = local_a40._4_4_ * 0.070376836;
          fStack_cf8 = (float)uStack_a38 * 0.070376836;
          fStack_cf4 = uStack_a38._4_4_ * 0.070376836;
          fStack_cf0 = (float)uStack_a30 * 0.070376836;
          fStack_cec = uStack_a30._4_4_ * 0.070376836;
          fStack_ce8 = (float)uStack_a28 * 0.070376836;
          local_d20 = 0xbdebd1b8bdebd1b8;
          uStack_d18 = 0xbdebd1b8bdebd1b8;
          uStack_d10 = 0xbdebd1b8bdebd1b8;
          uStack_d08 = 0xbdebd1b8bdebd1b8;
          local_1200._4_4_ = fStack_cfc + -0.1151461;
          local_1200._0_4_ = local_d00 + -0.1151461;
          uStack_11f8._0_4_ = fStack_cf8 + -0.1151461;
          uStack_11f8._4_4_ = fStack_cf4 + -0.1151461;
          uStack_11f0._0_4_ = fStack_cf0 + -0.1151461;
          uStack_11f0._4_4_ = fStack_cec + -0.1151461;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_ce8 + -0.1151461;
          uStack_11e8._4_4_ = fStack_11c4 + -0.1151461;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_da0 = local_1200;
          uStack_d98 = uStack_11f8;
          uStack_d90 = uStack_11f0;
          uStack_d88 = uStack_11e8;
          local_dc0 = local_1100;
          uStack_db8 = uStack_10f8;
          uStack_db0 = uStack_10f0;
          uStack_da8 = uStack_10e8;
          local_de0 = 0x3def251a3def251a;
          uStack_dd8 = 0x3def251a3def251a;
          uStack_dd0 = 0x3def251a3def251a;
          uStack_dc8 = 0x3def251a3def251a;
          local_980 = local_1200;
          uStack_978 = uStack_11f8;
          uStack_970 = uStack_11f0;
          uStack_968 = uStack_11e8;
          local_9a0 = local_1100;
          uStack_998 = uStack_10f8;
          uStack_990 = uStack_10f0;
          uStack_988 = uStack_10e8;
          local_cc0 = (local_d00 + -0.1151461) * (float)local_a40;
          fStack_cbc = (fStack_cfc + -0.1151461) * local_a40._4_4_;
          fStack_cb8 = (fStack_cf8 + -0.1151461) * (float)uStack_a38;
          fStack_cb4 = (fStack_cf4 + -0.1151461) * uStack_a38._4_4_;
          fStack_cb0 = (fStack_cf0 + -0.1151461) * (float)uStack_a30;
          fStack_cac = (fStack_cec + -0.1151461) * uStack_a30._4_4_;
          fStack_ca8 = (fStack_ce8 + -0.1151461) * (float)uStack_a28;
          local_ce0 = 0x3def251a3def251a;
          uStack_cd8 = 0x3def251a3def251a;
          uStack_cd0 = 0x3def251a3def251a;
          uStack_cc8 = 0x3def251a3def251a;
          local_1200._4_4_ = fStack_cbc + 0.116769984;
          local_1200._0_4_ = local_cc0 + 0.116769984;
          uStack_11f8._0_4_ = fStack_cb8 + 0.116769984;
          uStack_11f8._4_4_ = fStack_cb4 + 0.116769984;
          uStack_11f0._0_4_ = fStack_cb0 + 0.116769984;
          uStack_11f0._4_4_ = fStack_cac + 0.116769984;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_ca8 + 0.116769984;
          uStack_11e8._4_4_ = fStack_11c4 + 0.116769984;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_e00 = local_1200;
          uStack_df8 = uStack_11f8;
          uStack_df0 = uStack_11f0;
          uStack_de8 = uStack_11e8;
          local_e20 = local_1100;
          uStack_e18 = uStack_10f8;
          uStack_e10 = uStack_10f0;
          uStack_e08 = uStack_10e8;
          local_e40 = 0xbdfe5d4fbdfe5d4f;
          uStack_e38 = 0xbdfe5d4fbdfe5d4f;
          uStack_e30 = 0xbdfe5d4fbdfe5d4f;
          uStack_e28 = 0xbdfe5d4fbdfe5d4f;
          local_940 = local_1200;
          uStack_938 = uStack_11f8;
          uStack_930 = uStack_11f0;
          uStack_928 = uStack_11e8;
          local_960 = local_1100;
          uStack_958 = uStack_10f8;
          uStack_950 = uStack_10f0;
          uStack_948 = uStack_10e8;
          local_c80 = (local_cc0 + 0.116769984) * (float)local_a40;
          fStack_c7c = (fStack_cbc + 0.116769984) * local_a40._4_4_;
          fStack_c78 = (fStack_cb8 + 0.116769984) * (float)uStack_a38;
          fStack_c74 = (fStack_cb4 + 0.116769984) * uStack_a38._4_4_;
          fStack_c70 = (fStack_cb0 + 0.116769984) * (float)uStack_a30;
          fStack_c6c = (fStack_cac + 0.116769984) * uStack_a30._4_4_;
          fStack_c68 = (fStack_ca8 + 0.116769984) * (float)uStack_a28;
          local_ca0 = 0xbdfe5d4fbdfe5d4f;
          uStack_c98 = 0xbdfe5d4fbdfe5d4f;
          uStack_c90 = 0xbdfe5d4fbdfe5d4f;
          uStack_c88 = 0xbdfe5d4fbdfe5d4f;
          local_1200._4_4_ = fStack_c7c + -0.12420141;
          local_1200._0_4_ = local_c80 + -0.12420141;
          uStack_11f8._0_4_ = fStack_c78 + -0.12420141;
          uStack_11f8._4_4_ = fStack_c74 + -0.12420141;
          uStack_11f0._0_4_ = fStack_c70 + -0.12420141;
          uStack_11f0._4_4_ = fStack_c6c + -0.12420141;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_c68 + -0.12420141;
          uStack_11e8._4_4_ = fStack_11c4 + -0.12420141;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_e60 = local_1200;
          uStack_e58 = uStack_11f8;
          uStack_e50 = uStack_11f0;
          uStack_e48 = uStack_11e8;
          local_e80 = local_1100;
          uStack_e78 = uStack_10f8;
          uStack_e70 = uStack_10f0;
          uStack_e68 = uStack_10e8;
          local_ea0 = 0x3e11e9bf3e11e9bf;
          uStack_e98 = 0x3e11e9bf3e11e9bf;
          uStack_e90 = 0x3e11e9bf3e11e9bf;
          uStack_e88 = 0x3e11e9bf3e11e9bf;
          local_900 = local_1200;
          uStack_8f8 = uStack_11f8;
          uStack_8f0 = uStack_11f0;
          uStack_8e8 = uStack_11e8;
          local_920 = local_1100;
          uStack_918 = uStack_10f8;
          uStack_910 = uStack_10f0;
          uStack_908 = uStack_10e8;
          local_c40 = (local_c80 + -0.12420141) * (float)local_a40;
          fStack_c3c = (fStack_c7c + -0.12420141) * local_a40._4_4_;
          fStack_c38 = (fStack_c78 + -0.12420141) * (float)uStack_a38;
          fStack_c34 = (fStack_c74 + -0.12420141) * uStack_a38._4_4_;
          fStack_c30 = (fStack_c70 + -0.12420141) * (float)uStack_a30;
          fStack_c2c = (fStack_c6c + -0.12420141) * uStack_a30._4_4_;
          fStack_c28 = (fStack_c68 + -0.12420141) * (float)uStack_a28;
          local_c60 = 0x3e11e9bf3e11e9bf;
          uStack_c58 = 0x3e11e9bf3e11e9bf;
          uStack_c50 = 0x3e11e9bf3e11e9bf;
          uStack_c48 = 0x3e11e9bf3e11e9bf;
          local_1200._4_4_ = fStack_c3c + 0.14249323;
          local_1200._0_4_ = local_c40 + 0.14249323;
          uStack_11f8._0_4_ = fStack_c38 + 0.14249323;
          uStack_11f8._4_4_ = fStack_c34 + 0.14249323;
          uStack_11f0._0_4_ = fStack_c30 + 0.14249323;
          uStack_11f0._4_4_ = fStack_c2c + 0.14249323;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_c28 + 0.14249323;
          uStack_11e8._4_4_ = fStack_11c4 + 0.14249323;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_ec0 = local_1200;
          uStack_eb8 = uStack_11f8;
          uStack_eb0 = uStack_11f0;
          uStack_ea8 = uStack_11e8;
          local_ee0 = local_1100;
          uStack_ed8 = uStack_10f8;
          uStack_ed0 = uStack_10f0;
          uStack_ec8 = uStack_10e8;
          local_f00 = 0xbe2aae50be2aae50;
          uStack_ef8 = 0xbe2aae50be2aae50;
          uStack_ef0 = 0xbe2aae50be2aae50;
          uStack_ee8 = 0xbe2aae50be2aae50;
          local_8c0 = local_1200;
          uStack_8b8 = uStack_11f8;
          uStack_8b0 = uStack_11f0;
          uStack_8a8 = uStack_11e8;
          local_8e0 = local_1100;
          uStack_8d8 = uStack_10f8;
          uStack_8d0 = uStack_10f0;
          uStack_8c8 = uStack_10e8;
          local_c00 = (local_c40 + 0.14249323) * (float)local_a40;
          fStack_bfc = (fStack_c3c + 0.14249323) * local_a40._4_4_;
          fStack_bf8 = (fStack_c38 + 0.14249323) * (float)uStack_a38;
          fStack_bf4 = (fStack_c34 + 0.14249323) * uStack_a38._4_4_;
          fStack_bf0 = (fStack_c30 + 0.14249323) * (float)uStack_a30;
          fStack_bec = (fStack_c2c + 0.14249323) * uStack_a30._4_4_;
          fStack_be8 = (fStack_c28 + 0.14249323) * (float)uStack_a28;
          local_c20 = 0xbe2aae50be2aae50;
          uStack_c18 = 0xbe2aae50be2aae50;
          uStack_c10 = 0xbe2aae50be2aae50;
          uStack_c08 = 0xbe2aae50be2aae50;
          local_1200._4_4_ = fStack_bfc + -0.16668057;
          local_1200._0_4_ = local_c00 + -0.16668057;
          uStack_11f8._0_4_ = fStack_bf8 + -0.16668057;
          uStack_11f8._4_4_ = fStack_bf4 + -0.16668057;
          uStack_11f0._0_4_ = fStack_bf0 + -0.16668057;
          uStack_11f0._4_4_ = fStack_bec + -0.16668057;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_be8 + -0.16668057;
          uStack_11e8._4_4_ = fStack_11c4 + -0.16668057;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_f20 = local_1200;
          uStack_f18 = uStack_11f8;
          uStack_f10 = uStack_11f0;
          uStack_f08 = uStack_11e8;
          local_f40 = local_1100;
          uStack_f38 = uStack_10f8;
          uStack_f30 = uStack_10f0;
          uStack_f28 = uStack_10e8;
          local_f60 = 0x3e4cceac3e4cceac;
          uStack_f58 = 0x3e4cceac3e4cceac;
          uStack_f50 = 0x3e4cceac3e4cceac;
          uStack_f48 = 0x3e4cceac3e4cceac;
          local_880 = local_1200;
          uStack_878 = uStack_11f8;
          uStack_870 = uStack_11f0;
          uStack_868 = uStack_11e8;
          local_8a0 = local_1100;
          uStack_898 = uStack_10f8;
          uStack_890 = uStack_10f0;
          uStack_888 = uStack_10e8;
          local_bc0 = (local_c00 + -0.16668057) * (float)local_a40;
          fStack_bbc = (fStack_bfc + -0.16668057) * local_a40._4_4_;
          fStack_bb8 = (fStack_bf8 + -0.16668057) * (float)uStack_a38;
          fStack_bb4 = (fStack_bf4 + -0.16668057) * uStack_a38._4_4_;
          fStack_bb0 = (fStack_bf0 + -0.16668057) * (float)uStack_a30;
          fStack_bac = (fStack_bec + -0.16668057) * uStack_a30._4_4_;
          fStack_ba8 = (fStack_be8 + -0.16668057) * (float)uStack_a28;
          local_be0 = 0x3e4cceac3e4cceac;
          uStack_bd8 = 0x3e4cceac3e4cceac;
          uStack_bd0 = 0x3e4cceac3e4cceac;
          uStack_bc8 = 0x3e4cceac3e4cceac;
          local_1200._4_4_ = fStack_bbc + 0.20000714;
          local_1200._0_4_ = local_bc0 + 0.20000714;
          uStack_11f8._0_4_ = fStack_bb8 + 0.20000714;
          uStack_11f8._4_4_ = fStack_bb4 + 0.20000714;
          uStack_11f0._0_4_ = fStack_bb0 + 0.20000714;
          uStack_11f0._4_4_ = fStack_bac + 0.20000714;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_ba8 + 0.20000714;
          uStack_11e8._4_4_ = fStack_11c4 + 0.20000714;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_f80 = local_1200;
          uStack_f78 = uStack_11f8;
          uStack_f70 = uStack_11f0;
          uStack_f68 = uStack_11e8;
          local_fa0 = local_1100;
          uStack_f98 = uStack_10f8;
          uStack_f90 = uStack_10f0;
          uStack_f88 = uStack_10e8;
          local_fc0 = 0xbe7ffffcbe7ffffc;
          uStack_fb8 = 0xbe7ffffcbe7ffffc;
          uStack_fb0 = 0xbe7ffffcbe7ffffc;
          uStack_fa8 = 0xbe7ffffcbe7ffffc;
          local_840 = local_1200;
          uStack_838 = uStack_11f8;
          uStack_830 = uStack_11f0;
          uStack_828 = uStack_11e8;
          local_860 = local_1100;
          uStack_858 = uStack_10f8;
          uStack_850 = uStack_10f0;
          uStack_848 = uStack_10e8;
          local_b80 = (local_bc0 + 0.20000714) * (float)local_a40;
          fStack_b7c = (fStack_bbc + 0.20000714) * local_a40._4_4_;
          fStack_b78 = (fStack_bb8 + 0.20000714) * (float)uStack_a38;
          fStack_b74 = (fStack_bb4 + 0.20000714) * uStack_a38._4_4_;
          fStack_b70 = (fStack_bb0 + 0.20000714) * (float)uStack_a30;
          fStack_b6c = (fStack_bac + 0.20000714) * uStack_a30._4_4_;
          fStack_b68 = (fStack_ba8 + 0.20000714) * (float)uStack_a28;
          local_ba0 = 0xbe7ffffcbe7ffffc;
          uStack_b98 = 0xbe7ffffcbe7ffffc;
          uStack_b90 = 0xbe7ffffcbe7ffffc;
          uStack_b88 = 0xbe7ffffcbe7ffffc;
          local_1200._4_4_ = fStack_b7c + -0.24999994;
          local_1200._0_4_ = local_b80 + -0.24999994;
          uStack_11f8._0_4_ = fStack_b78 + -0.24999994;
          uStack_11f8._4_4_ = fStack_b74 + -0.24999994;
          uStack_11f0._0_4_ = fStack_b70 + -0.24999994;
          uStack_11f0._4_4_ = fStack_b6c + -0.24999994;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_b68 + -0.24999994;
          uStack_11e8._4_4_ = fStack_11c4 + -0.24999994;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_fe0 = local_1200;
          uStack_fd8 = uStack_11f8;
          uStack_fd0 = uStack_11f0;
          uStack_fc8 = uStack_11e8;
          local_1000 = local_1100;
          uStack_ff8 = uStack_10f8;
          uStack_ff0 = uStack_10f0;
          uStack_fe8 = uStack_10e8;
          local_1020 = 0x3eaaaaaa3eaaaaaa;
          uStack_1018 = 0x3eaaaaaa3eaaaaaa;
          uStack_1010 = 0x3eaaaaaa3eaaaaaa;
          uStack_1008 = 0x3eaaaaaa3eaaaaaa;
          local_800 = local_1200;
          uStack_7f8 = uStack_11f8;
          uStack_7f0 = uStack_11f0;
          uStack_7e8 = uStack_11e8;
          local_820 = local_1100;
          uStack_818 = uStack_10f8;
          uStack_810 = uStack_10f0;
          uStack_808 = uStack_10e8;
          local_b40 = (local_b80 + -0.24999994) * (float)local_a40;
          fStack_b3c = (fStack_b7c + -0.24999994) * local_a40._4_4_;
          fStack_b38 = (fStack_b78 + -0.24999994) * (float)uStack_a38;
          fStack_b34 = (fStack_b74 + -0.24999994) * uStack_a38._4_4_;
          fStack_b30 = (fStack_b70 + -0.24999994) * (float)uStack_a30;
          fStack_b2c = (fStack_b6c + -0.24999994) * uStack_a30._4_4_;
          fStack_b28 = (fStack_b68 + -0.24999994) * (float)uStack_a28;
          local_b60 = 0x3eaaaaaa3eaaaaaa;
          uStack_b58 = 0x3eaaaaaa3eaaaaaa;
          uStack_b50 = 0x3eaaaaaa3eaaaaaa;
          uStack_b48 = 0x3eaaaaaa3eaaaaaa;
          fVar144 = fStack_11c4 + 0.3333333;
          local_1200._4_4_ = fStack_b3c + 0.3333333;
          local_1200._0_4_ = local_b40 + 0.3333333;
          uStack_11f8._0_4_ = fStack_b38 + 0.3333333;
          uStack_11f8._4_4_ = fStack_b34 + 0.3333333;
          uStack_11f0._0_4_ = fStack_b30 + 0.3333333;
          uStack_11f0._4_4_ = fStack_b2c + 0.3333333;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_b28 + 0.3333333;
          uStack_11e8._4_4_ = fVar144;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_700 = local_1200;
          uStack_6f8 = uStack_11f8;
          uStack_6f0 = uStack_11f0;
          uStack_6e8 = uStack_11e8;
          local_720 = local_1100;
          uStack_718 = uStack_10f8;
          uStack_710 = uStack_10f0;
          uStack_708 = uStack_10e8;
          local_1200._0_4_ = (local_b40 + 0.3333333) * (float)local_a40;
          local_1200._4_4_ = (fStack_b3c + 0.3333333) * local_a40._4_4_;
          fVar147 = (fStack_b38 + 0.3333333) * (float)uStack_a38;
          fVar136 = (fStack_b34 + 0.3333333) * uStack_a38._4_4_;
          fVar138 = (fStack_b30 + 0.3333333) * (float)uStack_a30;
          fVar140 = (fStack_b2c + 0.3333333) * uStack_a30._4_4_;
          fVar142 = (fStack_b28 + 0.3333333) * (float)uStack_a28;
          uStack_11f8._0_4_ = fVar147;
          uStack_11f8._4_4_ = fVar136;
          uStack_11f0._0_4_ = fVar138;
          uStack_11f0._4_4_ = fVar140;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fVar142;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_760 = CONCAT44(fStack_11dc,local_11e0);
          uStack_758 = CONCAT44(fStack_11d4,fStack_11d8);
          uStack_750 = CONCAT44(fStack_11cc,fStack_11d0);
          uStack_748 = CONCAT44(fStack_11c4,fStack_11c8);
          local_740 = local_1200;
          uStack_738 = uStack_11f8;
          uStack_730 = uStack_11f0;
          uStack_728 = uStack_11e8;
          local_1200._0_4_ = (float)local_1200._0_4_ * local_11e0;
          local_1200._4_4_ = (float)local_1200._4_4_ * fStack_11dc;
          fVar147 = fVar147 * fStack_11d8;
          fVar136 = fVar136 * fStack_11d4;
          fVar138 = fVar138 * fStack_11d0;
          fVar140 = fVar140 * fStack_11cc;
          fVar142 = fVar142 * fStack_11c8;
          uStack_11f8._0_4_ = fVar147;
          uStack_11f8._4_4_ = fVar136;
          uStack_11f0._0_4_ = fVar138;
          uStack_11f0._4_4_ = fVar140;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fVar142;
          auVar4 = _local_1200;
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_1040 = local_1180;
          uStack_1038 = uStack_1178;
          uStack_1030 = uStack_1170;
          uStack_1028 = uStack_1168;
          local_1060 = 0xb95e8083b95e8083;
          uStack_1058 = 0xb95e8083b95e8083;
          uStack_1050 = 0xb95e8083b95e8083;
          uStack_1048 = 0xb95e8083b95e8083;
          local_1080 = local_1200;
          uStack_1078 = uStack_11f8;
          uStack_1070 = uStack_11f0;
          uStack_1068 = uStack_11e8;
          local_7c0 = local_1180;
          uVar129 = local_7c0;
          uStack_7b8 = uStack_1178;
          uVar130 = uStack_7b8;
          uStack_7b0 = uStack_1170;
          uVar131 = uStack_7b0;
          uStack_7a8 = uStack_1168;
          uVar112 = uStack_7a8;
          local_7e0 = 0xb95e8083b95e8083;
          uStack_7d8 = 0xb95e8083b95e8083;
          uStack_7d0 = 0xb95e8083b95e8083;
          uStack_7c8 = 0xb95e8083b95e8083;
          local_7c0._0_4_ = local_1180._0_4_;
          local_7c0._4_4_ = local_1180._4_4_;
          uStack_7b8._0_4_ = local_1180._8_4_;
          uStack_7b8._4_4_ = local_1180._12_4_;
          uStack_7b0._0_4_ = local_1180._16_4_;
          uStack_7b0._4_4_ = local_1180._20_4_;
          uStack_7a8._0_4_ = local_1180._24_4_;
          local_b00 = (float)local_7c0 * -0.00021219444;
          fStack_afc = local_7c0._4_4_ * -0.00021219444;
          fStack_af8 = (float)uStack_7b8 * -0.00021219444;
          fStack_af4 = uStack_7b8._4_4_ * -0.00021219444;
          fStack_af0 = (float)uStack_7b0 * -0.00021219444;
          fStack_aec = uStack_7b0._4_4_ * -0.00021219444;
          fStack_ae8 = (float)uStack_7a8 * -0.00021219444;
          uStack_ae4 = 0xb95e8083;
          local_b20 = local_1200;
          uStack_b18 = uStack_11f8;
          uStack_b10 = uStack_11f0;
          uStack_b08 = uStack_11e8;
          local_1200._4_4_ = fStack_afc + (float)local_1200._4_4_;
          local_1200._0_4_ = local_b00 + (float)local_1200._0_4_;
          uStack_11f8._0_4_ = fStack_af8 + fVar147;
          uStack_11f8._4_4_ = fStack_af4 + fVar136;
          uStack_11f0._0_4_ = fStack_af0 + fVar138;
          uStack_11f0._4_4_ = fStack_aec + fVar140;
          auVar70 = _local_1200;
          uStack_11e8._0_4_ = fStack_ae8 + fVar142;
          uStack_11e8._4_4_ = fVar144 + -0.00021219444;
          auVar4 = _local_1200;
          local_4c0 = CONCAT44(fStack_11dc,local_11e0);
          uStack_4b8 = CONCAT44(fStack_11d4,fStack_11d8);
          uStack_4b0 = CONCAT44(fStack_11cc,fStack_11d0);
          uStack_4a8 = CONCAT44(fStack_11c4,fStack_11c8);
          uStack_11f0 = auVar70._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_4e0 = 0x3f0000003f000000;
          uStack_4d8 = 0x3f0000003f000000;
          uStack_4d0 = 0x3f0000003f000000;
          uStack_4c8 = 0x3f0000003f000000;
          local_500 = local_1200;
          uStack_4f8 = uStack_11f8;
          uStack_4f0 = uStack_11f0;
          uStack_4e8 = uStack_11e8;
          local_4a0 = 0x3f0000003f000000;
          uStack_498 = 0x3f0000003f000000;
          uStack_490 = 0x3f0000003f000000;
          uStack_488 = 0x3f0000003f000000;
          local_460 = local_11e0 * 0.5;
          fStack_45c = fStack_11dc * 0.5;
          fStack_458 = fStack_11d8 * 0.5;
          fStack_454 = fStack_11d4 * 0.5;
          fStack_450 = fStack_11d0 * 0.5;
          fStack_44c = fStack_11cc * 0.5;
          fStack_448 = fStack_11c8 * 0.5;
          local_440 = local_1200;
          uStack_438 = uStack_11f8;
          uStack_430 = uStack_11f0;
          uStack_428 = uStack_11e8;
          auVar56._16_8_ = uStack_11f0;
          auVar56._0_16_ = _local_1200;
          auVar56._24_8_ = uStack_11e8;
          auVar55._4_4_ = fStack_45c;
          auVar55._0_4_ = local_460;
          auVar55._8_4_ = fStack_458;
          auVar55._12_4_ = fStack_454;
          auVar55._16_4_ = fStack_450;
          auVar55._20_4_ = fStack_44c;
          auVar55._24_4_ = fStack_448;
          auVar55._28_4_ = fStack_11c4;
          auVar4 = vsubps_avx(auVar56,auVar55);
          local_1200 = auVar4._0_8_;
          uStack_11f8 = auVar4._8_8_;
          uStack_11f0 = auVar4._16_8_;
          uStack_11e8 = auVar4._24_8_;
          local_a80 = local_1100;
          uStack_a78 = uStack_10f8;
          uStack_a70 = uStack_10f0;
          uStack_a68 = uStack_10e8;
          local_aa0 = local_1200;
          uVar113 = local_aa0;
          uStack_a98 = uStack_11f8;
          uVar114 = uStack_a98;
          uStack_a90 = uStack_11f0;
          uVar115 = uStack_a90;
          uStack_a88 = uStack_11e8;
          uVar116 = uStack_a88;
          local_aa0._0_4_ = auVar4._0_4_;
          local_aa0._4_4_ = auVar4._4_4_;
          uStack_a98._0_4_ = auVar4._8_4_;
          uStack_a98._4_4_ = auVar4._12_4_;
          uStack_a90._0_4_ = auVar4._16_4_;
          uStack_a90._4_4_ = auVar4._20_4_;
          uStack_a88._0_4_ = auVar4._24_4_;
          uStack_a88._4_4_ = auVar4._28_4_;
          local_1100._4_4_ = local_a40._4_4_ + local_aa0._4_4_;
          local_1100._0_4_ = (float)local_a40 + (float)local_aa0;
          uStack_10f8._0_4_ = (float)uStack_a38 + (float)uStack_a98;
          uStack_10f8._4_4_ = uStack_a38._4_4_ + uStack_a98._4_4_;
          uStack_10f0._0_4_ = (float)uStack_a30 + (float)uStack_a90;
          uStack_10f0._4_4_ = uStack_a30._4_4_ + uStack_a90._4_4_;
          auVar70 = _local_1100;
          uStack_10e8._0_4_ = (float)uStack_a28 + (float)uStack_a88;
          uStack_10e8._4_4_ = fStack_11c4 + uStack_a88._4_4_;
          auVar4 = _local_1100;
          uStack_10f0 = auVar70._16_8_;
          uStack_10e8 = auVar4._24_8_;
          local_10a0 = local_1180;
          uStack_1098 = uStack_1178;
          uStack_1090 = uStack_1170;
          uStack_1088 = uStack_1168;
          local_10c0 = 0x3f3180003f318000;
          uStack_10b8 = 0x3f3180003f318000;
          uStack_10b0 = 0x3f3180003f318000;
          uStack_10a8 = 0x3f3180003f318000;
          local_10e0 = local_1100;
          uStack_10d8 = uStack_10f8;
          uStack_10d0 = uStack_10f0;
          uStack_10c8 = uStack_10e8;
          uStack_1088._4_4_ = local_1180._28_4_;
          local_780 = (float)local_7c0;
          fStack_77c = local_7c0._4_4_;
          fStack_778 = (float)uStack_7b8;
          fStack_774 = uStack_7b8._4_4_;
          fStack_770 = (float)uStack_7b0;
          fStack_76c = uStack_7b0._4_4_;
          fStack_768 = (float)uStack_7a8;
          fStack_764 = uStack_1088._4_4_;
          local_7a0 = 0x3f3180003f318000;
          uStack_798 = 0x3f3180003f318000;
          uStack_790 = 0x3f3180003f318000;
          uStack_788 = 0x3f3180003f318000;
          local_ac0 = (float)local_7c0 * 0.6933594;
          fStack_abc = local_7c0._4_4_ * 0.6933594;
          fStack_ab8 = (float)uStack_7b8 * 0.6933594;
          fStack_ab4 = uStack_7b8._4_4_ * 0.6933594;
          fStack_ab0 = (float)uStack_7b0 * 0.6933594;
          fStack_aac = uStack_7b0._4_4_ * 0.6933594;
          fStack_aa8 = (float)uStack_7a8 * 0.6933594;
          fStack_aa4 = uStack_1088._4_4_;
          local_ae0 = local_1100;
          uStack_ad8 = uStack_10f8;
          uStack_ad0 = uStack_10f0;
          uStack_ac8 = uStack_10e8;
          local_1100._4_4_ = fStack_abc + local_a40._4_4_ + local_aa0._4_4_;
          local_1100._0_4_ = local_ac0 + (float)local_a40 + (float)local_aa0;
          uStack_10f8._0_4_ = fStack_ab8 + (float)uStack_a38 + (float)uStack_a98;
          uStack_10f8._4_4_ = fStack_ab4 + uStack_a38._4_4_ + uStack_a98._4_4_;
          uStack_10f0._0_4_ = fStack_ab0 + (float)uStack_a30 + (float)uStack_a90;
          uStack_10f0._4_4_ = fStack_aac + uStack_a30._4_4_ + uStack_a90._4_4_;
          auVar70 = _local_1100;
          uStack_10e8._0_4_ = fStack_aa8 + (float)uStack_a28 + (float)uStack_a88;
          uStack_10e8._4_4_ = uStack_1088._4_4_ + fStack_11c4 + uStack_a88._4_4_;
          auVar20 = _local_1100;
          uStack_10f0 = auVar70._16_8_;
          uStack_10e8 = auVar20._24_8_;
          local_320 = local_1100;
          uStack_318 = uStack_10f8;
          uStack_310 = uStack_10f0;
          uStack_308 = uStack_10e8;
          local_340 = local_1160._0_8_;
          uStack_338 = local_1160._8_8_;
          uStack_330 = local_1160._16_8_;
          uStack_328 = local_1160._24_8_;
          auVar57._16_8_ = uStack_10f0;
          auVar57._0_16_ = _local_1100;
          auVar57._24_8_ = uStack_10e8;
          _local_1200 = vorps_avx(auVar57,local_1160);
          local_2240 = local_1200;
          uStack_2238 = uStack_11f8;
          uStack_2230 = uStack_11f0;
          uStack_2228 = uStack_11e8;
          local_2184 = 0x3f800000;
          local_2104 = 0x3f800000;
          local_2108 = 0x3f800000;
          local_210c = 0x3f800000;
          local_2110 = 0x3f800000;
          local_2114 = 0x3f800000;
          local_2118 = 0x3f800000;
          local_211c = 0x3f800000;
          local_2120 = 0x3f800000;
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          local_2140 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          auStack_2130 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          local_2260 = local_2140._0_8_;
          uStack_2258 = local_2140._8_8_;
          uStack_2250 = auStack_2130._0_8_;
          uStack_2248 = auStack_2130._8_8_;
          local_2188 = 0x40000000;
          local_20c4 = 0x40000000;
          local_20c8 = 0x40000000;
          local_20cc = 0x40000000;
          local_20d0 = 0x40000000;
          local_20d4 = 0x40000000;
          local_20d8 = 0x40000000;
          local_20dc = 0x40000000;
          local_20e0 = 0x40000000;
          auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
          local_2100 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0x40000000),ZEXT416(0x40000000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x20);
          auStack_20f0 = vinsertps_avx(auVar2,ZEXT416(0x40000000),0x30);
          local_2280 = local_2100._0_8_;
          uStack_2278 = local_2100._8_8_;
          uStack_2270 = auStack_20f0._0_8_;
          uStack_2268 = auStack_20f0._8_8_;
          local_21c0 = local_1200;
          uVar88 = local_21c0;
          uStack_21b8 = uStack_11f8;
          uVar89 = uStack_21b8;
          uStack_21b0 = uStack_11f0;
          uVar90 = uStack_21b0;
          uStack_21a8 = uStack_11e8;
          uVar91 = uStack_21a8;
          local_21e0 = local_2100._0_8_;
          uVar84 = local_21e0;
          uStack_21d8 = local_2100._8_8_;
          uVar85 = uStack_21d8;
          uStack_21d0 = auStack_20f0._0_8_;
          uVar86 = uStack_21d0;
          uStack_21c8 = auStack_20f0._8_8_;
          uVar87 = uStack_21c8;
          local_21c0._0_4_ = local_1200._0_4_;
          local_21c0._4_4_ = local_1200._4_4_;
          uStack_21b8._0_4_ = local_1200._8_4_;
          uStack_21b8._4_4_ = local_1200._12_4_;
          uStack_21b0._0_4_ = local_1200._16_4_;
          uStack_21b0._4_4_ = local_1200._20_4_;
          uStack_21a8._0_4_ = local_1200._24_4_;
          uStack_21a8._4_4_ = local_1200._28_4_;
          local_21e0._0_4_ = local_2100._0_4_;
          local_21e0._4_4_ = local_2100._4_4_;
          uStack_21d8._0_4_ = local_2100._8_4_;
          uStack_21d8._4_4_ = local_2100._12_4_;
          uStack_21d0._0_4_ = auStack_20f0._0_4_;
          uStack_21d0._4_4_ = auStack_20f0._4_4_;
          uStack_21c8._0_4_ = auStack_20f0._8_4_;
          local_20a0 = (float)local_21c0 * (float)local_21e0;
          fStack_209c = local_21c0._4_4_ * local_21e0._4_4_;
          fStack_2098 = (float)uStack_21b8 * (float)uStack_21d8;
          fStack_2094 = uStack_21b8._4_4_ * uStack_21d8._4_4_;
          fStack_2090 = (float)uStack_21b0 * (float)uStack_21d0;
          fStack_208c = uStack_21b0._4_4_ * uStack_21d0._4_4_;
          fStack_2088 = (float)uStack_21a8 * (float)uStack_21c8;
          uStack_2084 = uStack_21a8._4_4_;
          local_2024 = 0x3f800000;
          local_1fa4 = 0x3f800000;
          local_1fa8 = 0x3f800000;
          local_1fac = 0x3f800000;
          local_1fb0 = 0x3f800000;
          local_1fb4 = 0x3f800000;
          local_1fb8 = 0x3f800000;
          local_1fbc = 0x3f800000;
          local_1fc0 = 0x3f800000;
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          local_1fe0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          auStack_1fd0 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          local_20c0 = local_1fe0._0_8_;
          uStack_20b8 = local_1fe0._8_8_;
          uStack_20b0 = auStack_1fd0._0_8_;
          uStack_20a8 = auStack_1fd0._8_8_;
          local_1720 = ZEXT832(0) << 0x20;
          local_1fa0._8_8_ = SUB328(ZEXT832(0),4);
          local_2020 = CONCAT44(fStack_209c,local_20a0);
          uStack_2018 = CONCAT44(fStack_2094,fStack_2098);
          uStack_2010 = CONCAT44(fStack_208c,fStack_2090);
          uStack_2008 = CONCAT44(uStack_21a8._4_4_,fStack_2088);
          local_2000 = 0;
          uStack_1ff8 = local_1fa0._8_8_;
          uStack_1ff0 = 0;
          uStack_1fe8 = 0;
          auVar37._8_8_ = uStack_2018;
          auVar37._0_8_ = local_2020;
          auVar37._16_8_ = uStack_2010;
          auVar37._24_8_ = uStack_2008;
          auVar4 = vsubps_avx(ZEXT832((ulong)local_1fa0._8_8_) << 0x40,auVar37);
          local_1ee0 = 0x3f8000003f800000;
          uStack_1ed8 = 0x3f8000003f800000;
          uStack_1ed0 = 0x3f8000003f800000;
          uStack_1ec8 = 0x3f8000003f800000;
          local_1e60._0_8_ = auVar4._0_8_;
          local_1e60._8_8_ = auVar4._8_8_;
          local_1e60._16_8_ = auVar4._16_8_;
          local_1e60._24_8_ = auVar4._24_8_;
          local_16a0 = local_1e60._0_8_;
          uStack_1698 = local_1e60._8_8_;
          uStack_1690 = local_1e60._16_8_;
          uStack_1688 = local_1e60._24_8_;
          local_16c0 = 0x42b0c0a542b0c0a5;
          uStack_16b8 = 0x42b0c0a542b0c0a5;
          uStack_16b0 = 0x42b0c0a542b0c0a5;
          uStack_16a8 = 0x42b0c0a542b0c0a5;
          auVar41._8_8_ = 0x42b0c0a542b0c0a5;
          auVar41._0_8_ = 0x42b0c0a542b0c0a5;
          auVar41._16_8_ = 0x42b0c0a542b0c0a5;
          auVar41._24_8_ = 0x42b0c0a542b0c0a5;
          auVar4 = vminps_avx(auVar4,auVar41);
          local_1e60._0_8_ = auVar4._0_8_;
          local_1e60._8_8_ = auVar4._8_8_;
          local_1e60._16_8_ = auVar4._16_8_;
          local_1e60._24_8_ = auVar4._24_8_;
          local_16e0 = local_1e60._0_8_;
          uStack_16d8 = local_1e60._8_8_;
          uStack_16d0 = local_1e60._16_8_;
          uStack_16c8 = local_1e60._24_8_;
          local_1700 = 0xc2b0c0a5c2b0c0a5;
          uStack_16f8 = 0xc2b0c0a5c2b0c0a5;
          uStack_16f0 = 0xc2b0c0a5c2b0c0a5;
          uStack_16e8 = 0xc2b0c0a5c2b0c0a5;
          auVar40._8_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._16_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar40._24_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar3 = vmaxps_avx(auVar4,auVar40);
          local_1e60._0_8_ = auVar3._0_8_;
          local_1e60._8_8_ = auVar3._8_8_;
          local_1e60._16_8_ = auVar3._16_8_;
          local_1e60._24_8_ = auVar3._24_8_;
          local_1bc0 = local_1e60._0_8_;
          uStack_1bb8 = local_1e60._8_8_;
          uStack_1bb0 = local_1e60._16_8_;
          uStack_1ba8 = local_1e60._24_8_;
          local_1be0 = 0x3fb8aa3b3fb8aa3b;
          uStack_1bd8 = 0x3fb8aa3b3fb8aa3b;
          uStack_1bd0 = 0x3fb8aa3b3fb8aa3b;
          uStack_1bc8 = 0x3fb8aa3b3fb8aa3b;
          local_1c00 = 0x3f0000003f000000;
          uStack_1bf8 = 0x3f0000003f000000;
          uStack_1bf0 = 0x3f0000003f000000;
          uStack_1be8 = 0x3f0000003f000000;
          local_1980 = local_1e60._0_8_;
          uVar96 = local_1980;
          uStack_1978 = local_1e60._8_8_;
          uVar97 = uStack_1978;
          uStack_1970 = local_1e60._16_8_;
          uVar98 = uStack_1970;
          uStack_1968 = local_1e60._24_8_;
          uVar99 = uStack_1968;
          local_19a0 = 0x3fb8aa3b3fb8aa3b;
          uStack_1998 = 0x3fb8aa3b3fb8aa3b;
          uStack_1990 = 0x3fb8aa3b3fb8aa3b;
          uStack_1988 = 0x3fb8aa3b3fb8aa3b;
          local_1980._0_4_ = auVar3._0_4_;
          local_1980._4_4_ = auVar3._4_4_;
          uStack_1978._0_4_ = auVar3._8_4_;
          uStack_1978._4_4_ = auVar3._12_4_;
          uStack_1970._0_4_ = auVar3._16_4_;
          uStack_1970._4_4_ = auVar3._20_4_;
          uStack_1968._0_4_ = auVar3._24_4_;
          local_1b80 = (float)local_1980 * 1.442695;
          fStack_1b7c = local_1980._4_4_ * 1.442695;
          fStack_1b78 = (float)uStack_1978 * 1.442695;
          fStack_1b74 = uStack_1978._4_4_ * 1.442695;
          fStack_1b70 = (float)uStack_1970 * 1.442695;
          fStack_1b6c = uStack_1970._4_4_ * 1.442695;
          fStack_1b68 = (float)uStack_1968 * 1.442695;
          uStack_1b64 = 0x3fb8aa3b;
          local_1ba0 = 0x3f0000003f000000;
          uStack_1b98 = 0x3f0000003f000000;
          uStack_1b90 = 0x3f0000003f000000;
          uStack_1b88 = 0x3f0000003f000000;
          local_1ea0._4_4_ = fStack_1b7c + 0.5;
          local_1ea0._0_4_ = local_1b80 + 0.5;
          uStack_1e98._0_4_ = fStack_1b78 + 0.5;
          uStack_1e98._4_4_ = fStack_1b74 + 0.5;
          uStack_1e90._0_4_ = fStack_1b70 + 0.5;
          uStack_1e90._4_4_ = fStack_1b6c + 0.5;
          uStack_1e88._0_4_ = fStack_1b68 + 0.5;
          uStack_1e88._4_4_ = 0x3ff8aa3b;
          auVar5 = vroundps_avx(_local_1ea0,1);
          auVar4 = vcmpps_avx(_local_1ea0,auVar5,1);
          local_1f00._0_8_ = auVar4._0_8_;
          local_1f00._8_8_ = auVar4._8_8_;
          local_1f00._16_8_ = auVar4._16_8_;
          local_1f00._24_8_ = auVar4._24_8_;
          local_1660 = local_1f00._0_8_;
          uStack_1658 = local_1f00._8_8_;
          uStack_1650 = local_1f00._16_8_;
          uStack_1648 = local_1f00._24_8_;
          local_1680 = 0x3f8000003f800000;
          uStack_1678 = 0x3f8000003f800000;
          uStack_1670 = 0x3f8000003f800000;
          uStack_1668 = 0x3f8000003f800000;
          auVar42._8_8_ = 0x3f8000003f800000;
          auVar42._0_8_ = 0x3f8000003f800000;
          auVar42._16_8_ = 0x3f8000003f800000;
          auVar42._24_8_ = 0x3f8000003f800000;
          local_1f00 = vandps_avx(auVar4,auVar42);
          local_1e80 = auVar5._0_8_;
          uStack_1e78 = auVar5._8_8_;
          uStack_1e70 = auVar5._16_8_;
          uStack_1e68 = auVar5._24_8_;
          local_1740 = local_1e80;
          uStack_1738 = uStack_1e78;
          uStack_1730 = uStack_1e70;
          uStack_1728 = uStack_1e68;
          local_1760 = local_1f00._0_8_;
          uStack_1758 = local_1f00._8_8_;
          uStack_1750 = local_1f00._16_8_;
          uStack_1748 = local_1f00._24_8_;
          _local_1ea0 = vsubps_avx(auVar5,local_1f00);
          local_1520 = local_1ea0;
          uStack_1518 = uStack_1e98;
          uStack_1510 = uStack_1e90;
          uStack_1508 = uStack_1e88;
          local_1540 = 0x3f3180003f318000;
          uStack_1538 = 0x3f3180003f318000;
          uStack_1530 = 0x3f3180003f318000;
          uStack_1528 = 0x3f3180003f318000;
          local_1560 = local_1e60._0_8_;
          uStack_1558 = local_1e60._8_8_;
          uStack_1550 = local_1e60._16_8_;
          uStack_1548 = local_1e60._24_8_;
          local_14e0 = local_1ea0;
          uVar108 = local_14e0;
          uStack_14d8 = uStack_1e98;
          uVar109 = uStack_14d8;
          uStack_14d0 = uStack_1e90;
          uVar110 = uStack_14d0;
          uStack_14c8 = uStack_1e88;
          uVar111 = uStack_14c8;
          local_1500 = 0x3f3180003f318000;
          uStack_14f8 = 0x3f3180003f318000;
          uStack_14f0 = 0x3f3180003f318000;
          uStack_14e8 = 0x3f3180003f318000;
          local_14e0._0_4_ = local_1ea0._0_4_;
          local_14e0._4_4_ = local_1ea0._4_4_;
          uStack_14d8._0_4_ = local_1ea0._8_4_;
          uStack_14d8._4_4_ = local_1ea0._12_4_;
          uStack_14d0._0_4_ = local_1ea0._16_4_;
          uStack_14d0._4_4_ = local_1ea0._20_4_;
          uStack_14c8._0_4_ = local_1ea0._24_4_;
          uStack_14c8._4_4_ = local_1ea0._28_4_;
          local_14c0 = (float)local_14e0 * 0.6933594;
          fStack_14bc = local_14e0._4_4_ * 0.6933594;
          fStack_14b8 = (float)uStack_14d8 * 0.6933594;
          fStack_14b4 = uStack_14d8._4_4_ * 0.6933594;
          fStack_14b0 = (float)uStack_14d0 * 0.6933594;
          fStack_14ac = uStack_14d0._4_4_ * 0.6933594;
          fStack_14a8 = (float)uStack_14c8 * 0.6933594;
          local_14a0 = local_1e60._0_8_;
          uStack_1498 = local_1e60._8_8_;
          uStack_1490 = local_1e60._16_8_;
          uStack_1488 = local_1e60._24_8_;
          fStack_14a4 = uStack_14c8._4_4_;
          auVar44._4_4_ = fStack_14bc;
          auVar44._0_4_ = local_14c0;
          auVar44._8_4_ = fStack_14b8;
          auVar44._12_4_ = fStack_14b4;
          auVar44._16_4_ = fStack_14b0;
          auVar44._20_4_ = fStack_14ac;
          auVar44._24_4_ = fStack_14a8;
          auVar44._28_4_ = uStack_14c8._4_4_;
          auVar4 = vsubps_avx(auVar3,auVar44);
          local_1e60._0_8_ = auVar4._0_8_;
          local_1e60._8_8_ = auVar4._8_8_;
          local_1e60._16_8_ = auVar4._16_8_;
          local_1e60._24_8_ = auVar4._24_8_;
          local_1600 = local_1ea0;
          uStack_15f8 = uStack_1e98;
          uStack_15f0 = uStack_1e90;
          uStack_15e8 = uStack_1e88;
          local_1620 = 0xb95e8083b95e8083;
          uStack_1618 = 0xb95e8083b95e8083;
          uStack_1610 = 0xb95e8083b95e8083;
          uStack_1608 = 0xb95e8083b95e8083;
          local_1640 = local_1e60._0_8_;
          uStack_1638 = local_1e60._8_8_;
          uStack_1630 = local_1e60._16_8_;
          uStack_1628 = local_1e60._24_8_;
          local_15c0 = local_1ea0;
          uStack_15b8 = uStack_1e98;
          uStack_15b0 = uStack_1e90;
          uStack_15a8 = uStack_1e88;
          local_15e0 = 0xb95e8083b95e8083;
          uStack_15d8 = 0xb95e8083b95e8083;
          uStack_15d0 = 0xb95e8083b95e8083;
          uStack_15c8 = 0xb95e8083b95e8083;
          local_15a0 = (float)local_14e0 * -0.00021219444;
          fStack_159c = local_14e0._4_4_ * -0.00021219444;
          fStack_1598 = (float)uStack_14d8 * -0.00021219444;
          fStack_1594 = uStack_14d8._4_4_ * -0.00021219444;
          fStack_1590 = (float)uStack_14d0 * -0.00021219444;
          fStack_158c = uStack_14d0._4_4_ * -0.00021219444;
          fStack_1588 = (float)uStack_14c8 * -0.00021219444;
          local_1580 = local_1e60._0_8_;
          uStack_1578 = local_1e60._8_8_;
          uStack_1570 = local_1e60._16_8_;
          uStack_1568 = local_1e60._24_8_;
          fStack_1584 = uStack_14c8._4_4_;
          auVar43._4_4_ = fStack_159c;
          auVar43._0_4_ = local_15a0;
          auVar43._8_4_ = fStack_1598;
          auVar43._12_4_ = fStack_1594;
          auVar43._16_4_ = fStack_1590;
          auVar43._20_4_ = fStack_158c;
          auVar43._24_4_ = fStack_1588;
          auVar43._28_4_ = uStack_14c8._4_4_;
          local_1e60 = vsubps_avx(auVar4,auVar43);
          local_1780 = local_1e60._0_8_;
          uVar104 = local_1780;
          uStack_1778 = local_1e60._8_8_;
          uVar105 = uStack_1778;
          uStack_1770 = local_1e60._16_8_;
          uVar106 = uStack_1770;
          uStack_1768 = local_1e60._24_8_;
          uVar107 = uStack_1768;
          local_17a0 = local_1e60._0_8_;
          uStack_1798 = local_1e60._8_8_;
          uStack_1790 = local_1e60._16_8_;
          uStack_1788 = local_1e60._24_8_;
          local_1780._0_4_ = local_1e60._0_4_;
          local_1780._4_4_ = local_1e60._4_4_;
          uStack_1778._0_4_ = local_1e60._8_4_;
          uStack_1778._4_4_ = local_1e60._12_4_;
          uStack_1770._0_4_ = local_1e60._16_4_;
          uStack_1770._4_4_ = local_1e60._20_4_;
          uStack_1768._0_4_ = local_1e60._24_4_;
          uStack_1768._4_4_ = local_1e60._28_4_;
          local_1e80 = CONCAT44(local_1780._4_4_ * local_1780._4_4_,
                                (float)local_1780 * (float)local_1780);
          uStack_1e78._0_4_ = (float)uStack_1778 * (float)uStack_1778;
          uStack_1e78._4_4_ = uStack_1778._4_4_ * uStack_1778._4_4_;
          uStack_1e70._0_4_ = (float)uStack_1770 * (float)uStack_1770;
          uStack_1e70._4_4_ = uStack_1770._4_4_ * uStack_1770._4_4_;
          auVar70 = _local_1e80;
          uStack_1e68._0_4_ = (float)uStack_1768 * (float)uStack_1768;
          uStack_1e68._4_4_ = uStack_1768._4_4_;
          auVar3 = _local_1e80;
          local_1c20 = 0x3950696739506967;
          uStack_1c18 = 0x3950696739506967;
          uStack_1c10 = 0x3950696739506967;
          uStack_1c08 = 0x3950696739506967;
          local_1c40 = local_1e60._0_8_;
          uStack_1c38 = local_1e60._8_8_;
          uStack_1c30 = local_1e60._16_8_;
          uStack_1c28 = local_1e60._24_8_;
          local_1c60 = 0x3ab743ce3ab743ce;
          uStack_1c58 = 0x3ab743ce3ab743ce;
          uStack_1c50 = 0x3ab743ce3ab743ce;
          uStack_1c48 = 0x3ab743ce3ab743ce;
          local_1940 = 0x3950696739506967;
          uStack_1938 = 0x3950696739506967;
          uStack_1930 = 0x3950696739506967;
          uStack_1928 = 0x3950696739506967;
          local_1960 = local_1e60._0_8_;
          uStack_1958 = local_1e60._8_8_;
          uStack_1950 = local_1e60._16_8_;
          uStack_1948 = local_1e60._24_8_;
          local_1b40 = (float)local_1780 * 0.00019875691;
          fStack_1b3c = local_1780._4_4_ * 0.00019875691;
          fStack_1b38 = (float)uStack_1778 * 0.00019875691;
          fStack_1b34 = uStack_1778._4_4_ * 0.00019875691;
          fStack_1b30 = (float)uStack_1770 * 0.00019875691;
          fStack_1b2c = uStack_1770._4_4_ * 0.00019875691;
          fStack_1b28 = (float)uStack_1768 * 0.00019875691;
          fStack_1b24 = uStack_1768._4_4_;
          local_1b60 = 0x3ab743ce3ab743ce;
          uStack_1b58 = 0x3ab743ce3ab743ce;
          uStack_1b50 = 0x3ab743ce3ab743ce;
          uStack_1b48 = 0x3ab743ce3ab743ce;
          local_1f20 = CONCAT44(fStack_1b3c + 0.0013981999,local_1b40 + 0.0013981999);
          uStack_1f18 = CONCAT44(fStack_1b34 + 0.0013981999,fStack_1b38 + 0.0013981999);
          uStack_1f10 = CONCAT44(fStack_1b2c + 0.0013981999,fStack_1b30 + 0.0013981999);
          uStack_1f08 = CONCAT44(uStack_1768._4_4_ + 0.0013981999,fStack_1b28 + 0.0013981999);
          local_1c80 = local_1f20;
          uStack_1c78 = uStack_1f18;
          uStack_1c70 = uStack_1f10;
          uStack_1c68 = uStack_1f08;
          local_1ca0 = local_1e60._0_8_;
          uStack_1c98 = local_1e60._8_8_;
          uStack_1c90 = local_1e60._16_8_;
          uStack_1c88 = local_1e60._24_8_;
          local_1cc0 = 0x3c0889083c088908;
          uStack_1cb8 = 0x3c0889083c088908;
          uStack_1cb0 = 0x3c0889083c088908;
          uStack_1ca8 = 0x3c0889083c088908;
          local_1900 = local_1f20;
          uStack_18f8 = uStack_1f18;
          uStack_18f0 = uStack_1f10;
          uStack_18e8 = uStack_1f08;
          local_1920 = local_1e60._0_8_;
          uStack_1918 = local_1e60._8_8_;
          uStack_1910 = local_1e60._16_8_;
          uStack_1908 = local_1e60._24_8_;
          local_1b00 = (local_1b40 + 0.0013981999) * (float)local_1780;
          fStack_1afc = (fStack_1b3c + 0.0013981999) * local_1780._4_4_;
          fStack_1af8 = (fStack_1b38 + 0.0013981999) * (float)uStack_1778;
          fStack_1af4 = (fStack_1b34 + 0.0013981999) * uStack_1778._4_4_;
          fStack_1af0 = (fStack_1b30 + 0.0013981999) * (float)uStack_1770;
          fStack_1aec = (fStack_1b2c + 0.0013981999) * uStack_1770._4_4_;
          fStack_1ae8 = (fStack_1b28 + 0.0013981999) * (float)uStack_1768;
          fStack_1ae4 = uStack_1768._4_4_;
          local_1b20 = 0x3c0889083c088908;
          uStack_1b18 = 0x3c0889083c088908;
          uStack_1b10 = 0x3c0889083c088908;
          uStack_1b08 = 0x3c0889083c088908;
          local_1f20 = CONCAT44(fStack_1afc + 0.008333452,local_1b00 + 0.008333452);
          uStack_1f18 = CONCAT44(fStack_1af4 + 0.008333452,fStack_1af8 + 0.008333452);
          uStack_1f10 = CONCAT44(fStack_1aec + 0.008333452,fStack_1af0 + 0.008333452);
          uStack_1f08 = CONCAT44(uStack_1768._4_4_ + 0.008333452,fStack_1ae8 + 0.008333452);
          local_1ce0 = local_1f20;
          uStack_1cd8 = uStack_1f18;
          uStack_1cd0 = uStack_1f10;
          uStack_1cc8 = uStack_1f08;
          local_1d00 = local_1e60._0_8_;
          uStack_1cf8 = local_1e60._8_8_;
          uStack_1cf0 = local_1e60._16_8_;
          uStack_1ce8 = local_1e60._24_8_;
          local_1d20 = 0x3d2aa9c13d2aa9c1;
          uStack_1d18 = 0x3d2aa9c13d2aa9c1;
          uStack_1d10 = 0x3d2aa9c13d2aa9c1;
          uStack_1d08 = 0x3d2aa9c13d2aa9c1;
          local_18c0 = local_1f20;
          uStack_18b8 = uStack_1f18;
          uStack_18b0 = uStack_1f10;
          uStack_18a8 = uStack_1f08;
          local_18e0 = local_1e60._0_8_;
          uStack_18d8 = local_1e60._8_8_;
          uStack_18d0 = local_1e60._16_8_;
          uStack_18c8 = local_1e60._24_8_;
          local_1ac0 = (local_1b00 + 0.008333452) * (float)local_1780;
          fStack_1abc = (fStack_1afc + 0.008333452) * local_1780._4_4_;
          fStack_1ab8 = (fStack_1af8 + 0.008333452) * (float)uStack_1778;
          fStack_1ab4 = (fStack_1af4 + 0.008333452) * uStack_1778._4_4_;
          fStack_1ab0 = (fStack_1af0 + 0.008333452) * (float)uStack_1770;
          fStack_1aac = (fStack_1aec + 0.008333452) * uStack_1770._4_4_;
          fStack_1aa8 = (fStack_1ae8 + 0.008333452) * (float)uStack_1768;
          fStack_1aa4 = uStack_1768._4_4_;
          local_1ae0 = 0x3d2aa9c13d2aa9c1;
          uStack_1ad8 = 0x3d2aa9c13d2aa9c1;
          uStack_1ad0 = 0x3d2aa9c13d2aa9c1;
          uStack_1ac8 = 0x3d2aa9c13d2aa9c1;
          local_1f20 = CONCAT44(fStack_1abc + 0.041665796,local_1ac0 + 0.041665796);
          uStack_1f18 = CONCAT44(fStack_1ab4 + 0.041665796,fStack_1ab8 + 0.041665796);
          uStack_1f10 = CONCAT44(fStack_1aac + 0.041665796,fStack_1ab0 + 0.041665796);
          uStack_1f08 = CONCAT44(uStack_1768._4_4_ + 0.041665796,fStack_1aa8 + 0.041665796);
          local_1d40 = local_1f20;
          uStack_1d38 = uStack_1f18;
          uStack_1d30 = uStack_1f10;
          uStack_1d28 = uStack_1f08;
          local_1d60 = local_1e60._0_8_;
          uStack_1d58 = local_1e60._8_8_;
          uStack_1d50 = local_1e60._16_8_;
          uStack_1d48 = local_1e60._24_8_;
          local_1d80 = 0x3e2aaaaa3e2aaaaa;
          uStack_1d78 = 0x3e2aaaaa3e2aaaaa;
          uStack_1d70 = 0x3e2aaaaa3e2aaaaa;
          uStack_1d68 = 0x3e2aaaaa3e2aaaaa;
          local_1880 = local_1f20;
          uStack_1878 = uStack_1f18;
          uStack_1870 = uStack_1f10;
          uStack_1868 = uStack_1f08;
          local_18a0 = local_1e60._0_8_;
          uStack_1898 = local_1e60._8_8_;
          uStack_1890 = local_1e60._16_8_;
          uStack_1888 = local_1e60._24_8_;
          local_1a80 = (local_1ac0 + 0.041665796) * (float)local_1780;
          fStack_1a7c = (fStack_1abc + 0.041665796) * local_1780._4_4_;
          fStack_1a78 = (fStack_1ab8 + 0.041665796) * (float)uStack_1778;
          fStack_1a74 = (fStack_1ab4 + 0.041665796) * uStack_1778._4_4_;
          fStack_1a70 = (fStack_1ab0 + 0.041665796) * (float)uStack_1770;
          fStack_1a6c = (fStack_1aac + 0.041665796) * uStack_1770._4_4_;
          fStack_1a68 = (fStack_1aa8 + 0.041665796) * (float)uStack_1768;
          fStack_1a64 = uStack_1768._4_4_;
          local_1aa0 = 0x3e2aaaaa3e2aaaaa;
          uStack_1a98 = 0x3e2aaaaa3e2aaaaa;
          uStack_1a90 = 0x3e2aaaaa3e2aaaaa;
          uStack_1a88 = 0x3e2aaaaa3e2aaaaa;
          local_1f20 = CONCAT44(fStack_1a7c + 0.16666666,local_1a80 + 0.16666666);
          uStack_1f18 = CONCAT44(fStack_1a74 + 0.16666666,fStack_1a78 + 0.16666666);
          uStack_1f10 = CONCAT44(fStack_1a6c + 0.16666666,fStack_1a70 + 0.16666666);
          uStack_1f08 = CONCAT44(uStack_1768._4_4_ + 0.16666666,fStack_1a68 + 0.16666666);
          local_1da0 = local_1f20;
          uStack_1d98 = uStack_1f18;
          uStack_1d90 = uStack_1f10;
          uStack_1d88 = uStack_1f08;
          local_1dc0 = local_1e60._0_8_;
          uStack_1db8 = local_1e60._8_8_;
          uStack_1db0 = local_1e60._16_8_;
          uStack_1da8 = local_1e60._24_8_;
          local_1de0 = 0x3f0000003f000000;
          uStack_1dd8 = 0x3f0000003f000000;
          uStack_1dd0 = 0x3f0000003f000000;
          uStack_1dc8 = 0x3f0000003f000000;
          local_1840 = local_1f20;
          uStack_1838 = uStack_1f18;
          uStack_1830 = uStack_1f10;
          uStack_1828 = uStack_1f08;
          local_1860 = local_1e60._0_8_;
          uStack_1858 = local_1e60._8_8_;
          uStack_1850 = local_1e60._16_8_;
          uStack_1848 = local_1e60._24_8_;
          local_1a40 = (local_1a80 + 0.16666666) * (float)local_1780;
          fStack_1a3c = (fStack_1a7c + 0.16666666) * local_1780._4_4_;
          fStack_1a38 = (fStack_1a78 + 0.16666666) * (float)uStack_1778;
          fStack_1a34 = (fStack_1a74 + 0.16666666) * uStack_1778._4_4_;
          fStack_1a30 = (fStack_1a70 + 0.16666666) * (float)uStack_1770;
          fStack_1a2c = (fStack_1a6c + 0.16666666) * uStack_1770._4_4_;
          fStack_1a28 = (fStack_1a68 + 0.16666666) * (float)uStack_1768;
          fStack_1a24 = uStack_1768._4_4_;
          local_1a60 = 0x3f0000003f000000;
          uStack_1a58 = 0x3f0000003f000000;
          uStack_1a50 = 0x3f0000003f000000;
          uStack_1a48 = 0x3f0000003f000000;
          local_1f20 = CONCAT44(fStack_1a3c + 0.5,local_1a40 + 0.5);
          uStack_1f18 = CONCAT44(fStack_1a34 + 0.5,fStack_1a38 + 0.5);
          uStack_1f10 = CONCAT44(fStack_1a2c + 0.5,fStack_1a30 + 0.5);
          uStack_1f08 = CONCAT44(uStack_1768._4_4_ + 0.5,fStack_1a28 + 0.5);
          uStack_1e70 = auVar70._16_8_;
          uStack_1e68 = auVar3._24_8_;
          local_1e00 = local_1f20;
          uStack_1df8 = uStack_1f18;
          uStack_1df0 = uStack_1f10;
          uStack_1de8 = uStack_1f08;
          local_1e20 = local_1e80;
          uStack_1e18 = uStack_1e78;
          uStack_1e10 = uStack_1e70;
          uStack_1e08 = uStack_1e68;
          local_1e40 = local_1e60._0_8_;
          uStack_1e38 = local_1e60._8_8_;
          uStack_1e30 = local_1e60._16_8_;
          uStack_1e28 = local_1e60._24_8_;
          local_1800 = local_1f20;
          uStack_17f8 = uStack_1f18;
          uStack_17f0 = uStack_1f10;
          uStack_17e8 = uStack_1f08;
          local_1820 = local_1e80;
          uStack_1818 = uStack_1e78;
          uStack_1810 = uStack_1e70;
          uStack_1808 = uStack_1e68;
          local_1a00 = (local_1a40 + 0.5) * (float)local_1780 * (float)local_1780;
          fStack_19fc = (fStack_1a3c + 0.5) * local_1780._4_4_ * local_1780._4_4_;
          fStack_19f8 = (fStack_1a38 + 0.5) * (float)uStack_1778 * (float)uStack_1778;
          fStack_19f4 = (fStack_1a34 + 0.5) * uStack_1778._4_4_ * uStack_1778._4_4_;
          fStack_19f0 = (fStack_1a30 + 0.5) * (float)uStack_1770 * (float)uStack_1770;
          fStack_19ec = (fStack_1a2c + 0.5) * uStack_1770._4_4_ * uStack_1770._4_4_;
          fStack_19e8 = (fStack_1a28 + 0.5) * (float)uStack_1768 * (float)uStack_1768;
          fStack_19e4 = uStack_1768._4_4_;
          local_1a20 = local_1e60._0_8_;
          uStack_1a18 = local_1e60._8_8_;
          uStack_1a10 = local_1e60._16_8_;
          uStack_1a08 = local_1e60._24_8_;
          local_1f20 = CONCAT44(fStack_19fc + local_1780._4_4_,local_1a00 + (float)local_1780);
          uStack_1f18 = CONCAT44(fStack_19f4 + uStack_1778._4_4_,fStack_19f8 + (float)uStack_1778);
          uStack_1f10 = CONCAT44(fStack_19ec + uStack_1770._4_4_,fStack_19f0 + (float)uStack_1770);
          uStack_1f08 = CONCAT44(uStack_1768._4_4_ + uStack_1768._4_4_,
                                 fStack_19e8 + (float)uStack_1768);
          local_19c0 = local_1f20;
          uStack_19b8 = uStack_1f18;
          uStack_19b0 = uStack_1f10;
          uStack_19a8 = uStack_1f08;
          local_19e0 = 0x3f8000003f800000;
          uStack_19d8 = 0x3f8000003f800000;
          uStack_19d0 = 0x3f8000003f800000;
          uStack_19c8 = 0x3f8000003f800000;
          local_1f80 = local_1a00 + (float)local_1780 + 1.0;
          fStack_1f7c = fStack_19fc + local_1780._4_4_ + 1.0;
          fStack_1f78 = fStack_19f8 + (float)uStack_1778 + 1.0;
          fStack_1f74 = fStack_19f4 + uStack_1778._4_4_ + 1.0;
          fStack_1f70 = fStack_19f0 + (float)uStack_1770 + 1.0;
          fStack_1f6c = fStack_19ec + uStack_1770._4_4_ + 1.0;
          fStack_1f68 = fStack_19e8 + (float)uStack_1768 + 1.0;
          fStack_1f64 = uStack_1768._4_4_ + uStack_1768._4_4_ + 1.0;
          local_1f20 = CONCAT44(fStack_1f7c,local_1f80);
          uStack_1f18 = CONCAT44(fStack_1f74,fStack_1f78);
          uStack_1f10 = CONCAT44(fStack_1f6c,fStack_1f70);
          uStack_1f08 = CONCAT44(fStack_1f64,fStack_1f68);
          local_1480 = local_1ea0;
          uStack_1478 = uStack_1e98;
          uStack_1470 = uStack_1e90;
          uStack_1468 = uStack_1e88;
          local_1ec0 = CONCAT44((int)local_14e0._4_4_,(int)(float)local_14e0);
          uStack_1eb8 = CONCAT44((int)uStack_14d8._4_4_,(int)(float)uStack_14d8);
          uStack_1eb0 = CONCAT44((int)uStack_14d0._4_4_,(int)(float)uStack_14d0);
          uStack_1ea8 = CONCAT44((int)uStack_14c8._4_4_,(int)(float)uStack_14c8);
          local_1380 = local_1ec0;
          uStack_1378 = uStack_1eb8;
          uStack_1370 = uStack_1eb0;
          uStack_1368 = uStack_1ea8;
          local_13a0 = 0x7f0000007f;
          uStack_1398 = 0x7f0000007f;
          uStack_1390 = 0x7f0000007f;
          uStack_1388 = 0x7f0000007f;
          local_1420 = local_1ec0;
          uStack_1418 = uStack_1eb8;
          uStack_1410 = uStack_1eb0;
          uStack_1408 = uStack_1ea8;
          local_1440 = 0x7f0000007f;
          uStack_1438 = 0x7f0000007f;
          uStack_1430 = 0x7f0000007f;
          uStack_1428 = 0x7f0000007f;
          local_13d0 = 0x7f0000007f;
          uStack_13c8 = 0x7f0000007f;
          local_13e0 = 0x7f0000007f;
          uStack_13d8 = 0x7f0000007f;
          local_1250 = local_1ec0;
          uStack_1248 = uStack_1eb8;
          local_1260 = 0x7f0000007f;
          uStack_1258 = 0x7f0000007f;
          auVar48._8_8_ = uStack_1eb8;
          auVar48._0_8_ = local_1ec0;
          auVar47._8_8_ = 0x7f0000007f;
          auVar47._0_8_ = 0x7f0000007f;
          local_13b0 = vpaddd_avx(auVar48,auVar47);
          local_1270 = uStack_1eb0;
          uStack_1268 = uStack_1ea8;
          local_1280 = 0x7f0000007f;
          uStack_1278 = 0x7f0000007f;
          auVar46._8_8_ = uStack_1ea8;
          auVar46._0_8_ = uStack_1eb0;
          auVar45._8_8_ = 0x7f0000007f;
          auVar45._0_8_ = 0x7f0000007f;
          local_13c0 = vpaddd_avx(auVar46,auVar45);
          local_1460 = local_13b0._0_8_;
          uStack_1458 = local_13b0._8_8_;
          uStack_1450 = local_13c0._0_8_;
          uStack_1448 = local_13c0._8_8_;
          local_1400 = local_13b0._0_8_;
          uStack_13f8 = local_13b0._8_8_;
          uStack_13f0 = local_13c0._0_8_;
          uStack_13e8 = local_13c0._8_8_;
          local_12c0 = local_13b0._0_8_;
          uStack_12b8 = local_13b0._8_8_;
          uStack_12b0 = local_13c0._0_8_;
          uStack_12a8 = local_13c0._8_8_;
          local_12c4 = 0x17;
          local_1340 = local_13b0._0_8_;
          uStack_1338 = local_13b0._8_8_;
          uStack_1330 = local_13c0._0_8_;
          uStack_1328 = local_13c0._8_8_;
          local_1210 = local_13b0._0_8_;
          uStack_1208 = local_13b0._8_8_;
          local_1214 = 0x17;
          local_12e0 = vpslld_avx(local_13b0,ZEXT416(0x17));
          local_1230 = local_13c0._0_8_;
          uStack_1228 = local_13c0._8_8_;
          local_1234 = 0x17;
          local_12f0 = vpslld_avx(local_13c0,ZEXT416(0x17));
          local_1360 = local_12e0._0_8_;
          uStack_1358 = local_12e0._8_8_;
          uStack_1350 = local_12f0._0_8_;
          uStack_1348 = local_12f0._8_8_;
          local_1320 = local_12e0._0_8_;
          uStack_1318 = local_12e0._8_8_;
          uStack_1310 = local_12f0._0_8_;
          uStack_1308 = local_12f0._8_8_;
          local_1ec0 = local_12e0._0_8_;
          uStack_1eb8 = local_12e0._8_8_;
          uStack_1eb0 = local_12f0._0_8_;
          uStack_1ea8 = local_12f0._8_8_;
          local_12a0 = local_12e0._0_8_;
          uStack_1298 = local_12e0._8_8_;
          uStack_1290 = local_12f0._0_8_;
          uStack_1288 = local_12f0._8_8_;
          local_1f40 = local_12e0._0_8_;
          uStack_1f38 = local_12e0._8_8_;
          uStack_1f30 = local_12f0._0_8_;
          uStack_1f28 = local_12f0._8_8_;
          local_17c0 = local_1f20;
          uStack_17b8 = uStack_1f18;
          uStack_17b0 = uStack_1f10;
          uStack_17a8 = uStack_1f08;
          local_17e0 = local_12e0._0_8_;
          uVar100 = local_17e0;
          uStack_17d8 = local_12e0._8_8_;
          uVar101 = uStack_17d8;
          uStack_17d0 = local_12f0._0_8_;
          uVar102 = uStack_17d0;
          uStack_17c8 = local_12f0._8_8_;
          uVar103 = uStack_17c8;
          local_17e0._0_4_ = local_12e0._0_4_;
          local_17e0._4_4_ = local_12e0._4_4_;
          uStack_17d8._0_4_ = local_12e0._8_4_;
          uStack_17d8._4_4_ = local_12e0._12_4_;
          uStack_17d0._0_4_ = local_12f0._0_4_;
          uStack_17d0._4_4_ = local_12f0._4_4_;
          uStack_17c8._0_4_ = local_12f0._8_4_;
          local_1f80 = local_1f80 * (float)local_17e0;
          fStack_1f7c = fStack_1f7c * local_17e0._4_4_;
          fStack_1f78 = fStack_1f78 * (float)uStack_17d8;
          fStack_1f74 = fStack_1f74 * uStack_17d8._4_4_;
          fStack_1f70 = fStack_1f70 * (float)uStack_17d0;
          fStack_1f6c = fStack_1f6c * uStack_17d0._4_4_;
          fStack_1f68 = fStack_1f68 * (float)uStack_17c8;
          local_1f20 = CONCAT44(fStack_1f7c,local_1f80);
          uStack_1f18 = CONCAT44(fStack_1f74,fStack_1f78);
          uStack_1f10 = CONCAT44(fStack_1f6c,fStack_1f70);
          uStack_1f08 = CONCAT44(fStack_1f64,fStack_1f68);
          local_2060 = local_1fe0._0_8_;
          uVar92 = local_2060;
          uStack_2058 = local_1fe0._8_8_;
          uVar93 = uStack_2058;
          uStack_2050 = auStack_1fd0._0_8_;
          uVar94 = uStack_2050;
          uStack_2048 = auStack_1fd0._8_8_;
          uVar95 = uStack_2048;
          local_2080 = local_1f20;
          uStack_2078 = uStack_1f18;
          uStack_2070 = uStack_1f10;
          uStack_2068 = uStack_1f08;
          local_2060._0_4_ = local_1fe0._0_4_;
          local_2060._4_4_ = local_1fe0._4_4_;
          uStack_2058._0_4_ = local_1fe0._8_4_;
          uStack_2058._4_4_ = local_1fe0._12_4_;
          uStack_2050._0_4_ = auStack_1fd0._0_4_;
          uStack_2050._4_4_ = auStack_1fd0._4_4_;
          uStack_2048._0_4_ = auStack_1fd0._8_4_;
          uStack_2048._4_4_ = auStack_1fd0._12_4_;
          local_1f80 = (float)local_2060 + local_1f80;
          fStack_1f7c = local_2060._4_4_ + fStack_1f7c;
          fStack_1f78 = (float)uStack_2058 + fStack_1f78;
          fStack_1f74 = uStack_2058._4_4_ + fStack_1f74;
          fStack_1f70 = (float)uStack_2050 + fStack_1f70;
          fStack_1f6c = uStack_2050._4_4_ + fStack_1f6c;
          fStack_1f68 = (float)uStack_2048 + fStack_1f68;
          fStack_1f64 = uStack_2048._4_4_ + fStack_1f64;
          local_1f60 = local_1fe0._0_8_;
          uStack_1f58 = local_1fe0._8_8_;
          uStack_1f50 = auStack_1fd0._0_8_;
          uStack_1f48 = auStack_1fd0._8_8_;
          auVar39._16_8_ = auStack_1fd0._0_8_;
          auVar39._0_16_ = local_1fe0;
          auVar39._24_8_ = auStack_1fd0._8_8_;
          auVar38._4_4_ = fStack_1f7c;
          auVar38._0_4_ = local_1f80;
          auVar38._8_4_ = fStack_1f78;
          auVar38._12_4_ = fStack_1f74;
          auVar38._16_4_ = fStack_1f70;
          auVar38._20_4_ = fStack_1f6c;
          auVar38._24_4_ = fStack_1f68;
          auVar38._28_4_ = fStack_1f64;
          _local_2200 = vdivps_avx(auVar39,auVar38);
          local_2220 = local_2100._0_8_;
          uStack_2218 = local_2100._8_8_;
          uStack_2210 = auStack_20f0._0_8_;
          uStack_2208 = auStack_20f0._8_8_;
          local_2160 = (float)local_2200._0_4_ * (float)local_21e0;
          fStack_215c = (float)local_2200._4_4_ * local_21e0._4_4_;
          fStack_2158 = fStack_21f8 * (float)uStack_21d8;
          fStack_2154 = fStack_21f4 * uStack_21d8._4_4_;
          fStack_2150 = fStack_21f0 * (float)uStack_21d0;
          fStack_214c = fStack_21ec * uStack_21d0._4_4_;
          uStack_2144 = local_2200._28_4_;
          fStack_2148 = fStack_21e8 * (float)uStack_21c8;
          local_2180 = local_2140._0_8_;
          uStack_2178 = local_2140._8_8_;
          uStack_2170 = auStack_2130._0_8_;
          uStack_2168 = auStack_2130._8_8_;
          auVar36._4_4_ = fStack_215c;
          auVar36._0_4_ = local_2160;
          auVar36._8_4_ = fStack_2158;
          auVar36._12_4_ = fStack_2154;
          auVar36._16_4_ = fStack_2150;
          auVar36._20_4_ = fStack_214c;
          auVar36._24_4_ = fStack_2148;
          auVar36._28_4_ = uStack_2144;
          auVar35._16_8_ = auStack_2130._0_8_;
          auVar35._0_16_ = local_2140;
          auVar35._24_8_ = auStack_2130._8_8_;
          auVar4 = vsubps_avx(auVar36,auVar35);
          local_5a80 = auVar4._0_8_;
          uStack_5a78 = auVar4._8_8_;
          uStack_5a70 = auVar4._16_8_;
          uStack_5a68 = auVar4._24_8_;
          local_4060 = local_53c0;
          uStack_4058 = uStack_53b8;
          uStack_4050 = uStack_53b0;
          uStack_4048 = paStack_53a8;
          uVar66 = uStack_4048;
          local_4080 = local_5a80;
          uVar6 = local_4080;
          uStack_4078 = uStack_5a78;
          uVar7 = uStack_4078;
          uStack_4070 = uStack_5a70;
          uVar8 = uStack_4070;
          uStack_4068 = uStack_5a68;
          uVar9 = uStack_4068;
          uStack_4048._4_4_ = (undefined4)((ulong)paStack_53a8 >> 0x20);
          local_4080._0_4_ = auVar4._0_4_;
          local_4080._4_4_ = auVar4._4_4_;
          uStack_4078._0_4_ = auVar4._8_4_;
          uStack_4078._4_4_ = auVar4._12_4_;
          uStack_4070._0_4_ = auVar4._16_4_;
          uStack_4070._4_4_ = auVar4._20_4_;
          uStack_4068._0_4_ = auVar4._24_4_;
          local_46a0._4_4_ = fVar135 * local_4080._4_4_;
          local_46a0._0_4_ = fVar132 * (float)local_4080;
          local_46a0._12_4_ = fVar139 * uStack_4078._4_4_;
          local_46a0._8_4_ = fVar137 * (float)uStack_4078;
          local_46a0._20_4_ = fVar143 * uStack_4070._4_4_;
          local_46a0._16_4_ = fVar141 * (float)uStack_4070;
          local_46a0._28_4_ = uStack_4048._4_4_;
          local_46a0._24_4_ = fVar145 * (float)uStack_4068;
          local_40c0 = uVar62;
          uStack_40b8 = uVar63;
          uStack_40b0 = uVar64;
          uStack_40a8 = uVar65;
          local_4080 = uVar6;
          uStack_4078 = uVar7;
          uStack_4070 = uVar8;
          uStack_4068 = uVar9;
          uStack_4048 = uVar66;
          _local_3c40 = auVar19;
          local_3740 = uVar67;
          uStack_3738 = uVar68;
          uStack_3730 = uVar69;
          uStack_3728 = uVar71;
          local_35a0 = uVar72;
          uStack_3598 = uVar73;
          uStack_3590 = uVar74;
          uStack_3588 = uVar75;
          local_3540 = uVar76;
          uStack_3538 = uVar77;
          uStack_3530 = uVar78;
          uStack_3528 = uVar79;
          local_27e0 = uVar80;
          uStack_27d8 = uVar81;
          uStack_27d0 = uVar82;
          uStack_27c8 = uVar83;
          local_21e0 = uVar84;
          uStack_21d8 = uVar85;
          uStack_21d0 = uVar86;
          uStack_21c8 = uVar87;
          local_21c0 = uVar88;
          uStack_21b8 = uVar89;
          uStack_21b0 = uVar90;
          uStack_21a8 = uVar91;
          local_2060 = uVar92;
          uStack_2058 = uVar93;
          uStack_2050 = uVar94;
          uStack_2048 = uVar95;
          local_1fa0 = local_1720;
          _local_1e80 = auVar3;
          local_1980 = uVar96;
          uStack_1978 = uVar97;
          uStack_1970 = uVar98;
          uStack_1968 = uVar99;
          local_17e0 = uVar100;
          uStack_17d8 = uVar101;
          uStack_17d0 = uVar102;
          uStack_17c8 = uVar103;
          local_1780 = uVar104;
          uStack_1778 = uVar105;
          uStack_1770 = uVar106;
          uStack_1768 = uVar107;
          local_14e0 = uVar108;
          uStack_14d8 = uVar109;
          uStack_14d0 = uVar110;
          uStack_14c8 = uVar111;
          _local_1100 = auVar20;
          uStack_1088 = uVar112;
          fStack_ce4 = fStack_11c4;
          fStack_ca4 = fStack_11c4;
          fStack_c64 = fStack_11c4;
          fStack_c24 = fStack_11c4;
          fStack_be4 = fStack_11c4;
          fStack_ba4 = fStack_11c4;
          fStack_b64 = fStack_11c4;
          fStack_b24 = fStack_11c4;
          local_aa0 = uVar113;
          uStack_a98 = uVar114;
          uStack_a90 = uVar115;
          uStack_a88 = uVar116;
          local_a60 = uVar117;
          uStack_a58 = uVar118;
          uStack_a50 = uVar119;
          uStack_a48 = uVar120;
          local_a40 = uVar121;
          uStack_a38 = uVar122;
          uStack_a30 = uVar123;
          uStack_a28 = uVar124;
          local_a00 = uVar125;
          uStack_9f8 = uVar126;
          uStack_9f0 = uVar127;
          uStack_9e8 = uVar128;
          local_7c0 = uVar129;
          uStack_7b8 = uVar130;
          uStack_7b0 = uVar131;
          uStack_7a8 = uVar112;
          local_480 = local_4c0;
          uStack_478 = uStack_4b8;
          uStack_470 = uStack_4b0;
          uStack_468 = uStack_4a8;
          fStack_444 = fStack_11c4;
          break;
        case 6:
          local_4670 = 0;
          local_462c = *(uint *)*local_46d0;
          auVar2 = vinsertps_avx(ZEXT416(local_462c),ZEXT416(local_462c),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_462c),0x20);
          local_45a0 = vinsertps_avx(auVar2,ZEXT416(local_462c),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_462c),ZEXT416(local_462c),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_462c),0x20);
          auStack_4590 = vinsertps_avx(auVar2,ZEXT416(local_462c),0x30);
          local_4740 = local_45a0._0_8_;
          uStack_4738 = local_45a0._8_8_;
          uStack_4730 = auStack_4590._0_8_;
          uStack_4728 = auStack_4590._8_8_;
          local_4680 = 1;
          local_4630 = *(uint *)(*local_46d0 + 4);
          auVar2 = vinsertps_avx(ZEXT416(local_4630),ZEXT416(local_4630),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4630),0x20);
          local_4560 = vinsertps_avx(auVar2,ZEXT416(local_4630),0x30);
          auVar2 = vinsertps_avx(ZEXT416(local_4630),ZEXT416(local_4630),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(local_4630),0x20);
          auStack_4550 = vinsertps_avx(auVar2,ZEXT416(local_4630),0x30);
          local_4760 = local_4560._0_8_;
          uStack_4758 = local_4560._8_8_;
          uStack_4750 = auStack_4550._0_8_;
          uStack_4748 = auStack_4550._8_8_;
          local_3f80 = local_53c0;
          uStack_3f78 = uStack_53b8;
          uStack_3f70 = uStack_53b0;
          uStack_3f68 = paStack_53a8;
          local_3fa0 = local_45a0._0_8_;
          uStack_3f98 = local_45a0._8_8_;
          uStack_3f90 = auStack_4590._0_8_;
          uStack_3f88 = auStack_4590._8_8_;
          local_3e24 = 0x3f800000;
          local_3de4 = 0x3f800000;
          local_3de8 = 0x3f800000;
          local_3dec = 0x3f800000;
          local_3df0 = 0x3f800000;
          local_3df4 = 0x3f800000;
          local_3df8 = 0x3f800000;
          local_3dfc = 0x3f800000;
          local_3e00 = 0x3f800000;
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          local_3e20 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          auVar2 = vinsertps_avx(ZEXT416(0x3f800000),ZEXT416(0x3f800000),0x10);
          auVar2 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x20);
          auStack_3e10 = vinsertps_avx(auVar2,ZEXT416(0x3f800000),0x30);
          local_3fe0 = local_3e20._0_8_;
          uStack_3fd8 = local_3e20._8_8_;
          uStack_3fd0 = auStack_3e10._0_8_;
          uStack_3fc8 = auStack_3e10._8_8_;
          local_3f20 = local_53c0;
          uStack_3f18 = uStack_53b8;
          uStack_3f10 = uStack_53b0;
          uStack_3f08 = paStack_53a8;
          local_3f40 = local_45a0._0_8_;
          uStack_3f38 = local_45a0._8_8_;
          uStack_3f30 = auStack_4590._0_8_;
          uStack_3f28 = auStack_4590._8_8_;
          local_3f60 = local_4560._0_8_;
          uStack_3f58 = local_4560._8_8_;
          uStack_3f50 = auStack_4550._0_8_;
          uStack_3f48 = auStack_4550._8_8_;
          local_3ea0 = local_53c0;
          uStack_3e98 = uStack_53b8;
          uStack_3e90 = uStack_53b0;
          uStack_3e88 = paStack_53a8;
          local_3ec0 = local_45a0._0_8_;
          uVar6 = local_3ec0;
          uStack_3eb8 = local_45a0._8_8_;
          uVar7 = uStack_3eb8;
          uStack_3eb0 = auStack_4590._0_8_;
          uVar8 = uStack_3eb0;
          uStack_3ea8 = auStack_4590._8_8_;
          uVar9 = uStack_3ea8;
          local_3ec0._0_4_ = local_45a0._0_4_;
          local_3ec0._4_4_ = local_45a0._4_4_;
          uStack_3eb8._0_4_ = local_45a0._8_4_;
          uStack_3eb8._4_4_ = local_45a0._12_4_;
          uStack_3eb0._0_4_ = auStack_4590._0_4_;
          uStack_3eb0._4_4_ = auStack_4590._4_4_;
          uStack_3ea8._0_4_ = auStack_4590._8_4_;
          uStack_3ea8._4_4_ = auStack_4590._12_4_;
          local_3ee0 = (float)local_4060 * (float)local_3ec0;
          fStack_3edc = local_4060._4_4_ * local_3ec0._4_4_;
          fStack_3ed8 = (float)uStack_4058 * (float)uStack_3eb8;
          fStack_3ed4 = uStack_4058._4_4_ * uStack_3eb8._4_4_;
          fStack_3ed0 = (float)uStack_4050 * (float)uStack_3eb0;
          fStack_3ecc = uStack_4050._4_4_ * uStack_3eb0._4_4_;
          fStack_3ec8 = (float)uStack_4048 * (float)uStack_3ea8;
          fStack_3ec4 = uStack_3ea8._4_4_;
          local_3f00 = local_4560._0_8_;
          uVar62 = local_3f00;
          uStack_3ef8 = local_4560._8_8_;
          uVar63 = uStack_3ef8;
          uStack_3ef0 = auStack_4550._0_8_;
          uVar64 = uStack_3ef0;
          uStack_3ee8 = auStack_4550._8_8_;
          uVar65 = uStack_3ee8;
          local_3f00._0_4_ = local_4560._0_4_;
          local_3f00._4_4_ = local_4560._4_4_;
          uStack_3ef8._0_4_ = local_4560._8_4_;
          uStack_3ef8._4_4_ = local_4560._12_4_;
          uStack_3ef0._0_4_ = auStack_4550._0_4_;
          uStack_3ef0._4_4_ = auStack_4550._4_4_;
          uStack_3ee8._0_4_ = auStack_4550._8_4_;
          uStack_3ee8._4_4_ = auStack_4550._12_4_;
          local_3fc0._4_4_ = fStack_3edc + local_3f00._4_4_;
          local_3fc0._0_4_ = local_3ee0 + (float)local_3f00;
          uStack_3fb8._0_4_ = fStack_3ed8 + (float)uStack_3ef8;
          uStack_3fb8._4_4_ = fStack_3ed4 + uStack_3ef8._4_4_;
          uStack_3fb0._0_4_ = fStack_3ed0 + (float)uStack_3ef0;
          uStack_3fb0._4_4_ = fStack_3ecc + uStack_3ef0._4_4_;
          auVar70 = _local_3fc0;
          uStack_3fa8._0_4_ = fStack_3ec8 + (float)uStack_3ee8;
          uStack_3fa8._4_4_ = uStack_3ea8._4_4_ + uStack_3ee8._4_4_;
          auVar4 = _local_3fc0;
          uStack_3fb0 = auVar70._16_8_;
          uStack_3fa8 = auVar4._24_8_;
          local_3de0 = ZEXT432(0) << 0x20;
          local_3da0 = local_3fc0;
          uStack_3d98 = uStack_3fb8;
          uStack_3d90 = uStack_3fb0;
          uStack_3d88 = uStack_3fa8;
          local_3dc0 = 0;
          uStack_3db8 = 0;
          uStack_3db0 = 0;
          uStack_3da8 = 0;
          auVar4._16_8_ = uStack_3fb0;
          auVar4._0_16_ = _local_3fc0;
          auVar4._24_8_ = uStack_3fa8;
          auVar4 = vmaxps_avx(auVar4,ZEXT832(0));
          local_3fc0 = auVar4._0_8_;
          uStack_3fb8 = auVar4._8_8_;
          uStack_3fb0 = auVar4._16_8_;
          uStack_3fa8 = auVar4._24_8_;
          local_3d60 = local_3fc0;
          uStack_3d58 = uStack_3fb8;
          uStack_3d50 = uStack_3fb0;
          uStack_3d48 = uStack_3fa8;
          local_3d80 = local_3e20._0_8_;
          uStack_3d78 = local_3e20._8_8_;
          uStack_3d70 = auStack_3e10._0_8_;
          uStack_3d68 = auStack_3e10._8_8_;
          auVar3._16_8_ = auStack_3e10._0_8_;
          auVar3._0_16_ = local_3e20;
          auVar3._24_8_ = auStack_3e10._8_8_;
          _local_3fc0 = vminps_avx(auVar4,auVar3);
          local_3e60 = local_3fc0;
          uVar66 = local_3e60;
          uStack_3e58 = uStack_3fb8;
          uVar67 = uStack_3e58;
          uStack_3e50 = uStack_3fb0;
          uVar68 = uStack_3e50;
          uStack_3e48 = uStack_3fa8;
          uVar69 = uStack_3e48;
          local_3e80 = local_53c0;
          uStack_3e78 = uStack_53b8;
          uStack_3e70 = uStack_53b0;
          uStack_3e68 = paStack_53a8;
          local_3e60._0_4_ = local_3fc0._0_4_;
          local_3e60._4_4_ = local_3fc0._4_4_;
          uStack_3e58._0_4_ = local_3fc0._8_4_;
          uStack_3e58._4_4_ = local_3fc0._12_4_;
          uStack_3e50._0_4_ = local_3fc0._16_4_;
          uStack_3e50._4_4_ = local_3fc0._20_4_;
          uStack_3e48._0_4_ = local_3fc0._24_4_;
          uStack_3e48._4_4_ = local_3fc0._28_4_;
          local_46a0._4_4_ = local_3e60._4_4_ * local_4060._4_4_;
          local_46a0._0_4_ = (float)local_3e60 * (float)local_4060;
          local_46a0._12_4_ = uStack_3e58._4_4_ * uStack_4058._4_4_;
          local_46a0._8_4_ = (float)uStack_3e58 * (float)uStack_4058;
          local_46a0._20_4_ = uStack_3e50._4_4_ * uStack_4050._4_4_;
          local_46a0._16_4_ = (float)uStack_3e50 * (float)uStack_4050;
          local_46a0._28_4_ = uStack_3e48._4_4_;
          local_46a0._24_4_ = (float)uStack_3e48 * (float)uStack_4048;
          local_4678 = local_46d0;
          local_4668 = local_46d0;
          local_4580 = local_462c;
          local_457c = local_462c;
          local_4578 = local_462c;
          local_4574 = local_462c;
          local_4570 = local_462c;
          local_456c = local_462c;
          local_4568 = local_462c;
          local_4564 = local_462c;
          local_4540 = local_4630;
          local_453c = local_4630;
          local_4538 = local_4630;
          local_4534 = local_4630;
          local_4530 = local_4630;
          local_452c = local_4630;
          local_4528 = local_4630;
          local_4524 = local_4630;
          local_3f00 = uVar62;
          uStack_3ef8 = uVar63;
          uStack_3ef0 = uVar64;
          uStack_3ee8 = uVar65;
          local_3ec0 = uVar6;
          uStack_3eb8 = uVar7;
          uStack_3eb0 = uVar8;
          uStack_3ea8 = uVar9;
          local_3e60 = uVar66;
          uStack_3e58 = uVar67;
          uStack_3e50 = uVar68;
          uStack_3e48 = uVar69;
          break;
        default:
          local_46a0._8_8_ = uStack_53b8;
          local_46a0._0_8_ = local_53c0;
          local_46a0._16_8_ = uStack_53b0;
          local_46a0._24_8_ = paStack_53a8;
        }
        local_53c0 = local_46a0._0_8_;
        uStack_53b8 = local_46a0._8_8_;
        uStack_53b0 = local_46a0._16_8_;
        paStack_53a8 = (allocator_type *)local_46a0._24_8_;
        local_5090 = (undefined1 (*) [32])(local_5338 + (long)(local_5388 << 3) * 4);
        local_50c0 = local_46a0._0_8_;
        uStack_50b8 = local_46a0._8_8_;
        uStack_50b0 = local_46a0._16_8_;
        paStack_50a8 = (allocator_type *)local_46a0._24_8_;
        *local_5090 = local_46a0;
        in_stack_ffffffffffffa4f8 = (allocator_type *)local_46a0._24_8_;
        local_5228 = local_5280;
        local_53f0 = local_108;
      }
      local_5338 = local_5338 + (long)(local_52c4 << 3) * 4;
    }
    local_5208 = local_5290;
    local_5360 = local_98;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffa4f8);
  return;
}

Assistant:

static void convolution_pack8_avx(const Mat& bottom_blob, Mat& top_blob, const Mat& weight_data_packed, const Mat& bias_data, int kernel_w, int kernel_h, int dilation_w, int dilation_h, int stride_w, int stride_h, int activation_type, const Mat& activation_params, const Option& opt)
{
    int w = bottom_blob.w;
    int channels = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int maxk = kernel_w * kernel_h;

    // kernel offsets
    std::vector<int> _space_ofs(maxk);
    int* space_ofs = &_space_ofs[0];
    {
        int p1 = 0;
        int p2 = 0;
        int gap = w * dilation_h - kernel_w * dilation_w;
        for (int i = 0; i < kernel_h; i++)
        {
            for (int j = 0; j < kernel_w; j++)
            {
                space_ofs[p1] = p2;
                p1++;
                p2 += dilation_w;
            }
            p2 += gap;
        }
    }

    const float* bias_data_ptr = bias_data;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        float* outptr = top_blob.channel(p);

        for (int i = 0; i < outh; i++)
        {
            for (int j = 0; j < outw; j++)
            {
                __m256 _sum = _mm256_setzero_ps();

                if (bias_data_ptr)
                {
                    _sum = _mm256_loadu_ps(bias_data_ptr + p * 8);
                }

                const float* kptr = weight_data_packed.channel(p);

                // channels
                for (int q = 0; q < channels; q++)
                {
                    const Mat m = bottom_blob.channel(q);
                    const float* sptr = m.row(i * stride_h) + j * stride_w * 8;

                    for (int k = 0; k < maxk; k++)
                    {
                        const float* slptr = sptr + space_ofs[k] * 8;

                        __m256 _val0 = _mm256_broadcast_ss(slptr);
                        __m256 _val1 = _mm256_broadcast_ss(slptr + 1);
                        __m256 _val2 = _mm256_broadcast_ss(slptr + 2);
                        __m256 _val3 = _mm256_broadcast_ss(slptr + 3);
                        __m256 _val4 = _mm256_broadcast_ss(slptr + 4);
                        __m256 _val5 = _mm256_broadcast_ss(slptr + 5);
                        __m256 _val6 = _mm256_broadcast_ss(slptr + 6);
                        __m256 _val7 = _mm256_broadcast_ss(slptr + 7);

                        __m256 _w0 = _mm256_load_ps(kptr);
                        __m256 _w1 = _mm256_load_ps(kptr + 8);
                        _sum = _mm256_comp_fmadd_ps(_val0, _w0, _sum);
                        _sum = _mm256_comp_fmadd_ps(_val1, _w1, _sum);
                        __m256 _w2 = _mm256_load_ps(kptr + 16);
                        __m256 _w3 = _mm256_load_ps(kptr + 24);
                        _sum = _mm256_comp_fmadd_ps(_val2, _w2, _sum);
                        _sum = _mm256_comp_fmadd_ps(_val3, _w3, _sum);
                        __m256 _w4 = _mm256_load_ps(kptr + 32);
                        __m256 _w5 = _mm256_load_ps(kptr + 40);
                        _sum = _mm256_comp_fmadd_ps(_val4, _w4, _sum);
                        _sum = _mm256_comp_fmadd_ps(_val5, _w5, _sum);
                        __m256 _w6 = _mm256_load_ps(kptr + 48);
                        __m256 _w7 = _mm256_load_ps(kptr + 56);
                        _sum = _mm256_comp_fmadd_ps(_val6, _w6, _sum);
                        _sum = _mm256_comp_fmadd_ps(_val7, _w7, _sum);

                        kptr += 64;
                    }
                }

                _sum = activation_avx(_sum, activation_type, activation_params);

                _mm256_store_ps(outptr + j * 8, _sum);
            }

            outptr += outw * 8;
        }
    }
}